

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_rgb.c
# Opt level: O0

void yuv420_rgb24_sseu(uint32_t width,uint32_t height,uint8_t *Y,uint8_t *U,uint8_t *V,
                      uint32_t Y_stride,uint32_t UV_stride,uint8_t *RGB,uint32_t RGB_stride,
                      YCbCrType yuv_type)

{
  byte bVar1;
  byte bVar2;
  uint8_t uVar3;
  byte bVar4;
  byte bVar12;
  byte bVar20;
  byte bVar28;
  byte bVar36;
  byte bVar44;
  byte bVar52;
  byte bVar59;
  byte bVar67;
  byte bVar75;
  byte bVar82;
  byte bVar90;
  byte bVar98;
  byte bVar106;
  byte bVar114;
  byte bVar122;
  byte bVar126;
  undefined8 uVar130;
  undefined8 uVar131;
  undefined8 uVar132;
  undefined8 uVar133;
  undefined4 uVar134;
  undefined6 uVar135;
  undefined4 uVar136;
  undefined6 uVar137;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  ulong uVar149;
  short sVar150;
  short sVar151;
  short sVar152;
  short sVar153;
  short sVar154;
  short sVar155;
  ulong uVar156;
  ulong uVar157;
  ulong uVar158;
  short sVar162;
  short sVar163;
  short sVar164;
  short sVar165;
  short sVar166;
  short sVar167;
  ushort uVar171;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  ulong uVar168;
  ulong uVar169;
  ulong uVar170;
  ushort uVar172;
  ushort uVar173;
  ushort uVar174;
  short sVar175;
  short sVar176;
  short sVar177;
  short sVar178;
  short sVar179;
  short sVar180;
  short sVar181;
  short sVar182;
  short sVar183;
  short sVar184;
  short sVar185;
  short sVar186;
  short sVar187;
  short sVar188;
  short sVar189;
  short sVar190;
  short sVar191;
  short sVar192;
  ushort uVar196;
  ushort uVar197;
  ushort uVar198;
  ushort uVar199;
  ushort uVar200;
  ushort uVar201;
  ushort uVar202;
  ulong uVar193;
  ulong uVar194;
  ulong uVar195;
  ushort uVar203;
  ushort uVar204;
  ushort uVar205;
  ushort uVar206;
  ushort uVar207;
  ushort uVar208;
  ushort uVar209;
  short sVar210;
  short sVar211;
  short sVar212;
  short sVar213;
  short sVar214;
  short sVar215;
  short sVar216;
  short sVar217;
  short sVar218;
  short sVar219;
  short sVar220;
  short sVar221;
  short sVar222;
  short sVar223;
  short sVar224;
  short sVar225;
  short sVar226;
  short sVar227;
  ushort uVar231;
  ushort uVar232;
  ushort uVar233;
  ushort uVar234;
  ushort uVar235;
  ushort uVar236;
  ushort uVar237;
  ushort uVar238;
  ushort uVar239;
  ushort uVar240;
  ushort uVar241;
  ushort uVar242;
  ulong uVar228;
  ulong uVar229;
  ulong uVar230;
  ushort uVar243;
  ushort uVar244;
  ushort uVar245;
  ushort uVar246;
  ushort uVar247;
  ushort uVar248;
  __m128i rgb_6;
  __m128i rgb_5;
  __m128i rgb_4;
  __m128i rgb_3;
  __m128i rgb_2;
  __m128i rgb_1;
  __m128i b_8_22;
  __m128i g_8_22;
  __m128i r_8_22;
  __m128i b_8_12;
  __m128i g_8_12;
  __m128i r_8_12;
  __m128i b_8_21;
  __m128i g_8_21;
  __m128i r_8_21;
  __m128i b_8_11;
  __m128i g_8_11;
  __m128i r_8_11;
  __m128i y_1;
  __m128i v_16;
  __m128i u_16;
  __m128i y_16_2;
  __m128i y_16_1;
  __m128i b_uv_16_2;
  __m128i g_uv_16_2;
  __m128i r_uv_16_2;
  __m128i b_uv_16_1;
  __m128i g_uv_16_1;
  __m128i r_uv_16_1;
  __m128i b_16_2;
  __m128i g_16_2;
  __m128i r_16_2;
  __m128i b_16_1;
  __m128i g_16_1;
  __m128i r_16_1;
  __m128i b_tmp;
  __m128i g_tmp;
  __m128i r_tmp;
  __m128i v;
  __m128i u;
  uint8_t *local_30c0;
  uint8_t *rgb_ptr2;
  uint8_t *rgb_ptr1;
  uint8_t *v_ptr;
  uint8_t *u_ptr;
  uint8_t *y_ptr2;
  uint8_t *y_ptr1;
  uint32_t y;
  uint32_t x;
  YUV2RGBParam *param;
  uint32_t Y_stride_local;
  uint8_t *V_local;
  uint8_t *U_local;
  uint8_t *Y_local;
  uint32_t height_local;
  uint32_t width_local;
  byte local_3048;
  byte bStack_3047;
  byte bStack_3046;
  byte bStack_3045;
  byte bStack_3044;
  byte bStack_3043;
  byte bStack_3042;
  byte bStack_3041;
  byte local_3028;
  byte bStack_3027;
  byte bStack_3026;
  byte bStack_3025;
  byte bStack_3024;
  byte bStack_3023;
  byte bStack_3022;
  byte bStack_3021;
  byte local_3008;
  byte bStack_3007;
  byte bStack_3006;
  byte bStack_3005;
  byte bStack_3004;
  byte bStack_3003;
  byte bStack_3002;
  byte bStack_3001;
  byte local_2fe8;
  byte bStack_2fe7;
  byte bStack_2fe6;
  byte bStack_2fe5;
  byte bStack_2fe4;
  byte bStack_2fe3;
  byte bStack_2fe2;
  byte bStack_2fe1;
  byte bStack_2f80;
  byte bStack_2f7f;
  byte bStack_2f7e;
  byte bStack_2f7d;
  byte bStack_2f7c;
  byte bStack_2f7b;
  byte bStack_2f7a;
  byte bStack_2f79;
  byte bStack_2f60;
  byte bStack_2f5f;
  byte bStack_2f5e;
  byte bStack_2f5d;
  byte bStack_2f5c;
  byte bStack_2f5b;
  byte bStack_2f5a;
  byte bStack_2f59;
  byte bStack_2f00;
  byte bStack_2eff;
  byte bStack_2efe;
  byte bStack_2efd;
  byte bStack_2efc;
  byte bStack_2efb;
  byte bStack_2efa;
  byte bStack_2ef9;
  byte bStack_2ee0;
  byte bStack_2edf;
  byte bStack_2ede;
  byte bStack_2edd;
  byte bStack_2edc;
  byte bStack_2edb;
  byte bStack_2eda;
  byte bStack_2ed9;
  short sStack_2e46;
  short sStack_2e44;
  short sStack_2e42;
  short sStack_2e3e;
  short sStack_2e3c;
  short sStack_2e3a;
  short sStack_2e26;
  short sStack_2e24;
  short sStack_2e22;
  short sStack_2e1e;
  short sStack_2e1c;
  short sStack_2e1a;
  short sStack_2e06;
  short sStack_2e04;
  short sStack_2e02;
  short sStack_2dfe;
  short sStack_2dfc;
  short sStack_2dfa;
  short sStack_2de6;
  short sStack_2de4;
  short sStack_2de2;
  short sStack_2dde;
  short sStack_2ddc;
  short sStack_2dda;
  short sStack_2dc6;
  short sStack_2dc4;
  short sStack_2dc2;
  short sStack_2dbe;
  short sStack_2dbc;
  short sStack_2dba;
  short sStack_2da6;
  short sStack_2da4;
  short sStack_2da2;
  short sStack_2d9e;
  short sStack_2d9c;
  short sStack_2d9a;
  short sStack_2d86;
  short sStack_2d84;
  short sStack_2d82;
  short sStack_2d7e;
  short sStack_2d7c;
  short sStack_2d7a;
  short sStack_2d66;
  short sStack_2d64;
  short sStack_2d62;
  short sStack_2d5e;
  short sStack_2d5c;
  short sStack_2d5a;
  short sStack_2d26;
  short sStack_2d24;
  short sStack_2d22;
  short sStack_2d1e;
  short sStack_2d1c;
  short sStack_2d1a;
  short sStack_2d06;
  short sStack_2d04;
  short sStack_2d02;
  short sStack_2cfe;
  short sStack_2cfc;
  short sStack_2cfa;
  short sStack_2ce6;
  short sStack_2ce4;
  short sStack_2ce2;
  short sStack_2cde;
  short sStack_2cdc;
  short sStack_2cda;
  short sStack_2cc6;
  short sStack_2cc4;
  short sStack_2cc2;
  short sStack_2cbe;
  short sStack_2cbc;
  short sStack_2cba;
  short sStack_2ca6;
  short sStack_2ca4;
  short sStack_2ca2;
  short sStack_2c9e;
  short sStack_2c9c;
  short sStack_2c9a;
  short sStack_2c86;
  short sStack_2c84;
  short sStack_2c82;
  short sStack_2c7e;
  short sStack_2c7c;
  short sStack_2c7a;
  short sStack_2c66;
  short sStack_2c64;
  short sStack_2c62;
  short sStack_2c5e;
  short sStack_2c5c;
  short sStack_2c5a;
  short sStack_2c46;
  short sStack_2c44;
  short sStack_2c42;
  short sStack_2c3e;
  short sStack_2c3c;
  short sStack_2c3a;
  ushort uStack_2c16;
  ushort uStack_2c14;
  ushort uStack_2c12;
  ushort uStack_2c0e;
  ushort uStack_2c0c;
  ushort uStack_2c0a;
  ushort uStack_2c06;
  ushort uStack_2c04;
  ushort uStack_2c02;
  ushort uStack_2bfe;
  ushort uStack_2bfc;
  ushort uStack_2bfa;
  ushort uStack_2bf6;
  ushort uStack_2bf4;
  ushort uStack_2bf2;
  ushort uStack_2bee;
  ushort uStack_2bec;
  ushort uStack_2bea;
  ushort uStack_2be6;
  ushort uStack_2be4;
  ushort uStack_2be2;
  ushort uStack_2bde;
  ushort uStack_2bdc;
  ushort uStack_2bda;
  ushort uStack_2bd6;
  ushort uStack_2bd4;
  ushort uStack_2bd2;
  ushort uStack_2bce;
  ushort uStack_2bcc;
  ushort uStack_2bca;
  ushort uStack_2bc6;
  ushort uStack_2bc4;
  ushort uStack_2bc2;
  ushort uStack_2bbe;
  ushort uStack_2bbc;
  ushort uStack_2bba;
  ushort uStack_2bb6;
  ushort uStack_2bb4;
  ushort uStack_2bb2;
  ushort uStack_2bae;
  ushort uStack_2bac;
  ushort uStack_2baa;
  ushort uStack_2ba6;
  ushort uStack_2ba4;
  ushort uStack_2ba2;
  ushort uStack_2b9e;
  ushort uStack_2b9c;
  ushort uStack_2b9a;
  ushort uStack_2b96;
  ushort uStack_2b94;
  ushort uStack_2b92;
  ushort uStack_2b8e;
  ushort uStack_2b8c;
  ushort uStack_2b8a;
  ushort uStack_2b76;
  ushort uStack_2b74;
  ushort uStack_2b72;
  ushort uStack_2b6e;
  ushort uStack_2b6c;
  ushort uStack_2b6a;
  ushort uStack_2b56;
  ushort uStack_2b54;
  ushort uStack_2b52;
  ushort uStack_2b4e;
  ushort uStack_2b4c;
  ushort uStack_2b4a;
  short local_2b48;
  short sStack_2b46;
  short sStack_2b44;
  short sStack_2b42;
  short sStack_2b40;
  short sStack_2b3e;
  short sStack_2b3c;
  short sStack_2b3a;
  ushort uStack_2b36;
  ushort uStack_2b34;
  ushort uStack_2b32;
  ushort uStack_2b2e;
  ushort uStack_2b2c;
  ushort uStack_2b2a;
  short local_2b28;
  short sStack_2b26;
  short sStack_2b24;
  short sStack_2b22;
  short sStack_2b20;
  short sStack_2b1e;
  short sStack_2b1c;
  short sStack_2b1a;
  ushort uStack_2b16;
  ushort uStack_2b14;
  ushort uStack_2b12;
  ushort uStack_2b0e;
  ushort uStack_2b0c;
  ushort uStack_2b0a;
  ushort uStack_2b06;
  ushort uStack_2b04;
  ushort uStack_2b02;
  ushort uStack_2afe;
  ushort uStack_2afc;
  ushort uStack_2afa;
  ushort uStack_2af6;
  ushort uStack_2af4;
  ushort uStack_2af2;
  ushort uStack_2aee;
  ushort uStack_2aec;
  ushort uStack_2aea;
  ushort uStack_2ae6;
  ushort uStack_2ae4;
  ushort uStack_2ae2;
  ushort uStack_2ade;
  ushort uStack_2adc;
  ushort uStack_2ada;
  ushort uStack_2ad6;
  ushort uStack_2ad4;
  ushort uStack_2ad2;
  ushort uStack_2ace;
  ushort uStack_2acc;
  ushort uStack_2aca;
  ushort uStack_2ac6;
  ushort uStack_2ac4;
  ushort uStack_2ac2;
  ushort uStack_2abe;
  ushort uStack_2abc;
  ushort uStack_2aba;
  ushort uStack_2ab6;
  ushort uStack_2ab4;
  ushort uStack_2ab2;
  ushort uStack_2aae;
  ushort uStack_2aac;
  ushort uStack_2aaa;
  ushort uStack_2aa6;
  ushort uStack_2aa4;
  ushort uStack_2aa2;
  ushort uStack_2a9e;
  ushort uStack_2a9c;
  ushort uStack_2a9a;
  ushort uStack_2a96;
  ushort uStack_2a94;
  ushort uStack_2a92;
  ushort uStack_2a8e;
  ushort uStack_2a8c;
  ushort uStack_2a8a;
  ushort uStack_2a76;
  ushort uStack_2a74;
  ushort uStack_2a72;
  ushort uStack_2a6e;
  ushort uStack_2a6c;
  ushort uStack_2a6a;
  ushort uStack_2a56;
  ushort uStack_2a54;
  ushort uStack_2a52;
  ushort uStack_2a4e;
  ushort uStack_2a4c;
  ushort uStack_2a4a;
  short local_2a48;
  short sStack_2a46;
  short sStack_2a44;
  short sStack_2a42;
  short sStack_2a40;
  short sStack_2a3e;
  short sStack_2a3c;
  short sStack_2a3a;
  ushort uStack_2a36;
  ushort uStack_2a34;
  ushort uStack_2a32;
  ushort uStack_2a2e;
  ushort uStack_2a2c;
  ushort uStack_2a2a;
  short local_2a28;
  short sStack_2a26;
  short sStack_2a24;
  short sStack_2a22;
  short sStack_2a20;
  short sStack_2a1e;
  short sStack_2a1c;
  short sStack_2a1a;
  ushort uStack_2976;
  ushort uStack_2974;
  ushort uStack_2972;
  ushort uStack_296e;
  ushort uStack_296c;
  ushort uStack_296a;
  ushort uStack_2956;
  ushort uStack_2954;
  ushort uStack_2952;
  ushort uStack_294e;
  ushort uStack_294c;
  ushort uStack_294a;
  ushort uStack_2936;
  ushort uStack_2934;
  ushort uStack_2932;
  ushort uStack_292e;
  ushort uStack_292c;
  ushort uStack_292a;
  ushort uStack_2916;
  ushort uStack_2914;
  ushort uStack_2912;
  ushort uStack_290e;
  ushort uStack_290c;
  ushort uStack_290a;
  ushort uStack_28f6;
  ushort uStack_28f4;
  ushort uStack_28f2;
  ushort uStack_28ee;
  ushort uStack_28ec;
  ushort uStack_28ea;
  ushort uStack_28d6;
  ushort uStack_28d4;
  ushort uStack_28d2;
  ushort uStack_28ce;
  ushort uStack_28cc;
  ushort uStack_28ca;
  ushort uStack_28b6;
  ushort uStack_28b4;
  ushort uStack_28b2;
  ushort uStack_28ae;
  ushort uStack_28ac;
  ushort uStack_28aa;
  ushort uStack_2896;
  ushort uStack_2894;
  ushort uStack_2892;
  ushort uStack_288e;
  ushort uStack_288c;
  ushort uStack_288a;
  ushort uStack_2876;
  ushort uStack_2874;
  ushort uStack_2872;
  ushort uStack_286e;
  ushort uStack_286c;
  ushort uStack_286a;
  ushort uStack_2856;
  ushort uStack_2854;
  ushort uStack_2852;
  ushort uStack_284e;
  ushort uStack_284c;
  ushort uStack_284a;
  ushort uStack_2836;
  ushort uStack_2834;
  ushort uStack_2832;
  ushort uStack_282e;
  ushort uStack_282c;
  ushort uStack_282a;
  ushort uStack_2816;
  ushort uStack_2814;
  ushort uStack_2812;
  ushort uStack_280e;
  ushort uStack_280c;
  ushort uStack_280a;
  ushort uStack_27f6;
  ushort uStack_27f4;
  ushort uStack_27f2;
  ushort uStack_27ee;
  ushort uStack_27ec;
  ushort uStack_27ea;
  ushort uStack_27d6;
  ushort uStack_27d4;
  ushort uStack_27d2;
  ushort uStack_27ce;
  ushort uStack_27cc;
  ushort uStack_27ca;
  ushort uStack_27b6;
  ushort uStack_27b4;
  ushort uStack_27b2;
  ushort uStack_27ae;
  ushort uStack_27ac;
  ushort uStack_27aa;
  ushort uStack_2796;
  ushort uStack_2794;
  ushort uStack_2792;
  ushort uStack_278e;
  ushort uStack_278c;
  ushort uStack_278a;
  ushort uStack_2776;
  ushort uStack_2774;
  ushort uStack_2772;
  ushort uStack_276e;
  ushort uStack_276c;
  ushort uStack_276a;
  ushort uStack_2756;
  ushort uStack_2754;
  ushort uStack_2752;
  ushort uStack_274e;
  ushort uStack_274c;
  ushort uStack_274a;
  ushort uStack_2736;
  ushort uStack_2734;
  ushort uStack_2732;
  ushort uStack_272e;
  ushort uStack_272c;
  ushort uStack_272a;
  ushort uStack_2716;
  ushort uStack_2714;
  ushort uStack_2712;
  ushort uStack_270e;
  ushort uStack_270c;
  ushort uStack_270a;
  ushort uStack_26f6;
  ushort uStack_26f4;
  ushort uStack_26f2;
  ushort uStack_26ee;
  ushort uStack_26ec;
  ushort uStack_26ea;
  ushort uStack_26d6;
  ushort uStack_26d4;
  ushort uStack_26d2;
  ushort uStack_26ce;
  ushort uStack_26cc;
  ushort uStack_26ca;
  ushort uStack_26b6;
  ushort uStack_26b4;
  ushort uStack_26b2;
  ushort uStack_26ae;
  ushort uStack_26ac;
  ushort uStack_26aa;
  ushort uStack_2696;
  ushort uStack_2694;
  ushort uStack_2692;
  ushort uStack_268e;
  ushort uStack_268c;
  ushort uStack_268a;
  ushort uStack_2676;
  ushort uStack_2674;
  ushort uStack_2672;
  ushort uStack_266e;
  ushort uStack_266c;
  ushort uStack_266a;
  ushort uStack_2656;
  ushort uStack_2654;
  ushort uStack_2652;
  ushort uStack_264e;
  ushort uStack_264c;
  ushort uStack_264a;
  ushort uStack_2636;
  ushort uStack_2634;
  ushort uStack_2632;
  ushort uStack_262e;
  ushort uStack_262c;
  ushort uStack_262a;
  ushort uStack_2616;
  ushort uStack_2614;
  ushort uStack_2612;
  ushort uStack_260e;
  ushort uStack_260c;
  ushort uStack_260a;
  ushort uStack_25f6;
  ushort uStack_25f4;
  ushort uStack_25f2;
  ushort uStack_25ee;
  ushort uStack_25ec;
  ushort uStack_25ea;
  ushort uStack_25d6;
  ushort uStack_25d4;
  ushort uStack_25d2;
  ushort uStack_25ce;
  ushort uStack_25cc;
  ushort uStack_25ca;
  ushort uStack_25b6;
  ushort uStack_25b4;
  ushort uStack_25b2;
  ushort uStack_25ae;
  ushort uStack_25ac;
  ushort uStack_25aa;
  ushort uStack_2596;
  ushort uStack_2594;
  ushort uStack_2592;
  ushort uStack_258e;
  ushort uStack_258c;
  ushort uStack_258a;
  ushort uStack_2576;
  ushort uStack_2574;
  ushort uStack_2572;
  ushort uStack_256e;
  ushort uStack_256c;
  ushort uStack_256a;
  ushort uStack_2556;
  ushort uStack_2554;
  ushort uStack_2552;
  ushort uStack_254e;
  ushort uStack_254c;
  ushort uStack_254a;
  ushort uStack_2536;
  ushort uStack_2534;
  ushort uStack_2532;
  ushort uStack_252e;
  ushort uStack_252c;
  ushort uStack_252a;
  ushort uStack_2516;
  ushort uStack_2514;
  ushort uStack_2512;
  ushort uStack_250e;
  ushort uStack_250c;
  ushort uStack_250a;
  ushort uStack_24f6;
  ushort uStack_24f4;
  ushort uStack_24f2;
  ushort uStack_24ee;
  ushort uStack_24ec;
  ushort uStack_24ea;
  ushort uStack_24d6;
  ushort uStack_24d4;
  ushort uStack_24d2;
  ushort uStack_24ce;
  ushort uStack_24cc;
  ushort uStack_24ca;
  ushort uStack_24b6;
  ushort uStack_24b4;
  ushort uStack_24b2;
  ushort uStack_24ae;
  ushort uStack_24ac;
  ushort uStack_24aa;
  ushort uStack_2496;
  ushort uStack_2494;
  ushort uStack_2492;
  ushort uStack_248e;
  ushort uStack_248c;
  ushort uStack_248a;
  ushort uStack_2476;
  ushort uStack_2474;
  ushort uStack_2472;
  ushort uStack_246e;
  ushort uStack_246c;
  ushort uStack_246a;
  ushort uStack_2456;
  ushort uStack_2454;
  ushort uStack_2452;
  ushort uStack_244e;
  ushort uStack_244c;
  ushort uStack_244a;
  ushort uStack_2436;
  ushort uStack_2434;
  ushort uStack_2432;
  ushort uStack_242e;
  ushort uStack_242c;
  ushort uStack_242a;
  ushort uStack_2416;
  ushort uStack_2414;
  ushort uStack_2412;
  ushort uStack_240e;
  ushort uStack_240c;
  ushort uStack_240a;
  ushort uStack_23f6;
  ushort uStack_23f4;
  ushort uStack_23f2;
  ushort uStack_23ee;
  ushort uStack_23ec;
  ushort uStack_23ea;
  ushort uStack_23d6;
  ushort uStack_23d4;
  ushort uStack_23d2;
  ushort uStack_23ce;
  ushort uStack_23cc;
  ushort uStack_23ca;
  ushort uStack_23b6;
  ushort uStack_23b4;
  ushort uStack_23b2;
  ushort uStack_23ae;
  ushort uStack_23ac;
  ushort uStack_23aa;
  ushort uStack_2396;
  ushort uStack_2394;
  ushort uStack_2392;
  ushort uStack_238e;
  ushort uStack_238c;
  ushort uStack_238a;
  ushort uStack_2376;
  ushort uStack_2374;
  ushort uStack_2372;
  ushort uStack_236e;
  ushort uStack_236c;
  ushort uStack_236a;
  ushort uStack_2356;
  ushort uStack_2354;
  ushort uStack_2352;
  ushort uStack_234e;
  ushort uStack_234c;
  ushort uStack_234a;
  ushort uStack_2336;
  ushort uStack_2334;
  ushort uStack_2332;
  ushort uStack_232e;
  ushort uStack_232c;
  ushort uStack_232a;
  ushort uStack_2316;
  ushort uStack_2314;
  ushort uStack_2312;
  ushort uStack_230e;
  ushort uStack_230c;
  ushort uStack_230a;
  ushort uStack_22f6;
  ushort uStack_22f4;
  ushort uStack_22f2;
  ushort uStack_22ee;
  ushort uStack_22ec;
  ushort uStack_22ea;
  ushort uStack_22d6;
  ushort uStack_22d4;
  ushort uStack_22d2;
  ushort uStack_22ce;
  ushort uStack_22cc;
  ushort uStack_22ca;
  ushort uStack_22b6;
  ushort uStack_22b4;
  ushort uStack_22b2;
  ushort uStack_22ae;
  ushort uStack_22ac;
  ushort uStack_22aa;
  ushort uStack_2296;
  ushort uStack_2294;
  ushort uStack_2292;
  ushort uStack_228e;
  ushort uStack_228c;
  ushort uStack_228a;
  ushort uStack_2276;
  ushort uStack_2274;
  ushort uStack_2272;
  ushort uStack_226e;
  ushort uStack_226c;
  ushort uStack_226a;
  ushort uStack_2256;
  ushort uStack_2254;
  ushort uStack_2252;
  ushort uStack_224e;
  ushort uStack_224c;
  ushort uStack_224a;
  ushort uStack_2236;
  ushort uStack_2234;
  ushort uStack_2232;
  ushort uStack_222e;
  ushort uStack_222c;
  ushort uStack_222a;
  ushort uStack_2216;
  ushort uStack_2214;
  ushort uStack_2212;
  ushort uStack_220e;
  ushort uStack_220c;
  ushort uStack_220a;
  short sStack_20f6;
  short sStack_20f4;
  short sStack_20f2;
  short sStack_20ee;
  short sStack_20ec;
  short sStack_20ea;
  short sStack_20d6;
  short sStack_20d4;
  short sStack_20d2;
  short sStack_20ce;
  short sStack_20cc;
  short sStack_20ca;
  short sStack_20b6;
  short sStack_20b4;
  short sStack_20b2;
  short sStack_20ae;
  short sStack_20ac;
  short sStack_20aa;
  short sStack_2096;
  short sStack_2094;
  short sStack_2092;
  short sStack_208e;
  short sStack_208c;
  short sStack_208a;
  short sStack_2076;
  short sStack_2074;
  short sStack_2072;
  short sStack_206e;
  short sStack_206c;
  short sStack_206a;
  short sStack_2056;
  short sStack_2054;
  short sStack_2052;
  short sStack_204e;
  short sStack_204c;
  short sStack_204a;
  short sStack_2036;
  short sStack_2034;
  short sStack_2032;
  short sStack_202e;
  short sStack_202c;
  short sStack_202a;
  short sStack_2016;
  short sStack_2014;
  short sStack_2012;
  short sStack_200e;
  short sStack_200c;
  short sStack_200a;
  ushort local_1fa8;
  ushort uStack_1fa6;
  ushort uStack_1fa4;
  ushort uStack_1fa2;
  ushort uStack_1fa0;
  ushort uStack_1f9e;
  ushort uStack_1f9c;
  ushort uStack_1f9a;
  ushort local_1f98;
  ushort uStack_1f96;
  ushort uStack_1f94;
  ushort uStack_1f92;
  ushort uStack_1f90;
  ushort uStack_1f8e;
  ushort uStack_1f8c;
  ushort uStack_1f8a;
  ushort local_1f88;
  ushort uStack_1f86;
  ushort uStack_1f84;
  ushort uStack_1f82;
  ushort uStack_1f80;
  ushort uStack_1f7e;
  ushort uStack_1f7c;
  ushort uStack_1f7a;
  ushort local_1f78;
  ushort uStack_1f76;
  ushort uStack_1f74;
  ushort uStack_1f72;
  ushort uStack_1f70;
  ushort uStack_1f6e;
  ushort uStack_1f6c;
  ushort uStack_1f6a;
  ushort local_1f68;
  ushort uStack_1f66;
  ushort uStack_1f64;
  ushort uStack_1f62;
  ushort uStack_1f60;
  ushort uStack_1f5e;
  ushort uStack_1f5c;
  ushort uStack_1f5a;
  ushort local_1f58;
  ushort uStack_1f56;
  ushort uStack_1f54;
  ushort uStack_1f52;
  ushort uStack_1f50;
  ushort uStack_1f4e;
  ushort uStack_1f4c;
  ushort uStack_1f4a;
  ushort local_1ee8;
  ushort uStack_1ee6;
  ushort uStack_1ee4;
  ushort uStack_1ee2;
  ushort uStack_1ee0;
  ushort uStack_1ede;
  ushort uStack_1edc;
  ushort uStack_1eda;
  ushort local_1ed8;
  ushort uStack_1ed6;
  ushort uStack_1ed4;
  ushort uStack_1ed2;
  ushort uStack_1ed0;
  ushort uStack_1ece;
  ushort uStack_1ecc;
  ushort uStack_1eca;
  ushort local_1ec8;
  ushort uStack_1ec6;
  ushort uStack_1ec4;
  ushort uStack_1ec2;
  ushort uStack_1ec0;
  ushort uStack_1ebe;
  ushort uStack_1ebc;
  ushort uStack_1eba;
  ushort local_1eb8;
  ushort uStack_1eb6;
  ushort uStack_1eb4;
  ushort uStack_1eb2;
  ushort uStack_1eb0;
  ushort uStack_1eae;
  ushort uStack_1eac;
  ushort uStack_1eaa;
  ushort local_1ea8;
  ushort uStack_1ea6;
  ushort uStack_1ea4;
  ushort uStack_1ea2;
  ushort uStack_1ea0;
  ushort uStack_1e9e;
  ushort uStack_1e9c;
  ushort uStack_1e9a;
  ushort local_1e98;
  ushort uStack_1e96;
  ushort uStack_1e94;
  ushort uStack_1e92;
  ushort uStack_1e90;
  ushort uStack_1e8e;
  ushort uStack_1e8c;
  ushort uStack_1e8a;
  ushort local_1e28;
  ushort uStack_1e26;
  ushort uStack_1e24;
  ushort uStack_1e22;
  ushort uStack_1e20;
  ushort uStack_1e1e;
  ushort uStack_1e1c;
  ushort uStack_1e1a;
  ushort local_1e18;
  ushort uStack_1e16;
  ushort uStack_1e14;
  ushort uStack_1e12;
  ushort uStack_1e10;
  ushort uStack_1e0e;
  ushort uStack_1e0c;
  ushort uStack_1e0a;
  ushort local_1e08;
  ushort uStack_1e06;
  ushort uStack_1e04;
  ushort uStack_1e02;
  ushort uStack_1e00;
  ushort uStack_1dfe;
  ushort uStack_1dfc;
  ushort uStack_1dfa;
  ushort local_1df8;
  ushort uStack_1df6;
  ushort uStack_1df4;
  ushort uStack_1df2;
  ushort uStack_1df0;
  ushort uStack_1dee;
  ushort uStack_1dec;
  ushort uStack_1dea;
  ushort local_1de8;
  ushort uStack_1de6;
  ushort uStack_1de4;
  ushort uStack_1de2;
  ushort uStack_1de0;
  ushort uStack_1dde;
  ushort uStack_1ddc;
  ushort uStack_1dda;
  ushort local_1dd8;
  ushort uStack_1dd6;
  ushort uStack_1dd4;
  ushort uStack_1dd2;
  ushort uStack_1dd0;
  ushort uStack_1dce;
  ushort uStack_1dcc;
  ushort uStack_1dca;
  ushort local_1d68;
  ushort uStack_1d66;
  ushort uStack_1d64;
  ushort uStack_1d62;
  ushort uStack_1d60;
  ushort uStack_1d5e;
  ushort uStack_1d5c;
  ushort uStack_1d5a;
  ushort local_1d58;
  ushort uStack_1d56;
  ushort uStack_1d54;
  ushort uStack_1d52;
  ushort uStack_1d50;
  ushort uStack_1d4e;
  ushort uStack_1d4c;
  ushort uStack_1d4a;
  ushort local_1d48;
  ushort uStack_1d46;
  ushort uStack_1d44;
  ushort uStack_1d42;
  ushort uStack_1d40;
  ushort uStack_1d3e;
  ushort uStack_1d3c;
  ushort uStack_1d3a;
  ushort local_1d38;
  ushort uStack_1d36;
  ushort uStack_1d34;
  ushort uStack_1d32;
  ushort uStack_1d30;
  ushort uStack_1d2e;
  ushort uStack_1d2c;
  ushort uStack_1d2a;
  ushort local_1d28;
  ushort uStack_1d26;
  ushort uStack_1d24;
  ushort uStack_1d22;
  ushort uStack_1d20;
  ushort uStack_1d1e;
  ushort uStack_1d1c;
  ushort uStack_1d1a;
  ushort local_1d18;
  ushort uStack_1d16;
  ushort uStack_1d14;
  ushort uStack_1d12;
  ushort uStack_1d10;
  ushort uStack_1d0e;
  ushort uStack_1d0c;
  ushort uStack_1d0a;
  ushort local_1ca8;
  ushort uStack_1ca6;
  ushort uStack_1ca4;
  ushort uStack_1ca2;
  ushort uStack_1ca0;
  ushort uStack_1c9e;
  ushort uStack_1c9c;
  ushort uStack_1c9a;
  ushort local_1c98;
  ushort uStack_1c96;
  ushort uStack_1c94;
  ushort uStack_1c92;
  ushort uStack_1c90;
  ushort uStack_1c8e;
  ushort uStack_1c8c;
  ushort uStack_1c8a;
  ushort local_1c88;
  ushort uStack_1c86;
  ushort uStack_1c84;
  ushort uStack_1c82;
  ushort uStack_1c80;
  ushort uStack_1c7e;
  ushort uStack_1c7c;
  ushort uStack_1c7a;
  ushort local_1c78;
  ushort uStack_1c76;
  ushort uStack_1c74;
  ushort uStack_1c72;
  ushort uStack_1c70;
  ushort uStack_1c6e;
  ushort uStack_1c6c;
  ushort uStack_1c6a;
  ushort local_1c68;
  ushort uStack_1c66;
  ushort uStack_1c64;
  ushort uStack_1c62;
  ushort uStack_1c60;
  ushort uStack_1c5e;
  ushort uStack_1c5c;
  ushort uStack_1c5a;
  ushort local_1c58;
  ushort uStack_1c56;
  ushort uStack_1c54;
  ushort uStack_1c52;
  ushort uStack_1c50;
  ushort uStack_1c4e;
  ushort uStack_1c4c;
  ushort uStack_1c4a;
  ushort local_1be8;
  ushort uStack_1be6;
  ushort uStack_1be4;
  ushort uStack_1be2;
  ushort uStack_1be0;
  ushort uStack_1bde;
  ushort uStack_1bdc;
  ushort uStack_1bda;
  ushort local_1bd8;
  ushort uStack_1bd6;
  ushort uStack_1bd4;
  ushort uStack_1bd2;
  ushort uStack_1bd0;
  ushort uStack_1bce;
  ushort uStack_1bcc;
  ushort uStack_1bca;
  ushort local_1bc8;
  ushort uStack_1bc6;
  ushort uStack_1bc4;
  ushort uStack_1bc2;
  ushort uStack_1bc0;
  ushort uStack_1bbe;
  ushort uStack_1bbc;
  ushort uStack_1bba;
  ushort local_1bb8;
  ushort uStack_1bb6;
  ushort uStack_1bb4;
  ushort uStack_1bb2;
  ushort uStack_1bb0;
  ushort uStack_1bae;
  ushort uStack_1bac;
  ushort uStack_1baa;
  ushort local_1ba8;
  ushort uStack_1ba6;
  ushort uStack_1ba4;
  ushort uStack_1ba2;
  ushort uStack_1ba0;
  ushort uStack_1b9e;
  ushort uStack_1b9c;
  ushort uStack_1b9a;
  ushort local_1b98;
  ushort uStack_1b96;
  ushort uStack_1b94;
  ushort uStack_1b92;
  ushort uStack_1b90;
  ushort uStack_1b8e;
  ushort uStack_1b8c;
  ushort uStack_1b8a;
  ushort local_1b28;
  ushort uStack_1b26;
  ushort uStack_1b24;
  ushort uStack_1b22;
  ushort uStack_1b20;
  ushort uStack_1b1e;
  ushort uStack_1b1c;
  ushort uStack_1b1a;
  ushort local_1b18;
  ushort uStack_1b16;
  ushort uStack_1b14;
  ushort uStack_1b12;
  ushort uStack_1b10;
  ushort uStack_1b0e;
  ushort uStack_1b0c;
  ushort uStack_1b0a;
  ushort local_1b08;
  ushort uStack_1b06;
  ushort uStack_1b04;
  ushort uStack_1b02;
  ushort uStack_1b00;
  ushort uStack_1afe;
  ushort uStack_1afc;
  ushort uStack_1afa;
  ushort local_1af8;
  ushort uStack_1af6;
  ushort uStack_1af4;
  ushort uStack_1af2;
  ushort uStack_1af0;
  ushort uStack_1aee;
  ushort uStack_1aec;
  ushort uStack_1aea;
  ushort local_1ae8;
  ushort uStack_1ae6;
  ushort uStack_1ae4;
  ushort uStack_1ae2;
  ushort uStack_1ae0;
  ushort uStack_1ade;
  ushort uStack_1adc;
  ushort uStack_1ada;
  ushort local_1ad8;
  ushort uStack_1ad6;
  ushort uStack_1ad4;
  ushort uStack_1ad2;
  ushort uStack_1ad0;
  ushort uStack_1ace;
  ushort uStack_1acc;
  ushort uStack_1aca;
  ushort local_1a68;
  ushort uStack_1a66;
  ushort uStack_1a64;
  ushort uStack_1a62;
  ushort uStack_1a60;
  ushort uStack_1a5e;
  ushort uStack_1a5c;
  ushort uStack_1a5a;
  ushort local_1a58;
  ushort uStack_1a56;
  ushort uStack_1a54;
  ushort uStack_1a52;
  ushort uStack_1a50;
  ushort uStack_1a4e;
  ushort uStack_1a4c;
  ushort uStack_1a4a;
  ushort local_1a48;
  ushort uStack_1a46;
  ushort uStack_1a44;
  ushort uStack_1a42;
  ushort uStack_1a40;
  ushort uStack_1a3e;
  ushort uStack_1a3c;
  ushort uStack_1a3a;
  ushort local_1a38;
  ushort uStack_1a36;
  ushort uStack_1a34;
  ushort uStack_1a32;
  ushort uStack_1a30;
  ushort uStack_1a2e;
  ushort uStack_1a2c;
  ushort uStack_1a2a;
  ushort local_1a28;
  ushort uStack_1a26;
  ushort uStack_1a24;
  ushort uStack_1a22;
  ushort uStack_1a20;
  ushort uStack_1a1e;
  ushort uStack_1a1c;
  ushort uStack_1a1a;
  ushort local_1a18;
  ushort uStack_1a16;
  ushort uStack_1a14;
  ushort uStack_1a12;
  ushort uStack_1a10;
  ushort uStack_1a0e;
  ushort uStack_1a0c;
  ushort uStack_1a0a;
  ushort local_19a8;
  ushort uStack_19a6;
  ushort uStack_19a4;
  ushort uStack_19a2;
  ushort uStack_19a0;
  ushort uStack_199e;
  ushort uStack_199c;
  ushort uStack_199a;
  ushort local_1998;
  ushort uStack_1996;
  ushort uStack_1994;
  ushort uStack_1992;
  ushort uStack_1990;
  ushort uStack_198e;
  ushort uStack_198c;
  ushort uStack_198a;
  ushort local_1988;
  ushort uStack_1986;
  ushort uStack_1984;
  ushort uStack_1982;
  ushort uStack_1980;
  ushort uStack_197e;
  ushort uStack_197c;
  ushort uStack_197a;
  ushort local_1978;
  ushort uStack_1976;
  ushort uStack_1974;
  ushort uStack_1972;
  ushort uStack_1970;
  ushort uStack_196e;
  ushort uStack_196c;
  ushort uStack_196a;
  ushort local_1968;
  ushort uStack_1966;
  ushort uStack_1964;
  ushort uStack_1962;
  ushort uStack_1960;
  ushort uStack_195e;
  ushort uStack_195c;
  ushort uStack_195a;
  ushort local_1958;
  ushort uStack_1956;
  ushort uStack_1954;
  ushort uStack_1952;
  ushort uStack_1950;
  ushort uStack_194e;
  ushort uStack_194c;
  ushort uStack_194a;
  ushort local_18e8;
  ushort uStack_18e6;
  ushort uStack_18e4;
  ushort uStack_18e2;
  ushort uStack_18e0;
  ushort uStack_18de;
  ushort uStack_18dc;
  ushort uStack_18da;
  ushort local_18d8;
  ushort uStack_18d6;
  ushort uStack_18d4;
  ushort uStack_18d2;
  ushort uStack_18d0;
  ushort uStack_18ce;
  ushort uStack_18cc;
  ushort uStack_18ca;
  ushort local_18c8;
  ushort uStack_18c6;
  ushort uStack_18c4;
  ushort uStack_18c2;
  ushort uStack_18c0;
  ushort uStack_18be;
  ushort uStack_18bc;
  ushort uStack_18ba;
  ushort local_18b8;
  ushort uStack_18b6;
  ushort uStack_18b4;
  ushort uStack_18b2;
  ushort uStack_18b0;
  ushort uStack_18ae;
  ushort uStack_18ac;
  ushort uStack_18aa;
  ushort local_18a8;
  ushort uStack_18a6;
  ushort uStack_18a4;
  ushort uStack_18a2;
  ushort uStack_18a0;
  ushort uStack_189e;
  ushort uStack_189c;
  ushort uStack_189a;
  ushort local_1898;
  ushort uStack_1896;
  ushort uStack_1894;
  ushort uStack_1892;
  ushort uStack_1890;
  ushort uStack_188e;
  ushort uStack_188c;
  ushort uStack_188a;
  char local_1408;
  char cStack_1407;
  char cStack_1406;
  char cStack_1405;
  char cStack_1404;
  char cStack_1403;
  char cStack_1402;
  char cStack_1401;
  char cStack_1400;
  char cStack_13ff;
  char cStack_13fe;
  char cStack_13fd;
  char cStack_13fc;
  char cStack_13fb;
  char cStack_13fa;
  char cStack_13f9;
  char local_13e8;
  char cStack_13e7;
  char cStack_13e6;
  char cStack_13e5;
  char cStack_13e4;
  char cStack_13e3;
  char cStack_13e2;
  char cStack_13e1;
  char cStack_13e0;
  char cStack_13df;
  char cStack_13de;
  char cStack_13dd;
  char cStack_13dc;
  char cStack_13db;
  char cStack_13da;
  char cStack_13d9;
  short local_13b8;
  short sStack_13b6;
  short sStack_13b4;
  short sStack_13b2;
  short local_1398;
  short sStack_1396;
  short sStack_1394;
  short sStack_1392;
  short local_1378;
  short sStack_1376;
  short sStack_1374;
  short sStack_1372;
  short local_1358;
  short sStack_1356;
  short sStack_1354;
  short sStack_1352;
  short local_1338;
  short sStack_1336;
  short sStack_1334;
  short sStack_1332;
  short local_1318;
  short sStack_1316;
  short sStack_1314;
  short sStack_1312;
  short sStack_12f0;
  short sStack_12ee;
  short sStack_12ec;
  short sStack_12ea;
  short sStack_12d0;
  short sStack_12ce;
  short sStack_12cc;
  short sStack_12ca;
  short sStack_12b0;
  short sStack_12ae;
  short sStack_12ac;
  short sStack_12aa;
  short sStack_1290;
  short sStack_128e;
  short sStack_128c;
  short sStack_128a;
  short sStack_1270;
  short sStack_126e;
  short sStack_126c;
  short sStack_126a;
  short sStack_1250;
  short sStack_124e;
  short sStack_124c;
  short sStack_124a;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  byte bVar25;
  byte bVar26;
  byte bVar27;
  byte bVar29;
  byte bVar30;
  byte bVar31;
  byte bVar32;
  byte bVar33;
  byte bVar34;
  byte bVar35;
  byte bVar37;
  byte bVar38;
  byte bVar39;
  byte bVar40;
  byte bVar41;
  byte bVar42;
  byte bVar43;
  byte bVar45;
  byte bVar46;
  byte bVar47;
  byte bVar48;
  byte bVar49;
  byte bVar50;
  byte bVar51;
  byte bVar53;
  byte bVar54;
  byte bVar55;
  byte bVar56;
  byte bVar57;
  byte bVar58;
  byte bVar60;
  byte bVar61;
  byte bVar62;
  byte bVar63;
  byte bVar64;
  byte bVar65;
  byte bVar66;
  byte bVar68;
  byte bVar69;
  byte bVar70;
  byte bVar71;
  byte bVar72;
  byte bVar73;
  byte bVar74;
  byte bVar76;
  byte bVar77;
  byte bVar78;
  byte bVar79;
  byte bVar80;
  byte bVar81;
  byte bVar83;
  byte bVar84;
  byte bVar85;
  byte bVar86;
  byte bVar87;
  byte bVar88;
  byte bVar89;
  byte bVar91;
  byte bVar92;
  byte bVar93;
  byte bVar94;
  byte bVar95;
  byte bVar96;
  byte bVar97;
  byte bVar99;
  byte bVar100;
  byte bVar101;
  byte bVar102;
  byte bVar103;
  byte bVar104;
  byte bVar105;
  byte bVar107;
  byte bVar108;
  byte bVar109;
  byte bVar110;
  byte bVar111;
  byte bVar112;
  byte bVar113;
  byte bVar115;
  byte bVar116;
  byte bVar117;
  byte bVar118;
  byte bVar119;
  byte bVar120;
  byte bVar121;
  byte bVar123;
  byte bVar124;
  byte bVar125;
  byte bVar127;
  byte bVar128;
  byte bVar129;
  
  uVar149 = (ulong)yuv_type;
  for (y_ptr1._0_4_ = 0; (uint)y_ptr1 < height - 1; y_ptr1._0_4_ = (uint)y_ptr1 + 2) {
    y_ptr2 = Y + (uint)y_ptr1 * Y_stride;
    u_ptr = Y + ((uint)y_ptr1 + 1) * Y_stride;
    v_ptr = U + ((uint)y_ptr1 >> 1) * UV_stride;
    rgb_ptr1 = V + ((uint)y_ptr1 >> 1) * UV_stride;
    rgb_ptr2 = RGB + (uint)y_ptr1 * RGB_stride;
    local_30c0 = RGB + ((uint)y_ptr1 + 1) * RGB_stride;
    for (y_ptr1._4_4_ = 0; y_ptr1._4_4_ < width - 0x1f; y_ptr1._4_4_ = y_ptr1._4_4_ + 0x20) {
      uVar130 = *(undefined8 *)v_ptr;
      uVar131 = *(undefined8 *)(v_ptr + 8);
      uVar132 = *(undefined8 *)rgb_ptr1;
      uVar133 = *(undefined8 *)(rgb_ptr1 + 8);
      local_13e8 = (char)uVar130;
      cStack_13e7 = (char)((ulong)uVar130 >> 8);
      cStack_13e6 = (char)((ulong)uVar130 >> 0x10);
      cStack_13e5 = (char)((ulong)uVar130 >> 0x18);
      cStack_13e4 = (char)((ulong)uVar130 >> 0x20);
      cStack_13e3 = (char)((ulong)uVar130 >> 0x28);
      cStack_13e2 = (char)((ulong)uVar130 >> 0x30);
      cStack_13e1 = (char)((ulong)uVar130 >> 0x38);
      cStack_13e0 = (char)uVar131;
      cStack_13df = (char)((ulong)uVar131 >> 8);
      cStack_13de = (char)((ulong)uVar131 >> 0x10);
      cStack_13dd = (char)((ulong)uVar131 >> 0x18);
      cStack_13dc = (char)((ulong)uVar131 >> 0x20);
      cStack_13db = (char)((ulong)uVar131 >> 0x28);
      cStack_13da = (char)((ulong)uVar131 >> 0x30);
      cStack_13d9 = (char)((ulong)uVar131 >> 0x38);
      local_1408 = (char)uVar132;
      cStack_1407 = (char)((ulong)uVar132 >> 8);
      cStack_1406 = (char)((ulong)uVar132 >> 0x10);
      cStack_1405 = (char)((ulong)uVar132 >> 0x18);
      cStack_1404 = (char)((ulong)uVar132 >> 0x20);
      cStack_1403 = (char)((ulong)uVar132 >> 0x28);
      cStack_1402 = (char)((ulong)uVar132 >> 0x30);
      cStack_1401 = (char)((ulong)uVar132 >> 0x38);
      cStack_1400 = (char)uVar133;
      cStack_13ff = (char)((ulong)uVar133 >> 8);
      cStack_13fe = (char)((ulong)uVar133 >> 0x10);
      cStack_13fd = (char)((ulong)uVar133 >> 0x18);
      cStack_13fc = (char)((ulong)uVar133 >> 0x20);
      cStack_13fb = (char)((ulong)uVar133 >> 0x28);
      cStack_13fa = (char)((ulong)uVar133 >> 0x30);
      cStack_13f9 = (char)((ulong)uVar133 >> 0x38);
      auVar144[1] = local_13e8 + -0x80;
      auVar144[0] = local_13e8 + -0x80;
      auVar144[2] = cStack_13e7 + -0x80;
      auVar144[3] = cStack_13e7 + -0x80;
      auVar144[4] = cStack_13e6 + -0x80;
      auVar144[5] = cStack_13e6 + -0x80;
      auVar144[6] = cStack_13e5 + -0x80;
      auVar144[7] = cStack_13e5 + -0x80;
      auVar144[8] = cStack_13e4 + -0x80;
      auVar144[9] = cStack_13e4 + -0x80;
      auVar144[10] = cStack_13e3 + -0x80;
      auVar144[0xb] = cStack_13e3 + -0x80;
      auVar144[0xc] = cStack_13e2 + -0x80;
      auVar144[0xd] = cStack_13e2 + -0x80;
      auVar144[0xe] = cStack_13e1 + -0x80;
      auVar144[0xf] = cStack_13e1 + -0x80;
      auVar159 = psraw(auVar144,ZEXT416(8));
      auVar143[1] = local_1408 + -0x80;
      auVar143[0] = local_1408 + -0x80;
      auVar143[2] = cStack_1407 + -0x80;
      auVar143[3] = cStack_1407 + -0x80;
      auVar143[4] = cStack_1406 + -0x80;
      auVar143[5] = cStack_1406 + -0x80;
      auVar143[6] = cStack_1405 + -0x80;
      auVar143[7] = cStack_1405 + -0x80;
      auVar143[8] = cStack_1404 + -0x80;
      auVar143[9] = cStack_1404 + -0x80;
      auVar143[10] = cStack_1403 + -0x80;
      auVar143[0xb] = cStack_1403 + -0x80;
      auVar143[0xc] = cStack_1402 + -0x80;
      auVar143[0xd] = cStack_1402 + -0x80;
      auVar143[0xe] = cStack_1401 + -0x80;
      auVar143[0xf] = cStack_1401 + -0x80;
      auVar160 = psraw(auVar143,ZEXT416(8));
      bVar1 = YUV2RGB[uVar149].cr_factor;
      local_2a28 = auVar160._0_2_;
      sStack_2a26 = auVar160._2_2_;
      sStack_2a24 = auVar160._4_2_;
      sStack_2a22 = auVar160._6_2_;
      sStack_2a20 = auVar160._8_2_;
      sStack_2a1e = auVar160._10_2_;
      sStack_2a1c = auVar160._12_2_;
      sStack_2a1a = auVar160._14_2_;
      uStack_2a36 = (ushort)bVar1;
      uStack_2a34 = (ushort)bVar1;
      uStack_2a32 = (ushort)bVar1;
      uStack_2a2e = (ushort)bVar1;
      uStack_2a2c = (ushort)bVar1;
      uStack_2a2a = (ushort)bVar1;
      auVar142._2_2_ = sStack_2a26 * uStack_2a36;
      auVar142._0_2_ = local_2a28 * (ushort)bVar1;
      auVar142._4_2_ = sStack_2a24 * uStack_2a34;
      auVar142._6_2_ = sStack_2a22 * uStack_2a32;
      auVar142._8_2_ = sStack_2a20 * (ushort)bVar1;
      auVar142._10_2_ = sStack_2a1e * uStack_2a2e;
      auVar142._12_2_ = sStack_2a1c * uStack_2a2c;
      auVar142._14_2_ = sStack_2a1a * uStack_2a2a;
      auVar160 = psraw(auVar142,ZEXT416(6));
      bVar1 = YUV2RGB[uVar149].g_cb_factor;
      local_2a48 = auVar159._0_2_;
      sStack_2a46 = auVar159._2_2_;
      sStack_2a44 = auVar159._4_2_;
      sStack_2a42 = auVar159._6_2_;
      sStack_2a40 = auVar159._8_2_;
      sStack_2a3e = auVar159._10_2_;
      sStack_2a3c = auVar159._12_2_;
      sStack_2a3a = auVar159._14_2_;
      uStack_2a56 = (ushort)bVar1;
      uStack_2a54 = (ushort)bVar1;
      uStack_2a52 = (ushort)bVar1;
      uStack_2a4e = (ushort)bVar1;
      uStack_2a4c = (ushort)bVar1;
      uStack_2a4a = (ushort)bVar1;
      bVar2 = YUV2RGB[uVar149].g_cr_factor;
      uStack_2a76 = (ushort)bVar2;
      uStack_2a74 = (ushort)bVar2;
      uStack_2a72 = (ushort)bVar2;
      uStack_2a6e = (ushort)bVar2;
      uStack_2a6c = (ushort)bVar2;
      uStack_2a6a = (ushort)bVar2;
      auVar141._2_2_ = sStack_2a46 * uStack_2a56 + sStack_2a26 * uStack_2a76;
      auVar141._0_2_ = local_2a48 * (ushort)bVar1 + local_2a28 * (ushort)bVar2;
      auVar141._4_2_ = sStack_2a44 * uStack_2a54 + sStack_2a24 * uStack_2a74;
      auVar141._6_2_ = sStack_2a42 * uStack_2a52 + sStack_2a22 * uStack_2a72;
      auVar141._8_2_ = sStack_2a40 * (ushort)bVar1 + sStack_2a20 * (ushort)bVar2;
      auVar141._10_2_ = sStack_2a3e * uStack_2a4e + sStack_2a1e * uStack_2a6e;
      auVar141._12_2_ = sStack_2a3c * uStack_2a4c + sStack_2a1c * uStack_2a6c;
      auVar141._14_2_ = sStack_2a3a * uStack_2a4a + sStack_2a1a * uStack_2a6a;
      auVar159 = psraw(auVar141,ZEXT416(7));
      bVar1 = YUV2RGB[uVar149].cb_factor;
      uStack_2a96 = (ushort)bVar1;
      uStack_2a94 = (ushort)bVar1;
      uStack_2a92 = (ushort)bVar1;
      uStack_2a8e = (ushort)bVar1;
      uStack_2a8c = (ushort)bVar1;
      uStack_2a8a = (ushort)bVar1;
      auVar140._2_2_ = sStack_2a46 * uStack_2a96;
      auVar140._0_2_ = local_2a48 * (ushort)bVar1;
      auVar140._4_2_ = sStack_2a44 * uStack_2a94;
      auVar140._6_2_ = sStack_2a42 * uStack_2a92;
      auVar140._8_2_ = sStack_2a40 * (ushort)bVar1;
      auVar140._10_2_ = sStack_2a3e * uStack_2a8e;
      auVar140._12_2_ = sStack_2a3c * uStack_2a8c;
      auVar140._14_2_ = sStack_2a3a * uStack_2a8a;
      auVar161 = psraw(auVar140,ZEXT416(6));
      local_1318 = auVar160._0_2_;
      sStack_1316 = auVar160._2_2_;
      sStack_1314 = auVar160._4_2_;
      sStack_1312 = auVar160._6_2_;
      local_1338 = auVar159._0_2_;
      sStack_1336 = auVar159._2_2_;
      sStack_1334 = auVar159._4_2_;
      sStack_1332 = auVar159._6_2_;
      local_1358 = auVar161._0_2_;
      sStack_1356 = auVar161._2_2_;
      sStack_1354 = auVar161._4_2_;
      sStack_1352 = auVar161._6_2_;
      sStack_1250 = auVar160._8_2_;
      sStack_124e = auVar160._10_2_;
      sStack_124c = auVar160._12_2_;
      sStack_124a = auVar160._14_2_;
      sStack_1270 = auVar159._8_2_;
      sStack_126e = auVar159._10_2_;
      sStack_126c = auVar159._12_2_;
      sStack_126a = auVar159._14_2_;
      sStack_1290 = auVar161._8_2_;
      sStack_128e = auVar161._10_2_;
      sStack_128c = auVar161._12_2_;
      sStack_128a = auVar161._14_2_;
      uVar3 = YUV2RGB[uVar149].y_offset;
      auVar148[1] = uVar3;
      auVar148[0] = uVar3;
      auVar148[2] = uVar3;
      auVar148[3] = uVar3;
      auVar148[4] = uVar3;
      auVar148[5] = uVar3;
      auVar148[6] = uVar3;
      auVar148[7] = uVar3;
      auVar148[9] = uVar3;
      auVar148[8] = uVar3;
      auVar148[10] = uVar3;
      auVar148[0xb] = uVar3;
      auVar148[0xc] = uVar3;
      auVar148[0xd] = uVar3;
      auVar148[0xe] = uVar3;
      auVar148[0xf] = uVar3;
      auVar159 = psubusb(*(undefined1 (*) [16])y_ptr2,auVar148);
      local_2fe8 = auVar159[0];
      bStack_2fe7 = auVar159[1];
      bStack_2fe6 = auVar159[2];
      bStack_2fe5 = auVar159[3];
      bStack_2fe4 = auVar159[4];
      bStack_2fe3 = auVar159[5];
      bStack_2fe2 = auVar159[6];
      bStack_2fe1 = auVar159[7];
      bStack_2ee0 = auVar159[8];
      bStack_2edf = auVar159[9];
      bStack_2ede = auVar159[10];
      bStack_2edd = auVar159[0xb];
      bStack_2edc = auVar159[0xc];
      bStack_2edb = auVar159[0xd];
      bStack_2eda = auVar159[0xe];
      bStack_2ed9 = auVar159[0xf];
      bVar1 = YUV2RGB[uVar149].y_factor;
      uStack_2aa6 = (ushort)bStack_2fe7;
      uStack_2aa4 = (ushort)bStack_2fe6;
      uStack_2aa2 = (ushort)bStack_2fe5;
      uStack_2a9e = (ushort)bStack_2fe3;
      uStack_2a9c = (ushort)bStack_2fe2;
      uStack_2a9a = (ushort)bStack_2fe1;
      uStack_2ab6 = (ushort)bVar1;
      uStack_2ab4 = (ushort)bVar1;
      uStack_2ab2 = (ushort)bVar1;
      uStack_2aae = (ushort)bVar1;
      uStack_2aac = (ushort)bVar1;
      uStack_2aaa = (ushort)bVar1;
      uVar173 = (ushort)((ushort)local_2fe8 * (ushort)bVar1) >> 7;
      uVar208 = (ushort)((ushort)bStack_2fe4 * (ushort)bVar1) >> 7;
      y_16_2[1]._2_1_ = (undefined1)((ushort)(uStack_2aa6 * uStack_2ab6) >> 7);
      y_16_2[1]._3_1_ = (byte)((ushort)(uStack_2aa6 * uStack_2ab6) >> 0xf);
      y_16_2[1]._4_1_ = (undefined1)((ushort)(uStack_2aa4 * uStack_2ab4) >> 7);
      y_16_2[1]._5_1_ = (byte)((ushort)(uStack_2aa4 * uStack_2ab4) >> 0xf);
      y_16_2[1]._6_1_ = (undefined1)((ushort)(uStack_2aa2 * uStack_2ab2) >> 7);
      y_16_2[1]._7_1_ = (byte)((ushort)(uStack_2aa2 * uStack_2ab2) >> 0xf);
      y_16_1[0]._2_1_ = (undefined1)((ushort)(uStack_2a9e * uStack_2aae) >> 7);
      y_16_1[0]._3_1_ = (byte)((ushort)(uStack_2a9e * uStack_2aae) >> 0xf);
      y_16_1[0]._4_1_ = (undefined1)((ushort)(uStack_2a9c * uStack_2aac) >> 7);
      y_16_1[0]._5_1_ = (byte)((ushort)(uStack_2a9c * uStack_2aac) >> 0xf);
      y_16_1[0]._6_1_ = (undefined1)((ushort)(uStack_2a9a * uStack_2aaa) >> 7);
      y_16_1[0]._7_1_ = (byte)((ushort)(uStack_2a9a * uStack_2aaa) >> 0xf);
      bVar1 = YUV2RGB[uVar149].y_factor;
      uStack_2ac6 = (ushort)bStack_2edf;
      uStack_2ac4 = (ushort)bStack_2ede;
      uStack_2ac2 = (ushort)bStack_2edd;
      uStack_2abe = (ushort)bStack_2edb;
      uStack_2abc = (ushort)bStack_2eda;
      uStack_2aba = (ushort)bStack_2ed9;
      uStack_2ad6 = (ushort)bVar1;
      uStack_2ad4 = (ushort)bVar1;
      uStack_2ad2 = (ushort)bVar1;
      uStack_2ace = (ushort)bVar1;
      uStack_2acc = (ushort)bVar1;
      uStack_2aca = (ushort)bVar1;
      uVar174 = (ushort)((ushort)bStack_2ee0 * (ushort)bVar1) >> 7;
      uVar209 = (ushort)((ushort)bStack_2edc * (ushort)bVar1) >> 7;
      u_16[1]._2_1_ = (undefined1)((ushort)(uStack_2ac6 * uStack_2ad6) >> 7);
      u_16[1]._3_1_ = (byte)((ushort)(uStack_2ac6 * uStack_2ad6) >> 0xf);
      u_16[1]._4_1_ = (undefined1)((ushort)(uStack_2ac4 * uStack_2ad4) >> 7);
      u_16[1]._5_1_ = (byte)((ushort)(uStack_2ac4 * uStack_2ad4) >> 0xf);
      u_16[1]._6_1_ = (undefined1)((ushort)(uStack_2ac2 * uStack_2ad2) >> 7);
      u_16[1]._7_1_ = (byte)((ushort)(uStack_2ac2 * uStack_2ad2) >> 0xf);
      y_16_2[0]._2_1_ = (undefined1)((ushort)(uStack_2abe * uStack_2ace) >> 7);
      y_16_2[0]._3_1_ = (byte)((ushort)(uStack_2abe * uStack_2ace) >> 0xf);
      y_16_2[0]._4_1_ = (undefined1)((ushort)(uStack_2abc * uStack_2acc) >> 7);
      y_16_2[0]._5_1_ = (byte)((ushort)(uStack_2abc * uStack_2acc) >> 0xf);
      y_16_2[0]._6_1_ = (undefined1)((ushort)(uStack_2aba * uStack_2aca) >> 7);
      y_16_2[0]._7_1_ = (byte)((ushort)(uStack_2aba * uStack_2aca) >> 0xf);
      uVar134 = CONCAT13(y_16_2[1]._3_1_,CONCAT12(y_16_2[1]._2_1_,uVar173));
      uVar135 = CONCAT15(y_16_2[1]._5_1_,CONCAT14(y_16_2[1]._4_1_,uVar134));
      uVar136 = CONCAT13(y_16_1[0]._3_1_,CONCAT12(y_16_1[0]._2_1_,uVar208));
      uVar137 = CONCAT15(y_16_1[0]._5_1_,CONCAT14(y_16_1[0]._4_1_,uVar136));
      sStack_2c46 = (short)((uint)uVar134 >> 0x10);
      sStack_2c44 = (short)((uint6)uVar135 >> 0x20);
      sStack_2c42 = (short)(CONCAT17(y_16_2[1]._7_1_,CONCAT16(y_16_2[1]._6_1_,uVar135)) >> 0x30);
      sStack_2c3e = (short)((uint)uVar136 >> 0x10);
      sStack_2c3c = (short)((uint6)uVar137 >> 0x20);
      sStack_2c3a = (short)(CONCAT17(y_16_1[0]._7_1_,CONCAT16(y_16_1[0]._6_1_,uVar137)) >> 0x30);
      sVar175 = uVar173 + local_1318;
      sStack_2c46 = sStack_2c46 + local_1318;
      sStack_2c44 = sStack_2c44 + sStack_1316;
      sStack_2c42 = sStack_2c42 + sStack_1316;
      sVar210 = uVar208 + sStack_1314;
      sStack_2c3e = sStack_2c3e + sStack_1314;
      sStack_2c3c = sStack_2c3c + sStack_1312;
      sStack_2c3a = sStack_2c3a + sStack_1312;
      uVar134 = CONCAT13(y_16_2[1]._3_1_,CONCAT12(y_16_2[1]._2_1_,uVar173));
      uVar135 = CONCAT15(y_16_2[1]._5_1_,CONCAT14(y_16_2[1]._4_1_,uVar134));
      uVar136 = CONCAT13(y_16_1[0]._3_1_,CONCAT12(y_16_1[0]._2_1_,uVar208));
      uVar137 = CONCAT15(y_16_1[0]._5_1_,CONCAT14(y_16_1[0]._4_1_,uVar136));
      sStack_2016 = (short)((uint)uVar134 >> 0x10);
      sStack_2014 = (short)((uint6)uVar135 >> 0x20);
      sStack_2012 = (short)(CONCAT17(y_16_2[1]._7_1_,CONCAT16(y_16_2[1]._6_1_,uVar135)) >> 0x30);
      sStack_200e = (short)((uint)uVar136 >> 0x10);
      sStack_200c = (short)((uint6)uVar137 >> 0x20);
      sStack_200a = (short)(CONCAT17(y_16_1[0]._7_1_,CONCAT16(y_16_1[0]._6_1_,uVar137)) >> 0x30);
      sVar176 = uVar173 - local_1338;
      sStack_2016 = sStack_2016 - local_1338;
      sStack_2014 = sStack_2014 - sStack_1336;
      sStack_2012 = sStack_2012 - sStack_1336;
      sVar211 = uVar208 - sStack_1334;
      sStack_200e = sStack_200e - sStack_1334;
      sStack_200c = sStack_200c - sStack_1332;
      sStack_200a = sStack_200a - sStack_1332;
      uVar134 = CONCAT13(y_16_2[1]._3_1_,CONCAT12(y_16_2[1]._2_1_,uVar173));
      uVar135 = CONCAT15(y_16_2[1]._5_1_,CONCAT14(y_16_2[1]._4_1_,uVar134));
      uVar136 = CONCAT13(y_16_1[0]._3_1_,CONCAT12(y_16_1[0]._2_1_,uVar208));
      uVar137 = CONCAT15(y_16_1[0]._5_1_,CONCAT14(y_16_1[0]._4_1_,uVar136));
      sStack_2c66 = (short)((uint)uVar134 >> 0x10);
      sStack_2c64 = (short)((uint6)uVar135 >> 0x20);
      sStack_2c62 = (short)(CONCAT17(y_16_2[1]._7_1_,CONCAT16(y_16_2[1]._6_1_,uVar135)) >> 0x30);
      sStack_2c5e = (short)((uint)uVar136 >> 0x10);
      sStack_2c5c = (short)((uint6)uVar137 >> 0x20);
      sStack_2c5a = (short)(CONCAT17(y_16_1[0]._7_1_,CONCAT16(y_16_1[0]._6_1_,uVar137)) >> 0x30);
      sVar177 = uVar173 + local_1358;
      sStack_2c66 = sStack_2c66 + local_1358;
      sStack_2c64 = sStack_2c64 + sStack_1356;
      sStack_2c62 = sStack_2c62 + sStack_1356;
      sVar212 = uVar208 + sStack_1354;
      sStack_2c5e = sStack_2c5e + sStack_1354;
      sStack_2c5c = sStack_2c5c + sStack_1352;
      sStack_2c5a = sStack_2c5a + sStack_1352;
      uVar134 = CONCAT13(u_16[1]._3_1_,CONCAT12(u_16[1]._2_1_,uVar174));
      uVar135 = CONCAT15(u_16[1]._5_1_,CONCAT14(u_16[1]._4_1_,uVar134));
      uVar136 = CONCAT13(y_16_2[0]._3_1_,CONCAT12(y_16_2[0]._2_1_,uVar209));
      uVar137 = CONCAT15(y_16_2[0]._5_1_,CONCAT14(y_16_2[0]._4_1_,uVar136));
      sStack_2c86 = (short)((uint)uVar134 >> 0x10);
      sStack_2c84 = (short)((uint6)uVar135 >> 0x20);
      sStack_2c82 = (short)(CONCAT17(u_16[1]._7_1_,CONCAT16(u_16[1]._6_1_,uVar135)) >> 0x30);
      sStack_2c7e = (short)((uint)uVar136 >> 0x10);
      sStack_2c7c = (short)((uint6)uVar137 >> 0x20);
      sStack_2c7a = (short)(CONCAT17(y_16_2[0]._7_1_,CONCAT16(y_16_2[0]._6_1_,uVar137)) >> 0x30);
      sVar178 = uVar174 + sStack_1250;
      sStack_2c86 = sStack_2c86 + sStack_1250;
      sStack_2c84 = sStack_2c84 + sStack_124e;
      sStack_2c82 = sStack_2c82 + sStack_124e;
      sVar213 = uVar209 + sStack_124c;
      sStack_2c7e = sStack_2c7e + sStack_124c;
      sStack_2c7c = sStack_2c7c + sStack_124a;
      sStack_2c7a = sStack_2c7a + sStack_124a;
      uVar134 = CONCAT13(u_16[1]._3_1_,CONCAT12(u_16[1]._2_1_,uVar174));
      uVar135 = CONCAT15(u_16[1]._5_1_,CONCAT14(u_16[1]._4_1_,uVar134));
      uVar136 = CONCAT13(y_16_2[0]._3_1_,CONCAT12(y_16_2[0]._2_1_,uVar209));
      uVar137 = CONCAT15(y_16_2[0]._5_1_,CONCAT14(y_16_2[0]._4_1_,uVar136));
      sStack_2036 = (short)((uint)uVar134 >> 0x10);
      sStack_2034 = (short)((uint6)uVar135 >> 0x20);
      sStack_2032 = (short)(CONCAT17(u_16[1]._7_1_,CONCAT16(u_16[1]._6_1_,uVar135)) >> 0x30);
      sStack_202e = (short)((uint)uVar136 >> 0x10);
      sStack_202c = (short)((uint6)uVar137 >> 0x20);
      sStack_202a = (short)(CONCAT17(y_16_2[0]._7_1_,CONCAT16(y_16_2[0]._6_1_,uVar137)) >> 0x30);
      sVar179 = uVar174 - sStack_1270;
      sStack_2036 = sStack_2036 - sStack_1270;
      sStack_2034 = sStack_2034 - sStack_126e;
      sStack_2032 = sStack_2032 - sStack_126e;
      sVar214 = uVar209 - sStack_126c;
      sStack_202e = sStack_202e - sStack_126c;
      sStack_202c = sStack_202c - sStack_126a;
      sStack_202a = sStack_202a - sStack_126a;
      uVar134 = CONCAT13(u_16[1]._3_1_,CONCAT12(u_16[1]._2_1_,uVar174));
      uVar135 = CONCAT15(u_16[1]._5_1_,CONCAT14(u_16[1]._4_1_,uVar134));
      uVar136 = CONCAT13(y_16_2[0]._3_1_,CONCAT12(y_16_2[0]._2_1_,uVar209));
      uVar137 = CONCAT15(y_16_2[0]._5_1_,CONCAT14(y_16_2[0]._4_1_,uVar136));
      sStack_2ca6 = (short)((uint)uVar134 >> 0x10);
      sStack_2ca4 = (short)((uint6)uVar135 >> 0x20);
      sStack_2ca2 = (short)(CONCAT17(u_16[1]._7_1_,CONCAT16(u_16[1]._6_1_,uVar135)) >> 0x30);
      sStack_2c9e = (short)((uint)uVar136 >> 0x10);
      sStack_2c9c = (short)((uint6)uVar137 >> 0x20);
      sStack_2c9a = (short)(CONCAT17(y_16_2[0]._7_1_,CONCAT16(y_16_2[0]._6_1_,uVar137)) >> 0x30);
      sVar180 = uVar174 + sStack_1290;
      sStack_2ca6 = sStack_2ca6 + sStack_1290;
      sStack_2ca4 = sStack_2ca4 + sStack_128e;
      sStack_2ca2 = sStack_2ca2 + sStack_128e;
      sVar215 = uVar209 + sStack_128c;
      sStack_2c9e = sStack_2c9e + sStack_128c;
      sStack_2c9c = sStack_2c9c + sStack_128a;
      sStack_2c9a = sStack_2c9a + sStack_128a;
      bVar4 = (0 < sStack_2c46) * (sStack_2c46 < 0x100) * (char)sStack_2c46 - (0xff < sStack_2c46);
      bVar5 = (0 < sStack_2c42) * (sStack_2c42 < 0x100) * (char)sStack_2c42 - (0xff < sStack_2c42);
      bVar6 = (0 < sStack_2c3e) * (sStack_2c3e < 0x100) * (char)sStack_2c3e - (0xff < sStack_2c3e);
      bVar7 = (0 < sStack_2c3a) * (sStack_2c3a < 0x100) * (char)sStack_2c3a - (0xff < sStack_2c3a);
      bVar8 = (0 < sStack_2c86) * (sStack_2c86 < 0x100) * (char)sStack_2c86 - (0xff < sStack_2c86);
      bVar9 = (0 < sStack_2c82) * (sStack_2c82 < 0x100) * (char)sStack_2c82 - (0xff < sStack_2c82);
      bVar10 = (0 < sStack_2c7e) * (sStack_2c7e < 0x100) * (char)sStack_2c7e - (0xff < sStack_2c7e);
      bVar11 = (0 < sStack_2c7a) * (sStack_2c7a < 0x100) * (char)sStack_2c7a - (0xff < sStack_2c7a);
      bVar12 = (0 < sStack_2016) * (sStack_2016 < 0x100) * (char)sStack_2016 - (0xff < sStack_2016);
      bVar13 = (0 < sStack_2012) * (sStack_2012 < 0x100) * (char)sStack_2012 - (0xff < sStack_2012);
      bVar14 = (0 < sStack_200e) * (sStack_200e < 0x100) * (char)sStack_200e - (0xff < sStack_200e);
      bVar15 = (0 < sStack_200a) * (sStack_200a < 0x100) * (char)sStack_200a - (0xff < sStack_200a);
      bVar16 = (0 < sStack_2036) * (sStack_2036 < 0x100) * (char)sStack_2036 - (0xff < sStack_2036);
      bVar17 = (0 < sStack_2032) * (sStack_2032 < 0x100) * (char)sStack_2032 - (0xff < sStack_2032);
      bVar18 = (0 < sStack_202e) * (sStack_202e < 0x100) * (char)sStack_202e - (0xff < sStack_202e);
      bVar19 = (0 < sStack_202a) * (sStack_202a < 0x100) * (char)sStack_202a - (0xff < sStack_202a);
      bVar20 = (0 < sStack_2c66) * (sStack_2c66 < 0x100) * (char)sStack_2c66 - (0xff < sStack_2c66);
      bVar21 = (0 < sStack_2c62) * (sStack_2c62 < 0x100) * (char)sStack_2c62 - (0xff < sStack_2c62);
      bVar22 = (0 < sStack_2c5e) * (sStack_2c5e < 0x100) * (char)sStack_2c5e - (0xff < sStack_2c5e);
      bVar23 = (0 < sStack_2c5a) * (sStack_2c5a < 0x100) * (char)sStack_2c5a - (0xff < sStack_2c5a);
      bVar24 = (0 < sStack_2ca6) * (sStack_2ca6 < 0x100) * (char)sStack_2ca6 - (0xff < sStack_2ca6);
      bVar25 = (0 < sStack_2ca2) * (sStack_2ca2 < 0x100) * (char)sStack_2ca2 - (0xff < sStack_2ca2);
      bVar26 = (0 < sStack_2c9e) * (sStack_2c9e < 0x100) * (char)sStack_2c9e - (0xff < sStack_2c9e);
      bVar27 = (0 < sStack_2c9a) * (sStack_2c9a < 0x100) * (char)sStack_2c9a - (0xff < sStack_2c9a);
      uVar3 = YUV2RGB[uVar149].y_offset;
      auVar147[1] = uVar3;
      auVar147[0] = uVar3;
      auVar147[2] = uVar3;
      auVar147[3] = uVar3;
      auVar147[4] = uVar3;
      auVar147[5] = uVar3;
      auVar147[6] = uVar3;
      auVar147[7] = uVar3;
      auVar147[9] = uVar3;
      auVar147[8] = uVar3;
      auVar147[10] = uVar3;
      auVar147[0xb] = uVar3;
      auVar147[0xc] = uVar3;
      auVar147[0xd] = uVar3;
      auVar147[0xe] = uVar3;
      auVar147[0xf] = uVar3;
      auVar159 = psubusb(*(undefined1 (*) [16])u_ptr,auVar147);
      local_3008 = auVar159[0];
      bStack_3007 = auVar159[1];
      bStack_3006 = auVar159[2];
      bStack_3005 = auVar159[3];
      bStack_3004 = auVar159[4];
      bStack_3003 = auVar159[5];
      bStack_3002 = auVar159[6];
      bStack_3001 = auVar159[7];
      bStack_2f00 = auVar159[8];
      bStack_2eff = auVar159[9];
      bStack_2efe = auVar159[10];
      bStack_2efd = auVar159[0xb];
      bStack_2efc = auVar159[0xc];
      bStack_2efb = auVar159[0xd];
      bStack_2efa = auVar159[0xe];
      bStack_2ef9 = auVar159[0xf];
      bVar1 = YUV2RGB[uVar149].y_factor;
      uStack_2ae6 = (ushort)bStack_3007;
      uStack_2ae4 = (ushort)bStack_3006;
      uStack_2ae2 = (ushort)bStack_3005;
      uStack_2ade = (ushort)bStack_3003;
      uStack_2adc = (ushort)bStack_3002;
      uStack_2ada = (ushort)bStack_3001;
      uStack_2af6 = (ushort)bVar1;
      uStack_2af4 = (ushort)bVar1;
      uStack_2af2 = (ushort)bVar1;
      uStack_2aee = (ushort)bVar1;
      uStack_2aec = (ushort)bVar1;
      uStack_2aea = (ushort)bVar1;
      uVar173 = (ushort)((ushort)local_3008 * (ushort)bVar1) >> 7;
      uVar208 = (ushort)((ushort)bStack_3004 * (ushort)bVar1) >> 7;
      y_16_2[1]._2_1_ = (undefined1)((ushort)(uStack_2ae6 * uStack_2af6) >> 7);
      y_16_2[1]._3_1_ = (byte)((ushort)(uStack_2ae6 * uStack_2af6) >> 0xf);
      y_16_2[1]._4_1_ = (undefined1)((ushort)(uStack_2ae4 * uStack_2af4) >> 7);
      y_16_2[1]._5_1_ = (byte)((ushort)(uStack_2ae4 * uStack_2af4) >> 0xf);
      y_16_2[1]._6_1_ = (undefined1)((ushort)(uStack_2ae2 * uStack_2af2) >> 7);
      y_16_2[1]._7_1_ = (byte)((ushort)(uStack_2ae2 * uStack_2af2) >> 0xf);
      y_16_1[0]._2_1_ = (undefined1)((ushort)(uStack_2ade * uStack_2aee) >> 7);
      y_16_1[0]._3_1_ = (byte)((ushort)(uStack_2ade * uStack_2aee) >> 0xf);
      y_16_1[0]._4_1_ = (undefined1)((ushort)(uStack_2adc * uStack_2aec) >> 7);
      y_16_1[0]._5_1_ = (byte)((ushort)(uStack_2adc * uStack_2aec) >> 0xf);
      y_16_1[0]._6_1_ = (undefined1)((ushort)(uStack_2ada * uStack_2aea) >> 7);
      y_16_1[0]._7_1_ = (byte)((ushort)(uStack_2ada * uStack_2aea) >> 0xf);
      bVar1 = YUV2RGB[uVar149].y_factor;
      uStack_2b06 = (ushort)bStack_2eff;
      uStack_2b04 = (ushort)bStack_2efe;
      uStack_2b02 = (ushort)bStack_2efd;
      uStack_2afe = (ushort)bStack_2efb;
      uStack_2afc = (ushort)bStack_2efa;
      uStack_2afa = (ushort)bStack_2ef9;
      uStack_2b16 = (ushort)bVar1;
      uStack_2b14 = (ushort)bVar1;
      uStack_2b12 = (ushort)bVar1;
      uStack_2b0e = (ushort)bVar1;
      uStack_2b0c = (ushort)bVar1;
      uStack_2b0a = (ushort)bVar1;
      uVar174 = (ushort)((ushort)bStack_2f00 * (ushort)bVar1) >> 7;
      uVar209 = (ushort)((ushort)bStack_2efc * (ushort)bVar1) >> 7;
      u_16[1]._2_1_ = (undefined1)((ushort)(uStack_2b06 * uStack_2b16) >> 7);
      u_16[1]._3_1_ = (byte)((ushort)(uStack_2b06 * uStack_2b16) >> 0xf);
      u_16[1]._4_1_ = (undefined1)((ushort)(uStack_2b04 * uStack_2b14) >> 7);
      u_16[1]._5_1_ = (byte)((ushort)(uStack_2b04 * uStack_2b14) >> 0xf);
      u_16[1]._6_1_ = (undefined1)((ushort)(uStack_2b02 * uStack_2b12) >> 7);
      u_16[1]._7_1_ = (byte)((ushort)(uStack_2b02 * uStack_2b12) >> 0xf);
      y_16_2[0]._2_1_ = (undefined1)((ushort)(uStack_2afe * uStack_2b0e) >> 7);
      y_16_2[0]._3_1_ = (byte)((ushort)(uStack_2afe * uStack_2b0e) >> 0xf);
      y_16_2[0]._4_1_ = (undefined1)((ushort)(uStack_2afc * uStack_2b0c) >> 7);
      y_16_2[0]._5_1_ = (byte)((ushort)(uStack_2afc * uStack_2b0c) >> 0xf);
      y_16_2[0]._6_1_ = (undefined1)((ushort)(uStack_2afa * uStack_2b0a) >> 7);
      y_16_2[0]._7_1_ = (byte)((ushort)(uStack_2afa * uStack_2b0a) >> 0xf);
      uVar134 = CONCAT13(y_16_2[1]._3_1_,CONCAT12(y_16_2[1]._2_1_,uVar173));
      uVar135 = CONCAT15(y_16_2[1]._5_1_,CONCAT14(y_16_2[1]._4_1_,uVar134));
      uVar136 = CONCAT13(y_16_1[0]._3_1_,CONCAT12(y_16_1[0]._2_1_,uVar208));
      uVar137 = CONCAT15(y_16_1[0]._5_1_,CONCAT14(y_16_1[0]._4_1_,uVar136));
      sStack_2cc6 = (short)((uint)uVar134 >> 0x10);
      sStack_2cc4 = (short)((uint6)uVar135 >> 0x20);
      sStack_2cc2 = (short)(CONCAT17(y_16_2[1]._7_1_,CONCAT16(y_16_2[1]._6_1_,uVar135)) >> 0x30);
      sStack_2cbe = (short)((uint)uVar136 >> 0x10);
      sStack_2cbc = (short)((uint6)uVar137 >> 0x20);
      sStack_2cba = (short)(CONCAT17(y_16_1[0]._7_1_,CONCAT16(y_16_1[0]._6_1_,uVar137)) >> 0x30);
      sVar181 = uVar173 + local_1318;
      sStack_2cc6 = sStack_2cc6 + local_1318;
      sStack_2cc4 = sStack_2cc4 + sStack_1316;
      sStack_2cc2 = sStack_2cc2 + sStack_1316;
      sVar216 = uVar208 + sStack_1314;
      sStack_2cbe = sStack_2cbe + sStack_1314;
      sStack_2cbc = sStack_2cbc + sStack_1312;
      sStack_2cba = sStack_2cba + sStack_1312;
      uVar134 = CONCAT13(y_16_2[1]._3_1_,CONCAT12(y_16_2[1]._2_1_,uVar173));
      uVar135 = CONCAT15(y_16_2[1]._5_1_,CONCAT14(y_16_2[1]._4_1_,uVar134));
      uVar136 = CONCAT13(y_16_1[0]._3_1_,CONCAT12(y_16_1[0]._2_1_,uVar208));
      uVar137 = CONCAT15(y_16_1[0]._5_1_,CONCAT14(y_16_1[0]._4_1_,uVar136));
      sStack_2056 = (short)((uint)uVar134 >> 0x10);
      sStack_2054 = (short)((uint6)uVar135 >> 0x20);
      sStack_2052 = (short)(CONCAT17(y_16_2[1]._7_1_,CONCAT16(y_16_2[1]._6_1_,uVar135)) >> 0x30);
      sStack_204e = (short)((uint)uVar136 >> 0x10);
      sStack_204c = (short)((uint6)uVar137 >> 0x20);
      sStack_204a = (short)(CONCAT17(y_16_1[0]._7_1_,CONCAT16(y_16_1[0]._6_1_,uVar137)) >> 0x30);
      sVar182 = uVar173 - local_1338;
      sStack_2056 = sStack_2056 - local_1338;
      sStack_2054 = sStack_2054 - sStack_1336;
      sStack_2052 = sStack_2052 - sStack_1336;
      sVar217 = uVar208 - sStack_1334;
      sStack_204e = sStack_204e - sStack_1334;
      sStack_204c = sStack_204c - sStack_1332;
      sStack_204a = sStack_204a - sStack_1332;
      uVar134 = CONCAT13(y_16_2[1]._3_1_,CONCAT12(y_16_2[1]._2_1_,uVar173));
      uVar135 = CONCAT15(y_16_2[1]._5_1_,CONCAT14(y_16_2[1]._4_1_,uVar134));
      uVar136 = CONCAT13(y_16_1[0]._3_1_,CONCAT12(y_16_1[0]._2_1_,uVar208));
      uVar137 = CONCAT15(y_16_1[0]._5_1_,CONCAT14(y_16_1[0]._4_1_,uVar136));
      sStack_2ce6 = (short)((uint)uVar134 >> 0x10);
      sStack_2ce4 = (short)((uint6)uVar135 >> 0x20);
      sStack_2ce2 = (short)(CONCAT17(y_16_2[1]._7_1_,CONCAT16(y_16_2[1]._6_1_,uVar135)) >> 0x30);
      sStack_2cde = (short)((uint)uVar136 >> 0x10);
      sStack_2cdc = (short)((uint6)uVar137 >> 0x20);
      sStack_2cda = (short)(CONCAT17(y_16_1[0]._7_1_,CONCAT16(y_16_1[0]._6_1_,uVar137)) >> 0x30);
      sVar183 = uVar173 + local_1358;
      sStack_2ce6 = sStack_2ce6 + local_1358;
      sStack_2ce4 = sStack_2ce4 + sStack_1356;
      sStack_2ce2 = sStack_2ce2 + sStack_1356;
      sVar218 = uVar208 + sStack_1354;
      sStack_2cde = sStack_2cde + sStack_1354;
      sStack_2cdc = sStack_2cdc + sStack_1352;
      sStack_2cda = sStack_2cda + sStack_1352;
      uVar134 = CONCAT13(u_16[1]._3_1_,CONCAT12(u_16[1]._2_1_,uVar174));
      uVar135 = CONCAT15(u_16[1]._5_1_,CONCAT14(u_16[1]._4_1_,uVar134));
      uVar136 = CONCAT13(y_16_2[0]._3_1_,CONCAT12(y_16_2[0]._2_1_,uVar209));
      uVar137 = CONCAT15(y_16_2[0]._5_1_,CONCAT14(y_16_2[0]._4_1_,uVar136));
      sStack_2d06 = (short)((uint)uVar134 >> 0x10);
      sStack_2d04 = (short)((uint6)uVar135 >> 0x20);
      sStack_2d02 = (short)(CONCAT17(u_16[1]._7_1_,CONCAT16(u_16[1]._6_1_,uVar135)) >> 0x30);
      sStack_2cfe = (short)((uint)uVar136 >> 0x10);
      sStack_2cfc = (short)((uint6)uVar137 >> 0x20);
      sStack_2cfa = (short)(CONCAT17(y_16_2[0]._7_1_,CONCAT16(y_16_2[0]._6_1_,uVar137)) >> 0x30);
      sVar184 = uVar174 + sStack_1250;
      sStack_2d06 = sStack_2d06 + sStack_1250;
      sStack_2d04 = sStack_2d04 + sStack_124e;
      sStack_2d02 = sStack_2d02 + sStack_124e;
      sVar219 = uVar209 + sStack_124c;
      sStack_2cfe = sStack_2cfe + sStack_124c;
      sStack_2cfc = sStack_2cfc + sStack_124a;
      sStack_2cfa = sStack_2cfa + sStack_124a;
      uVar134 = CONCAT13(u_16[1]._3_1_,CONCAT12(u_16[1]._2_1_,uVar174));
      uVar135 = CONCAT15(u_16[1]._5_1_,CONCAT14(u_16[1]._4_1_,uVar134));
      uVar136 = CONCAT13(y_16_2[0]._3_1_,CONCAT12(y_16_2[0]._2_1_,uVar209));
      uVar137 = CONCAT15(y_16_2[0]._5_1_,CONCAT14(y_16_2[0]._4_1_,uVar136));
      sStack_2076 = (short)((uint)uVar134 >> 0x10);
      sStack_2074 = (short)((uint6)uVar135 >> 0x20);
      sStack_2072 = (short)(CONCAT17(u_16[1]._7_1_,CONCAT16(u_16[1]._6_1_,uVar135)) >> 0x30);
      sStack_206e = (short)((uint)uVar136 >> 0x10);
      sStack_206c = (short)((uint6)uVar137 >> 0x20);
      sStack_206a = (short)(CONCAT17(y_16_2[0]._7_1_,CONCAT16(y_16_2[0]._6_1_,uVar137)) >> 0x30);
      sVar185 = uVar174 - sStack_1270;
      sStack_2076 = sStack_2076 - sStack_1270;
      sStack_2074 = sStack_2074 - sStack_126e;
      sStack_2072 = sStack_2072 - sStack_126e;
      sVar220 = uVar209 - sStack_126c;
      sStack_206e = sStack_206e - sStack_126c;
      sStack_206c = sStack_206c - sStack_126a;
      sStack_206a = sStack_206a - sStack_126a;
      uVar134 = CONCAT13(u_16[1]._3_1_,CONCAT12(u_16[1]._2_1_,uVar174));
      uVar135 = CONCAT15(u_16[1]._5_1_,CONCAT14(u_16[1]._4_1_,uVar134));
      uVar136 = CONCAT13(y_16_2[0]._3_1_,CONCAT12(y_16_2[0]._2_1_,uVar209));
      uVar137 = CONCAT15(y_16_2[0]._5_1_,CONCAT14(y_16_2[0]._4_1_,uVar136));
      sStack_2d26 = (short)((uint)uVar134 >> 0x10);
      sStack_2d24 = (short)((uint6)uVar135 >> 0x20);
      sStack_2d22 = (short)(CONCAT17(u_16[1]._7_1_,CONCAT16(u_16[1]._6_1_,uVar135)) >> 0x30);
      sStack_2d1e = (short)((uint)uVar136 >> 0x10);
      sStack_2d1c = (short)((uint6)uVar137 >> 0x20);
      sStack_2d1a = (short)(CONCAT17(y_16_2[0]._7_1_,CONCAT16(y_16_2[0]._6_1_,uVar137)) >> 0x30);
      sVar186 = uVar174 + sStack_1290;
      sStack_2d26 = sStack_2d26 + sStack_1290;
      sStack_2d24 = sStack_2d24 + sStack_128e;
      sStack_2d22 = sStack_2d22 + sStack_128e;
      sVar221 = uVar209 + sStack_128c;
      sStack_2d1e = sStack_2d1e + sStack_128c;
      sStack_2d1c = sStack_2d1c + sStack_128a;
      sStack_2d1a = sStack_2d1a + sStack_128a;
      bVar28 = (0 < sStack_2cc6) * (sStack_2cc6 < 0x100) * (char)sStack_2cc6 - (0xff < sStack_2cc6);
      bVar29 = (0 < sStack_2cc2) * (sStack_2cc2 < 0x100) * (char)sStack_2cc2 - (0xff < sStack_2cc2);
      bVar30 = (0 < sStack_2cbe) * (sStack_2cbe < 0x100) * (char)sStack_2cbe - (0xff < sStack_2cbe);
      bVar31 = (0 < sStack_2cba) * (sStack_2cba < 0x100) * (char)sStack_2cba - (0xff < sStack_2cba);
      bVar32 = (0 < sStack_2d06) * (sStack_2d06 < 0x100) * (char)sStack_2d06 - (0xff < sStack_2d06);
      bVar33 = (0 < sStack_2d02) * (sStack_2d02 < 0x100) * (char)sStack_2d02 - (0xff < sStack_2d02);
      bVar34 = (0 < sStack_2cfe) * (sStack_2cfe < 0x100) * (char)sStack_2cfe - (0xff < sStack_2cfe);
      bVar35 = (0 < sStack_2cfa) * (sStack_2cfa < 0x100) * (char)sStack_2cfa - (0xff < sStack_2cfa);
      bVar36 = (0 < sStack_2056) * (sStack_2056 < 0x100) * (char)sStack_2056 - (0xff < sStack_2056);
      bVar37 = (0 < sStack_2052) * (sStack_2052 < 0x100) * (char)sStack_2052 - (0xff < sStack_2052);
      bVar38 = (0 < sStack_204e) * (sStack_204e < 0x100) * (char)sStack_204e - (0xff < sStack_204e);
      bVar39 = (0 < sStack_204a) * (sStack_204a < 0x100) * (char)sStack_204a - (0xff < sStack_204a);
      bVar40 = (0 < sStack_2076) * (sStack_2076 < 0x100) * (char)sStack_2076 - (0xff < sStack_2076);
      bVar41 = (0 < sStack_2072) * (sStack_2072 < 0x100) * (char)sStack_2072 - (0xff < sStack_2072);
      bVar42 = (0 < sStack_206e) * (sStack_206e < 0x100) * (char)sStack_206e - (0xff < sStack_206e);
      bVar43 = (0 < sStack_206a) * (sStack_206a < 0x100) * (char)sStack_206a - (0xff < sStack_206a);
      bVar44 = (0 < sStack_2ce6) * (sStack_2ce6 < 0x100) * (char)sStack_2ce6 - (0xff < sStack_2ce6);
      bVar45 = (0 < sStack_2ce2) * (sStack_2ce2 < 0x100) * (char)sStack_2ce2 - (0xff < sStack_2ce2);
      bVar46 = (0 < sStack_2cde) * (sStack_2cde < 0x100) * (char)sStack_2cde - (0xff < sStack_2cde);
      bVar47 = (0 < sStack_2cda) * (sStack_2cda < 0x100) * (char)sStack_2cda - (0xff < sStack_2cda);
      bVar48 = (0 < sStack_2d26) * (sStack_2d26 < 0x100) * (char)sStack_2d26 - (0xff < sStack_2d26);
      bVar49 = (0 < sStack_2d22) * (sStack_2d22 < 0x100) * (char)sStack_2d22 - (0xff < sStack_2d22);
      bVar50 = (0 < sStack_2d1e) * (sStack_2d1e < 0x100) * (char)sStack_2d1e - (0xff < sStack_2d1e);
      bVar51 = (0 < sStack_2d1a) * (sStack_2d1a < 0x100) * (char)sStack_2d1a - (0xff < sStack_2d1a);
      auVar139[1] = cStack_13e0 + -0x80;
      auVar139[0] = cStack_13e0 + -0x80;
      auVar139[2] = cStack_13df + -0x80;
      auVar139[3] = cStack_13df + -0x80;
      auVar139[4] = cStack_13de + -0x80;
      auVar139[5] = cStack_13de + -0x80;
      auVar139[6] = cStack_13dd + -0x80;
      auVar139[7] = cStack_13dd + -0x80;
      auVar139[8] = cStack_13dc + -0x80;
      auVar139[9] = cStack_13dc + -0x80;
      auVar139[10] = cStack_13db + -0x80;
      auVar139[0xb] = cStack_13db + -0x80;
      auVar139[0xc] = cStack_13da + -0x80;
      auVar139[0xd] = cStack_13da + -0x80;
      auVar139[0xe] = cStack_13d9 + -0x80;
      auVar139[0xf] = cStack_13d9 + -0x80;
      auVar159 = psraw(auVar139,ZEXT416(8));
      auVar138[1] = cStack_1400 + -0x80;
      auVar138[0] = cStack_1400 + -0x80;
      auVar138[2] = cStack_13ff + -0x80;
      auVar138[3] = cStack_13ff + -0x80;
      auVar138[4] = cStack_13fe + -0x80;
      auVar138[5] = cStack_13fe + -0x80;
      auVar138[6] = cStack_13fd + -0x80;
      auVar138[7] = cStack_13fd + -0x80;
      auVar138[8] = cStack_13fc + -0x80;
      auVar138[9] = cStack_13fc + -0x80;
      auVar138[10] = cStack_13fb + -0x80;
      auVar138[0xb] = cStack_13fb + -0x80;
      auVar138[0xc] = cStack_13fa + -0x80;
      auVar138[0xd] = cStack_13fa + -0x80;
      auVar138[0xe] = cStack_13f9 + -0x80;
      auVar138[0xf] = cStack_13f9 + -0x80;
      auVar160 = psraw(auVar138,ZEXT416(8));
      bVar1 = YUV2RGB[uVar149].cr_factor;
      local_2b28 = auVar160._0_2_;
      sStack_2b26 = auVar160._2_2_;
      sStack_2b24 = auVar160._4_2_;
      sStack_2b22 = auVar160._6_2_;
      sStack_2b20 = auVar160._8_2_;
      sStack_2b1e = auVar160._10_2_;
      sStack_2b1c = auVar160._12_2_;
      sStack_2b1a = auVar160._14_2_;
      uStack_2b36 = (ushort)bVar1;
      uStack_2b34 = (ushort)bVar1;
      uStack_2b32 = (ushort)bVar1;
      uStack_2b2e = (ushort)bVar1;
      uStack_2b2c = (ushort)bVar1;
      uStack_2b2a = (ushort)bVar1;
      auVar161._2_2_ = sStack_2b26 * uStack_2b36;
      auVar161._0_2_ = local_2b28 * (ushort)bVar1;
      auVar161._4_2_ = sStack_2b24 * uStack_2b34;
      auVar161._6_2_ = sStack_2b22 * uStack_2b32;
      auVar161._8_2_ = sStack_2b20 * (ushort)bVar1;
      auVar161._10_2_ = sStack_2b1e * uStack_2b2e;
      auVar161._12_2_ = sStack_2b1c * uStack_2b2c;
      auVar161._14_2_ = sStack_2b1a * uStack_2b2a;
      auVar161 = psraw(auVar161,ZEXT416(6));
      bVar1 = YUV2RGB[uVar149].g_cb_factor;
      local_2b48 = auVar159._0_2_;
      sStack_2b46 = auVar159._2_2_;
      sStack_2b44 = auVar159._4_2_;
      sStack_2b42 = auVar159._6_2_;
      sStack_2b40 = auVar159._8_2_;
      sStack_2b3e = auVar159._10_2_;
      sStack_2b3c = auVar159._12_2_;
      sStack_2b3a = auVar159._14_2_;
      uStack_2b56 = (ushort)bVar1;
      uStack_2b54 = (ushort)bVar1;
      uStack_2b52 = (ushort)bVar1;
      uStack_2b4e = (ushort)bVar1;
      uStack_2b4c = (ushort)bVar1;
      uStack_2b4a = (ushort)bVar1;
      bVar2 = YUV2RGB[uVar149].g_cr_factor;
      uStack_2b76 = (ushort)bVar2;
      uStack_2b74 = (ushort)bVar2;
      uStack_2b72 = (ushort)bVar2;
      uStack_2b6e = (ushort)bVar2;
      uStack_2b6c = (ushort)bVar2;
      uStack_2b6a = (ushort)bVar2;
      auVar160._2_2_ = sStack_2b46 * uStack_2b56 + sStack_2b26 * uStack_2b76;
      auVar160._0_2_ = local_2b48 * (ushort)bVar1 + local_2b28 * (ushort)bVar2;
      auVar160._4_2_ = sStack_2b44 * uStack_2b54 + sStack_2b24 * uStack_2b74;
      auVar160._6_2_ = sStack_2b42 * uStack_2b52 + sStack_2b22 * uStack_2b72;
      auVar160._8_2_ = sStack_2b40 * (ushort)bVar1 + sStack_2b20 * (ushort)bVar2;
      auVar160._10_2_ = sStack_2b3e * uStack_2b4e + sStack_2b1e * uStack_2b6e;
      auVar160._12_2_ = sStack_2b3c * uStack_2b4c + sStack_2b1c * uStack_2b6c;
      auVar160._14_2_ = sStack_2b3a * uStack_2b4a + sStack_2b1a * uStack_2b6a;
      auVar160 = psraw(auVar160,ZEXT416(7));
      bVar1 = YUV2RGB[uVar149].cb_factor;
      uStack_2b96 = (ushort)bVar1;
      uStack_2b94 = (ushort)bVar1;
      uStack_2b92 = (ushort)bVar1;
      uStack_2b8e = (ushort)bVar1;
      uStack_2b8c = (ushort)bVar1;
      uStack_2b8a = (ushort)bVar1;
      auVar159._2_2_ = sStack_2b46 * uStack_2b96;
      auVar159._0_2_ = local_2b48 * (ushort)bVar1;
      auVar159._4_2_ = sStack_2b44 * uStack_2b94;
      auVar159._6_2_ = sStack_2b42 * uStack_2b92;
      auVar159._8_2_ = sStack_2b40 * (ushort)bVar1;
      auVar159._10_2_ = sStack_2b3e * uStack_2b8e;
      auVar159._12_2_ = sStack_2b3c * uStack_2b8c;
      auVar159._14_2_ = sStack_2b3a * uStack_2b8a;
      auVar159 = psraw(auVar159,ZEXT416(6));
      local_1378 = auVar161._0_2_;
      sStack_1376 = auVar161._2_2_;
      sStack_1374 = auVar161._4_2_;
      sStack_1372 = auVar161._6_2_;
      local_1398 = auVar160._0_2_;
      sStack_1396 = auVar160._2_2_;
      sStack_1394 = auVar160._4_2_;
      sStack_1392 = auVar160._6_2_;
      local_13b8 = auVar159._0_2_;
      sStack_13b6 = auVar159._2_2_;
      sStack_13b4 = auVar159._4_2_;
      sStack_13b2 = auVar159._6_2_;
      sStack_12b0 = auVar161._8_2_;
      sStack_12ae = auVar161._10_2_;
      sStack_12ac = auVar161._12_2_;
      sStack_12aa = auVar161._14_2_;
      sStack_12d0 = auVar160._8_2_;
      sStack_12ce = auVar160._10_2_;
      sStack_12cc = auVar160._12_2_;
      sStack_12ca = auVar160._14_2_;
      sStack_12f0 = auVar159._8_2_;
      sStack_12ee = auVar159._10_2_;
      sStack_12ec = auVar159._12_2_;
      sStack_12ea = auVar159._14_2_;
      uVar3 = YUV2RGB[uVar149].y_offset;
      auVar146[1] = uVar3;
      auVar146[0] = uVar3;
      auVar146[2] = uVar3;
      auVar146[3] = uVar3;
      auVar146[4] = uVar3;
      auVar146[5] = uVar3;
      auVar146[6] = uVar3;
      auVar146[7] = uVar3;
      auVar146[9] = uVar3;
      auVar146[8] = uVar3;
      auVar146[10] = uVar3;
      auVar146[0xb] = uVar3;
      auVar146[0xc] = uVar3;
      auVar146[0xd] = uVar3;
      auVar146[0xe] = uVar3;
      auVar146[0xf] = uVar3;
      auVar159 = psubusb(*(undefined1 (*) [16])(y_ptr2 + 0x10),auVar146);
      local_3028 = auVar159[0];
      bStack_3027 = auVar159[1];
      bStack_3026 = auVar159[2];
      bStack_3025 = auVar159[3];
      bStack_3024 = auVar159[4];
      bStack_3023 = auVar159[5];
      bStack_3022 = auVar159[6];
      bStack_3021 = auVar159[7];
      bStack_2f60 = auVar159[8];
      bStack_2f5f = auVar159[9];
      bStack_2f5e = auVar159[10];
      bStack_2f5d = auVar159[0xb];
      bStack_2f5c = auVar159[0xc];
      bStack_2f5b = auVar159[0xd];
      bStack_2f5a = auVar159[0xe];
      bStack_2f59 = auVar159[0xf];
      bVar1 = YUV2RGB[uVar149].y_factor;
      uStack_2ba6 = (ushort)bStack_3027;
      uStack_2ba4 = (ushort)bStack_3026;
      uStack_2ba2 = (ushort)bStack_3025;
      uStack_2b9e = (ushort)bStack_3023;
      uStack_2b9c = (ushort)bStack_3022;
      uStack_2b9a = (ushort)bStack_3021;
      uStack_2bb6 = (ushort)bVar1;
      uStack_2bb4 = (ushort)bVar1;
      uStack_2bb2 = (ushort)bVar1;
      uStack_2bae = (ushort)bVar1;
      uStack_2bac = (ushort)bVar1;
      uStack_2baa = (ushort)bVar1;
      uVar173 = (ushort)((ushort)local_3028 * (ushort)bVar1) >> 7;
      uVar208 = (ushort)((ushort)bStack_3024 * (ushort)bVar1) >> 7;
      y_16_2[1]._2_1_ = (undefined1)((ushort)(uStack_2ba6 * uStack_2bb6) >> 7);
      y_16_2[1]._3_1_ = (byte)((ushort)(uStack_2ba6 * uStack_2bb6) >> 0xf);
      y_16_2[1]._4_1_ = (undefined1)((ushort)(uStack_2ba4 * uStack_2bb4) >> 7);
      y_16_2[1]._5_1_ = (byte)((ushort)(uStack_2ba4 * uStack_2bb4) >> 0xf);
      y_16_2[1]._6_1_ = (undefined1)((ushort)(uStack_2ba2 * uStack_2bb2) >> 7);
      y_16_2[1]._7_1_ = (byte)((ushort)(uStack_2ba2 * uStack_2bb2) >> 0xf);
      y_16_1[0]._2_1_ = (undefined1)((ushort)(uStack_2b9e * uStack_2bae) >> 7);
      y_16_1[0]._3_1_ = (byte)((ushort)(uStack_2b9e * uStack_2bae) >> 0xf);
      y_16_1[0]._4_1_ = (undefined1)((ushort)(uStack_2b9c * uStack_2bac) >> 7);
      y_16_1[0]._5_1_ = (byte)((ushort)(uStack_2b9c * uStack_2bac) >> 0xf);
      y_16_1[0]._6_1_ = (undefined1)((ushort)(uStack_2b9a * uStack_2baa) >> 7);
      y_16_1[0]._7_1_ = (byte)((ushort)(uStack_2b9a * uStack_2baa) >> 0xf);
      bVar1 = YUV2RGB[uVar149].y_factor;
      uStack_2bc6 = (ushort)bStack_2f5f;
      uStack_2bc4 = (ushort)bStack_2f5e;
      uStack_2bc2 = (ushort)bStack_2f5d;
      uStack_2bbe = (ushort)bStack_2f5b;
      uStack_2bbc = (ushort)bStack_2f5a;
      uStack_2bba = (ushort)bStack_2f59;
      uStack_2bd6 = (ushort)bVar1;
      uStack_2bd4 = (ushort)bVar1;
      uStack_2bd2 = (ushort)bVar1;
      uStack_2bce = (ushort)bVar1;
      uStack_2bcc = (ushort)bVar1;
      uStack_2bca = (ushort)bVar1;
      uVar174 = (ushort)((ushort)bStack_2f60 * (ushort)bVar1) >> 7;
      uVar209 = (ushort)((ushort)bStack_2f5c * (ushort)bVar1) >> 7;
      u_16[1]._2_1_ = (undefined1)((ushort)(uStack_2bc6 * uStack_2bd6) >> 7);
      u_16[1]._3_1_ = (byte)((ushort)(uStack_2bc6 * uStack_2bd6) >> 0xf);
      u_16[1]._4_1_ = (undefined1)((ushort)(uStack_2bc4 * uStack_2bd4) >> 7);
      u_16[1]._5_1_ = (byte)((ushort)(uStack_2bc4 * uStack_2bd4) >> 0xf);
      u_16[1]._6_1_ = (undefined1)((ushort)(uStack_2bc2 * uStack_2bd2) >> 7);
      u_16[1]._7_1_ = (byte)((ushort)(uStack_2bc2 * uStack_2bd2) >> 0xf);
      y_16_2[0]._2_1_ = (undefined1)((ushort)(uStack_2bbe * uStack_2bce) >> 7);
      y_16_2[0]._3_1_ = (byte)((ushort)(uStack_2bbe * uStack_2bce) >> 0xf);
      y_16_2[0]._4_1_ = (undefined1)((ushort)(uStack_2bbc * uStack_2bcc) >> 7);
      y_16_2[0]._5_1_ = (byte)((ushort)(uStack_2bbc * uStack_2bcc) >> 0xf);
      y_16_2[0]._6_1_ = (undefined1)((ushort)(uStack_2bba * uStack_2bca) >> 7);
      y_16_2[0]._7_1_ = (byte)((ushort)(uStack_2bba * uStack_2bca) >> 0xf);
      uVar134 = CONCAT13(y_16_2[1]._3_1_,CONCAT12(y_16_2[1]._2_1_,uVar173));
      uVar135 = CONCAT15(y_16_2[1]._5_1_,CONCAT14(y_16_2[1]._4_1_,uVar134));
      uVar136 = CONCAT13(y_16_1[0]._3_1_,CONCAT12(y_16_1[0]._2_1_,uVar208));
      uVar137 = CONCAT15(y_16_1[0]._5_1_,CONCAT14(y_16_1[0]._4_1_,uVar136));
      sStack_2d66 = (short)((uint)uVar134 >> 0x10);
      sStack_2d64 = (short)((uint6)uVar135 >> 0x20);
      sStack_2d62 = (short)(CONCAT17(y_16_2[1]._7_1_,CONCAT16(y_16_2[1]._6_1_,uVar135)) >> 0x30);
      sStack_2d5e = (short)((uint)uVar136 >> 0x10);
      sStack_2d5c = (short)((uint6)uVar137 >> 0x20);
      sStack_2d5a = (short)(CONCAT17(y_16_1[0]._7_1_,CONCAT16(y_16_1[0]._6_1_,uVar137)) >> 0x30);
      sVar187 = uVar173 + local_1378;
      sStack_2d66 = sStack_2d66 + local_1378;
      sStack_2d64 = sStack_2d64 + sStack_1376;
      sStack_2d62 = sStack_2d62 + sStack_1376;
      sVar222 = uVar208 + sStack_1374;
      sStack_2d5e = sStack_2d5e + sStack_1374;
      sStack_2d5c = sStack_2d5c + sStack_1372;
      sStack_2d5a = sStack_2d5a + sStack_1372;
      uVar134 = CONCAT13(y_16_2[1]._3_1_,CONCAT12(y_16_2[1]._2_1_,uVar173));
      uVar135 = CONCAT15(y_16_2[1]._5_1_,CONCAT14(y_16_2[1]._4_1_,uVar134));
      uVar136 = CONCAT13(y_16_1[0]._3_1_,CONCAT12(y_16_1[0]._2_1_,uVar208));
      uVar137 = CONCAT15(y_16_1[0]._5_1_,CONCAT14(y_16_1[0]._4_1_,uVar136));
      sStack_2096 = (short)((uint)uVar134 >> 0x10);
      sStack_2094 = (short)((uint6)uVar135 >> 0x20);
      sStack_2092 = (short)(CONCAT17(y_16_2[1]._7_1_,CONCAT16(y_16_2[1]._6_1_,uVar135)) >> 0x30);
      sStack_208e = (short)((uint)uVar136 >> 0x10);
      sStack_208c = (short)((uint6)uVar137 >> 0x20);
      sStack_208a = (short)(CONCAT17(y_16_1[0]._7_1_,CONCAT16(y_16_1[0]._6_1_,uVar137)) >> 0x30);
      sVar188 = uVar173 - local_1398;
      sStack_2096 = sStack_2096 - local_1398;
      sStack_2094 = sStack_2094 - sStack_1396;
      sStack_2092 = sStack_2092 - sStack_1396;
      sVar223 = uVar208 - sStack_1394;
      sStack_208e = sStack_208e - sStack_1394;
      sStack_208c = sStack_208c - sStack_1392;
      sStack_208a = sStack_208a - sStack_1392;
      uVar134 = CONCAT13(y_16_2[1]._3_1_,CONCAT12(y_16_2[1]._2_1_,uVar173));
      uVar135 = CONCAT15(y_16_2[1]._5_1_,CONCAT14(y_16_2[1]._4_1_,uVar134));
      uVar136 = CONCAT13(y_16_1[0]._3_1_,CONCAT12(y_16_1[0]._2_1_,uVar208));
      uVar137 = CONCAT15(y_16_1[0]._5_1_,CONCAT14(y_16_1[0]._4_1_,uVar136));
      sStack_2d86 = (short)((uint)uVar134 >> 0x10);
      sStack_2d84 = (short)((uint6)uVar135 >> 0x20);
      sStack_2d82 = (short)(CONCAT17(y_16_2[1]._7_1_,CONCAT16(y_16_2[1]._6_1_,uVar135)) >> 0x30);
      sStack_2d7e = (short)((uint)uVar136 >> 0x10);
      sStack_2d7c = (short)((uint6)uVar137 >> 0x20);
      sStack_2d7a = (short)(CONCAT17(y_16_1[0]._7_1_,CONCAT16(y_16_1[0]._6_1_,uVar137)) >> 0x30);
      sVar189 = uVar173 + local_13b8;
      sStack_2d86 = sStack_2d86 + local_13b8;
      sStack_2d84 = sStack_2d84 + sStack_13b6;
      sStack_2d82 = sStack_2d82 + sStack_13b6;
      sVar224 = uVar208 + sStack_13b4;
      sStack_2d7e = sStack_2d7e + sStack_13b4;
      sStack_2d7c = sStack_2d7c + sStack_13b2;
      sStack_2d7a = sStack_2d7a + sStack_13b2;
      uVar134 = CONCAT13(u_16[1]._3_1_,CONCAT12(u_16[1]._2_1_,uVar174));
      uVar135 = CONCAT15(u_16[1]._5_1_,CONCAT14(u_16[1]._4_1_,uVar134));
      uVar136 = CONCAT13(y_16_2[0]._3_1_,CONCAT12(y_16_2[0]._2_1_,uVar209));
      uVar137 = CONCAT15(y_16_2[0]._5_1_,CONCAT14(y_16_2[0]._4_1_,uVar136));
      sStack_2da6 = (short)((uint)uVar134 >> 0x10);
      sStack_2da4 = (short)((uint6)uVar135 >> 0x20);
      sStack_2da2 = (short)(CONCAT17(u_16[1]._7_1_,CONCAT16(u_16[1]._6_1_,uVar135)) >> 0x30);
      sStack_2d9e = (short)((uint)uVar136 >> 0x10);
      sStack_2d9c = (short)((uint6)uVar137 >> 0x20);
      sStack_2d9a = (short)(CONCAT17(y_16_2[0]._7_1_,CONCAT16(y_16_2[0]._6_1_,uVar137)) >> 0x30);
      sVar190 = uVar174 + sStack_12b0;
      sStack_2da6 = sStack_2da6 + sStack_12b0;
      sStack_2da4 = sStack_2da4 + sStack_12ae;
      sStack_2da2 = sStack_2da2 + sStack_12ae;
      sVar225 = uVar209 + sStack_12ac;
      sStack_2d9e = sStack_2d9e + sStack_12ac;
      sStack_2d9c = sStack_2d9c + sStack_12aa;
      sStack_2d9a = sStack_2d9a + sStack_12aa;
      uVar134 = CONCAT13(u_16[1]._3_1_,CONCAT12(u_16[1]._2_1_,uVar174));
      uVar135 = CONCAT15(u_16[1]._5_1_,CONCAT14(u_16[1]._4_1_,uVar134));
      uVar136 = CONCAT13(y_16_2[0]._3_1_,CONCAT12(y_16_2[0]._2_1_,uVar209));
      uVar137 = CONCAT15(y_16_2[0]._5_1_,CONCAT14(y_16_2[0]._4_1_,uVar136));
      sStack_20b6 = (short)((uint)uVar134 >> 0x10);
      sStack_20b4 = (short)((uint6)uVar135 >> 0x20);
      sStack_20b2 = (short)(CONCAT17(u_16[1]._7_1_,CONCAT16(u_16[1]._6_1_,uVar135)) >> 0x30);
      sStack_20ae = (short)((uint)uVar136 >> 0x10);
      sStack_20ac = (short)((uint6)uVar137 >> 0x20);
      sStack_20aa = (short)(CONCAT17(y_16_2[0]._7_1_,CONCAT16(y_16_2[0]._6_1_,uVar137)) >> 0x30);
      sVar191 = uVar174 - sStack_12d0;
      sStack_20b6 = sStack_20b6 - sStack_12d0;
      sStack_20b4 = sStack_20b4 - sStack_12ce;
      sStack_20b2 = sStack_20b2 - sStack_12ce;
      sVar226 = uVar209 - sStack_12cc;
      sStack_20ae = sStack_20ae - sStack_12cc;
      sStack_20ac = sStack_20ac - sStack_12ca;
      sStack_20aa = sStack_20aa - sStack_12ca;
      uVar134 = CONCAT13(u_16[1]._3_1_,CONCAT12(u_16[1]._2_1_,uVar174));
      uVar135 = CONCAT15(u_16[1]._5_1_,CONCAT14(u_16[1]._4_1_,uVar134));
      uVar136 = CONCAT13(y_16_2[0]._3_1_,CONCAT12(y_16_2[0]._2_1_,uVar209));
      uVar137 = CONCAT15(y_16_2[0]._5_1_,CONCAT14(y_16_2[0]._4_1_,uVar136));
      sStack_2dc6 = (short)((uint)uVar134 >> 0x10);
      sStack_2dc4 = (short)((uint6)uVar135 >> 0x20);
      sStack_2dc2 = (short)(CONCAT17(u_16[1]._7_1_,CONCAT16(u_16[1]._6_1_,uVar135)) >> 0x30);
      sStack_2dbe = (short)((uint)uVar136 >> 0x10);
      sStack_2dbc = (short)((uint6)uVar137 >> 0x20);
      sStack_2dba = (short)(CONCAT17(y_16_2[0]._7_1_,CONCAT16(y_16_2[0]._6_1_,uVar137)) >> 0x30);
      sVar192 = uVar174 + sStack_12f0;
      sStack_2dc6 = sStack_2dc6 + sStack_12f0;
      sStack_2dc4 = sStack_2dc4 + sStack_12ee;
      sStack_2dc2 = sStack_2dc2 + sStack_12ee;
      sVar227 = uVar209 + sStack_12ec;
      sStack_2dbe = sStack_2dbe + sStack_12ec;
      sStack_2dbc = sStack_2dbc + sStack_12ea;
      sStack_2dba = sStack_2dba + sStack_12ea;
      bVar52 = (0 < sStack_2d66) * (sStack_2d66 < 0x100) * (char)sStack_2d66 - (0xff < sStack_2d66);
      bVar53 = (0 < sStack_2d62) * (sStack_2d62 < 0x100) * (char)sStack_2d62 - (0xff < sStack_2d62);
      bVar54 = (0 < sStack_2d5e) * (sStack_2d5e < 0x100) * (char)sStack_2d5e - (0xff < sStack_2d5e);
      bVar55 = (0 < sStack_2d5a) * (sStack_2d5a < 0x100) * (char)sStack_2d5a - (0xff < sStack_2d5a);
      bVar56 = (0 < sStack_2da6) * (sStack_2da6 < 0x100) * (char)sStack_2da6 - (0xff < sStack_2da6);
      bVar57 = (0 < sStack_2da2) * (sStack_2da2 < 0x100) * (char)sStack_2da2 - (0xff < sStack_2da2);
      bVar2 = (0 < sStack_2d9e) * (sStack_2d9e < 0x100) * (char)sStack_2d9e - (0xff < sStack_2d9e);
      bVar58 = (0 < sStack_2d9a) * (sStack_2d9a < 0x100) * (char)sStack_2d9a - (0xff < sStack_2d9a);
      bVar59 = (0 < sStack_2096) * (sStack_2096 < 0x100) * (char)sStack_2096 - (0xff < sStack_2096);
      bVar60 = (0 < sStack_2092) * (sStack_2092 < 0x100) * (char)sStack_2092 - (0xff < sStack_2092);
      bVar61 = (0 < sStack_208e) * (sStack_208e < 0x100) * (char)sStack_208e - (0xff < sStack_208e);
      bVar62 = (0 < sStack_208a) * (sStack_208a < 0x100) * (char)sStack_208a - (0xff < sStack_208a);
      bVar63 = (0 < sStack_20b6) * (sStack_20b6 < 0x100) * (char)sStack_20b6 - (0xff < sStack_20b6);
      bVar64 = (0 < sStack_20b2) * (sStack_20b2 < 0x100) * (char)sStack_20b2 - (0xff < sStack_20b2);
      bVar65 = (0 < sStack_20ae) * (sStack_20ae < 0x100) * (char)sStack_20ae - (0xff < sStack_20ae);
      bVar66 = (0 < sStack_20aa) * (sStack_20aa < 0x100) * (char)sStack_20aa - (0xff < sStack_20aa);
      bVar67 = (0 < sStack_2d86) * (sStack_2d86 < 0x100) * (char)sStack_2d86 - (0xff < sStack_2d86);
      bVar68 = (0 < sStack_2d82) * (sStack_2d82 < 0x100) * (char)sStack_2d82 - (0xff < sStack_2d82);
      bVar69 = (0 < sStack_2d7e) * (sStack_2d7e < 0x100) * (char)sStack_2d7e - (0xff < sStack_2d7e);
      bVar70 = (0 < sStack_2d7a) * (sStack_2d7a < 0x100) * (char)sStack_2d7a - (0xff < sStack_2d7a);
      bVar71 = (0 < sStack_2dc6) * (sStack_2dc6 < 0x100) * (char)sStack_2dc6 - (0xff < sStack_2dc6);
      bVar72 = (0 < sStack_2dc2) * (sStack_2dc2 < 0x100) * (char)sStack_2dc2 - (0xff < sStack_2dc2);
      bVar73 = (0 < sStack_2dbe) * (sStack_2dbe < 0x100) * (char)sStack_2dbe - (0xff < sStack_2dbe);
      bVar74 = (0 < sStack_2dba) * (sStack_2dba < 0x100) * (char)sStack_2dba - (0xff < sStack_2dba);
      uVar3 = YUV2RGB[uVar149].y_offset;
      auVar145[1] = uVar3;
      auVar145[0] = uVar3;
      auVar145[2] = uVar3;
      auVar145[3] = uVar3;
      auVar145[4] = uVar3;
      auVar145[5] = uVar3;
      auVar145[6] = uVar3;
      auVar145[7] = uVar3;
      auVar145[9] = uVar3;
      auVar145[8] = uVar3;
      auVar145[10] = uVar3;
      auVar145[0xb] = uVar3;
      auVar145[0xc] = uVar3;
      auVar145[0xd] = uVar3;
      auVar145[0xe] = uVar3;
      auVar145[0xf] = uVar3;
      auVar159 = psubusb(*(undefined1 (*) [16])(u_ptr + 0x10),auVar145);
      local_3048 = auVar159[0];
      bStack_3047 = auVar159[1];
      bStack_3046 = auVar159[2];
      bStack_3045 = auVar159[3];
      bStack_3044 = auVar159[4];
      bStack_3043 = auVar159[5];
      bStack_3042 = auVar159[6];
      bStack_3041 = auVar159[7];
      bStack_2f80 = auVar159[8];
      bStack_2f7f = auVar159[9];
      bStack_2f7e = auVar159[10];
      bStack_2f7d = auVar159[0xb];
      bStack_2f7c = auVar159[0xc];
      bStack_2f7b = auVar159[0xd];
      bStack_2f7a = auVar159[0xe];
      bStack_2f79 = auVar159[0xf];
      bVar1 = YUV2RGB[uVar149].y_factor;
      uStack_2be6 = (ushort)bStack_3047;
      uStack_2be4 = (ushort)bStack_3046;
      uStack_2be2 = (ushort)bStack_3045;
      uStack_2bde = (ushort)bStack_3043;
      uStack_2bdc = (ushort)bStack_3042;
      uStack_2bda = (ushort)bStack_3041;
      uStack_2bf6 = (ushort)bVar1;
      uStack_2bf4 = (ushort)bVar1;
      uStack_2bf2 = (ushort)bVar1;
      uStack_2bee = (ushort)bVar1;
      uStack_2bec = (ushort)bVar1;
      uStack_2bea = (ushort)bVar1;
      uVar173 = (ushort)((ushort)local_3048 * (ushort)bVar1) >> 7;
      uVar208 = (ushort)((ushort)bStack_3044 * (ushort)bVar1) >> 7;
      y_16_2[1]._2_1_ = (undefined1)((ushort)(uStack_2be6 * uStack_2bf6) >> 7);
      y_16_2[1]._3_1_ = (byte)((ushort)(uStack_2be6 * uStack_2bf6) >> 0xf);
      y_16_2[1]._4_1_ = (undefined1)((ushort)(uStack_2be4 * uStack_2bf4) >> 7);
      y_16_2[1]._5_1_ = (byte)((ushort)(uStack_2be4 * uStack_2bf4) >> 0xf);
      y_16_2[1]._6_1_ = (undefined1)((ushort)(uStack_2be2 * uStack_2bf2) >> 7);
      y_16_2[1]._7_1_ = (byte)((ushort)(uStack_2be2 * uStack_2bf2) >> 0xf);
      y_16_1[0]._2_1_ = (undefined1)((ushort)(uStack_2bde * uStack_2bee) >> 7);
      y_16_1[0]._3_1_ = (byte)((ushort)(uStack_2bde * uStack_2bee) >> 0xf);
      y_16_1[0]._4_1_ = (undefined1)((ushort)(uStack_2bdc * uStack_2bec) >> 7);
      y_16_1[0]._5_1_ = (byte)((ushort)(uStack_2bdc * uStack_2bec) >> 0xf);
      y_16_1[0]._6_1_ = (undefined1)((ushort)(uStack_2bda * uStack_2bea) >> 7);
      y_16_1[0]._7_1_ = (byte)((ushort)(uStack_2bda * uStack_2bea) >> 0xf);
      bVar1 = YUV2RGB[uVar149].y_factor;
      uStack_2c06 = (ushort)bStack_2f7f;
      uStack_2c04 = (ushort)bStack_2f7e;
      uStack_2c02 = (ushort)bStack_2f7d;
      uStack_2bfe = (ushort)bStack_2f7b;
      uStack_2bfc = (ushort)bStack_2f7a;
      uStack_2bfa = (ushort)bStack_2f79;
      uStack_2c16 = (ushort)bVar1;
      uStack_2c14 = (ushort)bVar1;
      uStack_2c12 = (ushort)bVar1;
      uStack_2c0e = (ushort)bVar1;
      uStack_2c0c = (ushort)bVar1;
      uStack_2c0a = (ushort)bVar1;
      uVar174 = (ushort)((ushort)bStack_2f80 * (ushort)bVar1) >> 7;
      uVar209 = (ushort)((ushort)bStack_2f7c * (ushort)bVar1) >> 7;
      u_16[1]._2_1_ = (undefined1)((ushort)(uStack_2c06 * uStack_2c16) >> 7);
      u_16[1]._3_1_ = (byte)((ushort)(uStack_2c06 * uStack_2c16) >> 0xf);
      u_16[1]._4_1_ = (undefined1)((ushort)(uStack_2c04 * uStack_2c14) >> 7);
      u_16[1]._5_1_ = (byte)((ushort)(uStack_2c04 * uStack_2c14) >> 0xf);
      u_16[1]._6_1_ = (undefined1)((ushort)(uStack_2c02 * uStack_2c12) >> 7);
      u_16[1]._7_1_ = (byte)((ushort)(uStack_2c02 * uStack_2c12) >> 0xf);
      y_16_2[0]._2_1_ = (undefined1)((ushort)(uStack_2bfe * uStack_2c0e) >> 7);
      y_16_2[0]._3_1_ = (byte)((ushort)(uStack_2bfe * uStack_2c0e) >> 0xf);
      y_16_2[0]._4_1_ = (undefined1)((ushort)(uStack_2bfc * uStack_2c0c) >> 7);
      y_16_2[0]._5_1_ = (byte)((ushort)(uStack_2bfc * uStack_2c0c) >> 0xf);
      y_16_2[0]._6_1_ = (undefined1)((ushort)(uStack_2bfa * uStack_2c0a) >> 7);
      y_16_2[0]._7_1_ = (byte)((ushort)(uStack_2bfa * uStack_2c0a) >> 0xf);
      uVar134 = CONCAT13(y_16_2[1]._3_1_,CONCAT12(y_16_2[1]._2_1_,uVar173));
      uVar135 = CONCAT15(y_16_2[1]._5_1_,CONCAT14(y_16_2[1]._4_1_,uVar134));
      uVar136 = CONCAT13(y_16_1[0]._3_1_,CONCAT12(y_16_1[0]._2_1_,uVar208));
      uVar137 = CONCAT15(y_16_1[0]._5_1_,CONCAT14(y_16_1[0]._4_1_,uVar136));
      sStack_2de6 = (short)((uint)uVar134 >> 0x10);
      sStack_2de4 = (short)((uint6)uVar135 >> 0x20);
      sStack_2de2 = (short)(CONCAT17(y_16_2[1]._7_1_,CONCAT16(y_16_2[1]._6_1_,uVar135)) >> 0x30);
      sStack_2dde = (short)((uint)uVar136 >> 0x10);
      sStack_2ddc = (short)((uint6)uVar137 >> 0x20);
      sStack_2dda = (short)(CONCAT17(y_16_1[0]._7_1_,CONCAT16(y_16_1[0]._6_1_,uVar137)) >> 0x30);
      sVar150 = uVar173 + local_1378;
      sStack_2de6 = sStack_2de6 + local_1378;
      sStack_2de4 = sStack_2de4 + sStack_1376;
      sStack_2de2 = sStack_2de2 + sStack_1376;
      sVar162 = uVar208 + sStack_1374;
      sStack_2dde = sStack_2dde + sStack_1374;
      sStack_2ddc = sStack_2ddc + sStack_1372;
      sStack_2dda = sStack_2dda + sStack_1372;
      uVar134 = CONCAT13(y_16_2[1]._3_1_,CONCAT12(y_16_2[1]._2_1_,uVar173));
      uVar135 = CONCAT15(y_16_2[1]._5_1_,CONCAT14(y_16_2[1]._4_1_,uVar134));
      uVar136 = CONCAT13(y_16_1[0]._3_1_,CONCAT12(y_16_1[0]._2_1_,uVar208));
      uVar137 = CONCAT15(y_16_1[0]._5_1_,CONCAT14(y_16_1[0]._4_1_,uVar136));
      sStack_20d6 = (short)((uint)uVar134 >> 0x10);
      sStack_20d4 = (short)((uint6)uVar135 >> 0x20);
      sStack_20d2 = (short)(CONCAT17(y_16_2[1]._7_1_,CONCAT16(y_16_2[1]._6_1_,uVar135)) >> 0x30);
      sStack_20ce = (short)((uint)uVar136 >> 0x10);
      sStack_20cc = (short)((uint6)uVar137 >> 0x20);
      sStack_20ca = (short)(CONCAT17(y_16_1[0]._7_1_,CONCAT16(y_16_1[0]._6_1_,uVar137)) >> 0x30);
      sVar151 = uVar173 - local_1398;
      sStack_20d6 = sStack_20d6 - local_1398;
      sStack_20d4 = sStack_20d4 - sStack_1396;
      sStack_20d2 = sStack_20d2 - sStack_1396;
      sVar163 = uVar208 - sStack_1394;
      sStack_20ce = sStack_20ce - sStack_1394;
      sStack_20cc = sStack_20cc - sStack_1392;
      sStack_20ca = sStack_20ca - sStack_1392;
      uVar134 = CONCAT13(y_16_2[1]._3_1_,CONCAT12(y_16_2[1]._2_1_,uVar173));
      uVar135 = CONCAT15(y_16_2[1]._5_1_,CONCAT14(y_16_2[1]._4_1_,uVar134));
      uVar136 = CONCAT13(y_16_1[0]._3_1_,CONCAT12(y_16_1[0]._2_1_,uVar208));
      uVar137 = CONCAT15(y_16_1[0]._5_1_,CONCAT14(y_16_1[0]._4_1_,uVar136));
      sStack_2e06 = (short)((uint)uVar134 >> 0x10);
      sStack_2e04 = (short)((uint6)uVar135 >> 0x20);
      sStack_2e02 = (short)(CONCAT17(y_16_2[1]._7_1_,CONCAT16(y_16_2[1]._6_1_,uVar135)) >> 0x30);
      sStack_2dfe = (short)((uint)uVar136 >> 0x10);
      sStack_2dfc = (short)((uint6)uVar137 >> 0x20);
      sStack_2dfa = (short)(CONCAT17(y_16_1[0]._7_1_,CONCAT16(y_16_1[0]._6_1_,uVar137)) >> 0x30);
      sVar152 = uVar173 + local_13b8;
      sStack_2e06 = sStack_2e06 + local_13b8;
      sStack_2e04 = sStack_2e04 + sStack_13b6;
      sStack_2e02 = sStack_2e02 + sStack_13b6;
      sVar164 = uVar208 + sStack_13b4;
      sStack_2dfe = sStack_2dfe + sStack_13b4;
      sStack_2dfc = sStack_2dfc + sStack_13b2;
      sStack_2dfa = sStack_2dfa + sStack_13b2;
      uVar134 = CONCAT13(u_16[1]._3_1_,CONCAT12(u_16[1]._2_1_,uVar174));
      uVar135 = CONCAT15(u_16[1]._5_1_,CONCAT14(u_16[1]._4_1_,uVar134));
      uVar136 = CONCAT13(y_16_2[0]._3_1_,CONCAT12(y_16_2[0]._2_1_,uVar209));
      uVar137 = CONCAT15(y_16_2[0]._5_1_,CONCAT14(y_16_2[0]._4_1_,uVar136));
      sStack_2e26 = (short)((uint)uVar134 >> 0x10);
      sStack_2e24 = (short)((uint6)uVar135 >> 0x20);
      sStack_2e22 = (short)(CONCAT17(u_16[1]._7_1_,CONCAT16(u_16[1]._6_1_,uVar135)) >> 0x30);
      sStack_2e1e = (short)((uint)uVar136 >> 0x10);
      sStack_2e1c = (short)((uint6)uVar137 >> 0x20);
      sStack_2e1a = (short)(CONCAT17(y_16_2[0]._7_1_,CONCAT16(y_16_2[0]._6_1_,uVar137)) >> 0x30);
      sVar153 = uVar174 + sStack_12b0;
      sStack_2e26 = sStack_2e26 + sStack_12b0;
      sStack_2e24 = sStack_2e24 + sStack_12ae;
      sStack_2e22 = sStack_2e22 + sStack_12ae;
      sVar165 = uVar209 + sStack_12ac;
      sStack_2e1e = sStack_2e1e + sStack_12ac;
      sStack_2e1c = sStack_2e1c + sStack_12aa;
      sStack_2e1a = sStack_2e1a + sStack_12aa;
      uVar134 = CONCAT13(u_16[1]._3_1_,CONCAT12(u_16[1]._2_1_,uVar174));
      uVar135 = CONCAT15(u_16[1]._5_1_,CONCAT14(u_16[1]._4_1_,uVar134));
      uVar136 = CONCAT13(y_16_2[0]._3_1_,CONCAT12(y_16_2[0]._2_1_,uVar209));
      uVar137 = CONCAT15(y_16_2[0]._5_1_,CONCAT14(y_16_2[0]._4_1_,uVar136));
      sStack_20f6 = (short)((uint)uVar134 >> 0x10);
      sStack_20f4 = (short)((uint6)uVar135 >> 0x20);
      sStack_20f2 = (short)(CONCAT17(u_16[1]._7_1_,CONCAT16(u_16[1]._6_1_,uVar135)) >> 0x30);
      sStack_20ee = (short)((uint)uVar136 >> 0x10);
      sStack_20ec = (short)((uint6)uVar137 >> 0x20);
      sStack_20ea = (short)(CONCAT17(y_16_2[0]._7_1_,CONCAT16(y_16_2[0]._6_1_,uVar137)) >> 0x30);
      sVar154 = uVar174 - sStack_12d0;
      sStack_20f6 = sStack_20f6 - sStack_12d0;
      sStack_20f4 = sStack_20f4 - sStack_12ce;
      sStack_20f2 = sStack_20f2 - sStack_12ce;
      sVar166 = uVar209 - sStack_12cc;
      sStack_20ee = sStack_20ee - sStack_12cc;
      sStack_20ec = sStack_20ec - sStack_12ca;
      sStack_20ea = sStack_20ea - sStack_12ca;
      uVar134 = CONCAT13(u_16[1]._3_1_,CONCAT12(u_16[1]._2_1_,uVar174));
      uVar135 = CONCAT15(u_16[1]._5_1_,CONCAT14(u_16[1]._4_1_,uVar134));
      uVar136 = CONCAT13(y_16_2[0]._3_1_,CONCAT12(y_16_2[0]._2_1_,uVar209));
      uVar137 = CONCAT15(y_16_2[0]._5_1_,CONCAT14(y_16_2[0]._4_1_,uVar136));
      sStack_2e46 = (short)((uint)uVar134 >> 0x10);
      sStack_2e44 = (short)((uint6)uVar135 >> 0x20);
      sStack_2e42 = (short)(CONCAT17(u_16[1]._7_1_,CONCAT16(u_16[1]._6_1_,uVar135)) >> 0x30);
      sStack_2e3e = (short)((uint)uVar136 >> 0x10);
      sStack_2e3c = (short)((uint6)uVar137 >> 0x20);
      sStack_2e3a = (short)(CONCAT17(y_16_2[0]._7_1_,CONCAT16(y_16_2[0]._6_1_,uVar137)) >> 0x30);
      sVar155 = uVar174 + sStack_12f0;
      sStack_2e46 = sStack_2e46 + sStack_12f0;
      sStack_2e44 = sStack_2e44 + sStack_12ee;
      sStack_2e42 = sStack_2e42 + sStack_12ee;
      sVar167 = uVar209 + sStack_12ec;
      sStack_2e3e = sStack_2e3e + sStack_12ec;
      sStack_2e3c = sStack_2e3c + sStack_12ea;
      sStack_2e3a = sStack_2e3a + sStack_12ea;
      bVar1 = (0 < sStack_2de6) * (sStack_2de6 < 0x100) * (char)sStack_2de6 - (0xff < sStack_2de6);
      bVar75 = (0 < sStack_2de2) * (sStack_2de2 < 0x100) * (char)sStack_2de2 - (0xff < sStack_2de2);
      bVar76 = (0 < sStack_2dde) * (sStack_2dde < 0x100) * (char)sStack_2dde - (0xff < sStack_2dde);
      bVar77 = (0 < sStack_2dda) * (sStack_2dda < 0x100) * (char)sStack_2dda - (0xff < sStack_2dda);
      bVar78 = (0 < sStack_2e26) * (sStack_2e26 < 0x100) * (char)sStack_2e26 - (0xff < sStack_2e26);
      bVar79 = (0 < sStack_2e22) * (sStack_2e22 < 0x100) * (char)sStack_2e22 - (0xff < sStack_2e22);
      bVar80 = (0 < sStack_2e1e) * (sStack_2e1e < 0x100) * (char)sStack_2e1e - (0xff < sStack_2e1e);
      bVar81 = (0 < sStack_2e1a) * (sStack_2e1a < 0x100) * (char)sStack_2e1a - (0xff < sStack_2e1a);
      bVar82 = (0 < sStack_20d6) * (sStack_20d6 < 0x100) * (char)sStack_20d6 - (0xff < sStack_20d6);
      bVar83 = (0 < sStack_20d2) * (sStack_20d2 < 0x100) * (char)sStack_20d2 - (0xff < sStack_20d2);
      bVar84 = (0 < sStack_20ce) * (sStack_20ce < 0x100) * (char)sStack_20ce - (0xff < sStack_20ce);
      bVar85 = (0 < sStack_20ca) * (sStack_20ca < 0x100) * (char)sStack_20ca - (0xff < sStack_20ca);
      bVar86 = (0 < sStack_20f6) * (sStack_20f6 < 0x100) * (char)sStack_20f6 - (0xff < sStack_20f6);
      bVar87 = (0 < sStack_20f2) * (sStack_20f2 < 0x100) * (char)sStack_20f2 - (0xff < sStack_20f2);
      bVar88 = (0 < sStack_20ee) * (sStack_20ee < 0x100) * (char)sStack_20ee - (0xff < sStack_20ee);
      bVar89 = (0 < sStack_20ea) * (sStack_20ea < 0x100) * (char)sStack_20ea - (0xff < sStack_20ea);
      bVar90 = (0 < sStack_2e06) * (sStack_2e06 < 0x100) * (char)sStack_2e06 - (0xff < sStack_2e06);
      bVar91 = (0 < sStack_2e02) * (sStack_2e02 < 0x100) * (char)sStack_2e02 - (0xff < sStack_2e02);
      bVar92 = (0 < sStack_2dfe) * (sStack_2dfe < 0x100) * (char)sStack_2dfe - (0xff < sStack_2dfe);
      bVar93 = (0 < sStack_2dfa) * (sStack_2dfa < 0x100) * (char)sStack_2dfa - (0xff < sStack_2dfa);
      bVar94 = (0 < sStack_2e46) * (sStack_2e46 < 0x100) * (char)sStack_2e46 - (0xff < sStack_2e46);
      bVar95 = (0 < sStack_2e42) * (sStack_2e42 < 0x100) * (char)sStack_2e42 - (0xff < sStack_2e42);
      bVar96 = (0 < sStack_2e3e) * (sStack_2e3e < 0x100) * (char)sStack_2e3e - (0xff < sStack_2e3e);
      bVar97 = (0 < sStack_2e3a) * (sStack_2e3a < 0x100) * (char)sStack_2e3a - (0xff < sStack_2e3a);
      uVar193 = (ulong)CONCAT16((0 < sStack_2c3c) * (sStack_2c3c < 0x100) * (char)sStack_2c3c -
                                (0xff < sStack_2c3c),
                                CONCAT15(bVar6,CONCAT14((0 < sVar210) * (sVar210 < 0x100) *
                                                        (char)sVar210 - (0xff < sVar210),
                                                        CONCAT13(bVar5,CONCAT12((0 < sStack_2c44) *
                                                                                (sStack_2c44 < 0x100
                                                                                ) * (char)
                                                  sStack_2c44 - (0xff < sStack_2c44),
                                                  CONCAT11(bVar4,(0 < sVar175) * (sVar175 < 0x100) *
                                                                 (char)sVar175 - (0xff < sVar175))))
                                                  ))) & 0xff00ff00ff00ff;
      uVar228 = (ulong)CONCAT16((0 < sStack_2c7c) * (sStack_2c7c < 0x100) * (char)sStack_2c7c -
                                (0xff < sStack_2c7c),
                                CONCAT15(bVar10,CONCAT14((0 < sVar213) * (sVar213 < 0x100) *
                                                         (char)sVar213 - (0xff < sVar213),
                                                         CONCAT13(bVar9,CONCAT12((0 < sStack_2c84) *
                                                                                 (sStack_2c84 <
                                                                                 0x100) * (char)
                                                  sStack_2c84 - (0xff < sStack_2c84),
                                                  CONCAT11(bVar8,(0 < sVar178) * (sVar178 < 0x100) *
                                                                 (char)sVar178 - (0xff < sVar178))))
                                                  ))) & 0xff00ff00ff00ff;
      uVar156 = (ulong)CONCAT16((0 < sStack_2d5c) * (sStack_2d5c < 0x100) * (char)sStack_2d5c -
                                (0xff < sStack_2d5c),
                                CONCAT15(bVar54,CONCAT14((0 < sVar222) * (sVar222 < 0x100) *
                                                         (char)sVar222 - (0xff < sVar222),
                                                         CONCAT13(bVar53,CONCAT12((0 < sStack_2d64)
                                                                                  * (sStack_2d64 <
                                                                                    0x100) *
                                                                                  (char)sStack_2d64
                                                                                  - (0xff < 
                                                  sStack_2d64),
                                                  CONCAT11(bVar52,(0 < sVar187) * (sVar187 < 0x100)
                                                                  * (char)sVar187 - (0xff < sVar187)
                                                          )))))) & 0xff00ff00ff00ff;
      uVar168 = (ulong)CONCAT16((0 < sStack_2d9c) * (sStack_2d9c < 0x100) * (char)sStack_2d9c -
                                (0xff < sStack_2d9c),
                                CONCAT15(bVar2,CONCAT14((0 < sVar225) * (sVar225 < 0x100) *
                                                        (char)sVar225 - (0xff < sVar225),
                                                        CONCAT13(bVar57,CONCAT12((0 < sStack_2da4) *
                                                                                 (sStack_2da4 <
                                                                                 0x100) * (char)
                                                  sStack_2da4 - (0xff < sStack_2da4),
                                                  CONCAT11(bVar56,(0 < sVar190) * (sVar190 < 0x100)
                                                                  * (char)sVar190 - (0xff < sVar190)
                                                          )))))) & 0xff00ff00ff00ff;
      local_1898 = (ushort)uVar193;
      uStack_1896 = (ushort)(uVar193 >> 0x10);
      uStack_1894 = (ushort)(uVar193 >> 0x20);
      uStack_1892 = (ushort)(uVar193 >> 0x30);
      uStack_1890 = (ushort)uVar228;
      uStack_188e = (ushort)(uVar228 >> 0x10);
      uStack_188c = (ushort)(uVar228 >> 0x20);
      uStack_188a = (ushort)(uVar228 >> 0x30);
      local_18a8 = (ushort)uVar156;
      uStack_18a6 = (ushort)(uVar156 >> 0x10);
      uStack_18a4 = (ushort)(uVar156 >> 0x20);
      uStack_18a2 = (ushort)(uVar156 >> 0x30);
      uStack_18a0 = (ushort)uVar168;
      uStack_189e = (ushort)(uVar168 >> 0x10);
      uStack_189c = (ushort)(uVar168 >> 0x20);
      uStack_189a = (ushort)(uVar168 >> 0x30);
      bVar98 = (uStack_1896 != 0) * (uStack_1896 < 0x100) * (char)(uVar193 >> 0x10) -
               (0xff < uStack_1896);
      bVar99 = (uStack_1892 != 0) * (uStack_1892 < 0x100) * (char)(uVar193 >> 0x30) -
               (0xff < uStack_1892);
      bVar100 = (uStack_188e != 0) * (uStack_188e < 0x100) * (char)(uVar228 >> 0x10) -
                (0xff < uStack_188e);
      bVar101 = (uStack_188a != 0) * (uStack_188a < 0x100) * (char)(uVar228 >> 0x30) -
                (0xff < uStack_188a);
      bVar102 = (uStack_18a6 != 0) * (uStack_18a6 < 0x100) * (char)(uVar156 >> 0x10) -
                (0xff < uStack_18a6);
      bVar103 = (uStack_18a2 != 0) * (uStack_18a2 < 0x100) * (char)(uVar156 >> 0x30) -
                (0xff < uStack_18a2);
      bVar104 = (uStack_189e != 0) * (uStack_189e < 0x100) * (char)(uVar168 >> 0x10) -
                (0xff < uStack_189e);
      bVar105 = (uStack_189a != 0) * (uStack_189a < 0x100) * (char)(uVar168 >> 0x30) -
                (0xff < uStack_189a);
      uVar194 = (ulong)CONCAT16((0 < sStack_200c) * (sStack_200c < 0x100) * (char)sStack_200c -
                                (0xff < sStack_200c),
                                CONCAT15(bVar14,CONCAT14((0 < sVar211) * (sVar211 < 0x100) *
                                                         (char)sVar211 - (0xff < sVar211),
                                                         CONCAT13(bVar13,CONCAT12((0 < sStack_2014)
                                                                                  * (sStack_2014 <
                                                                                    0x100) *
                                                                                  (char)sStack_2014
                                                                                  - (0xff < 
                                                  sStack_2014),
                                                  CONCAT11(bVar12,(0 < sVar176) * (sVar176 < 0x100)
                                                                  * (char)sVar176 - (0xff < sVar176)
                                                          )))))) & 0xff00ff00ff00ff;
      uVar229 = (ulong)CONCAT16((0 < sStack_202c) * (sStack_202c < 0x100) * (char)sStack_202c -
                                (0xff < sStack_202c),
                                CONCAT15(bVar18,CONCAT14((0 < sVar214) * (sVar214 < 0x100) *
                                                         (char)sVar214 - (0xff < sVar214),
                                                         CONCAT13(bVar17,CONCAT12((0 < sStack_2034)
                                                                                  * (sStack_2034 <
                                                                                    0x100) *
                                                                                  (char)sStack_2034
                                                                                  - (0xff < 
                                                  sStack_2034),
                                                  CONCAT11(bVar16,(0 < sVar179) * (sVar179 < 0x100)
                                                                  * (char)sVar179 - (0xff < sVar179)
                                                          )))))) & 0xff00ff00ff00ff;
      uVar157 = (ulong)CONCAT16((0 < sStack_208c) * (sStack_208c < 0x100) * (char)sStack_208c -
                                (0xff < sStack_208c),
                                CONCAT15(bVar61,CONCAT14((0 < sVar223) * (sVar223 < 0x100) *
                                                         (char)sVar223 - (0xff < sVar223),
                                                         CONCAT13(bVar60,CONCAT12((0 < sStack_2094)
                                                                                  * (sStack_2094 <
                                                                                    0x100) *
                                                                                  (char)sStack_2094
                                                                                  - (0xff < 
                                                  sStack_2094),
                                                  CONCAT11(bVar59,(0 < sVar188) * (sVar188 < 0x100)
                                                                  * (char)sVar188 - (0xff < sVar188)
                                                          )))))) & 0xff00ff00ff00ff;
      uVar169 = (ulong)CONCAT16((0 < sStack_20ac) * (sStack_20ac < 0x100) * (char)sStack_20ac -
                                (0xff < sStack_20ac),
                                CONCAT15(bVar65,CONCAT14((0 < sVar226) * (sVar226 < 0x100) *
                                                         (char)sVar226 - (0xff < sVar226),
                                                         CONCAT13(bVar64,CONCAT12((0 < sStack_20b4)
                                                                                  * (sStack_20b4 <
                                                                                    0x100) *
                                                                                  (char)sStack_20b4
                                                                                  - (0xff < 
                                                  sStack_20b4),
                                                  CONCAT11(bVar63,(0 < sVar191) * (sVar191 < 0x100)
                                                                  * (char)sVar191 - (0xff < sVar191)
                                                          )))))) & 0xff00ff00ff00ff;
      local_18b8 = (ushort)uVar194;
      uStack_18b6 = (ushort)(uVar194 >> 0x10);
      uStack_18b4 = (ushort)(uVar194 >> 0x20);
      uStack_18b2 = (ushort)(uVar194 >> 0x30);
      uStack_18b0 = (ushort)uVar229;
      uStack_18ae = (ushort)(uVar229 >> 0x10);
      uStack_18ac = (ushort)(uVar229 >> 0x20);
      uStack_18aa = (ushort)(uVar229 >> 0x30);
      local_18c8 = (ushort)uVar157;
      uStack_18c6 = (ushort)(uVar157 >> 0x10);
      uStack_18c4 = (ushort)(uVar157 >> 0x20);
      uStack_18c2 = (ushort)(uVar157 >> 0x30);
      uStack_18c0 = (ushort)uVar169;
      uStack_18be = (ushort)(uVar169 >> 0x10);
      uStack_18bc = (ushort)(uVar169 >> 0x20);
      uStack_18ba = (ushort)(uVar169 >> 0x30);
      bVar106 = (uStack_18b6 != 0) * (uStack_18b6 < 0x100) * (char)(uVar194 >> 0x10) -
                (0xff < uStack_18b6);
      bVar107 = (uStack_18b2 != 0) * (uStack_18b2 < 0x100) * (char)(uVar194 >> 0x30) -
                (0xff < uStack_18b2);
      bVar108 = (uStack_18ae != 0) * (uStack_18ae < 0x100) * (char)(uVar229 >> 0x10) -
                (0xff < uStack_18ae);
      bVar109 = (uStack_18aa != 0) * (uStack_18aa < 0x100) * (char)(uVar229 >> 0x30) -
                (0xff < uStack_18aa);
      bVar110 = (uStack_18c6 != 0) * (uStack_18c6 < 0x100) * (char)(uVar157 >> 0x10) -
                (0xff < uStack_18c6);
      bVar111 = (uStack_18c2 != 0) * (uStack_18c2 < 0x100) * (char)(uVar157 >> 0x30) -
                (0xff < uStack_18c2);
      bVar112 = (uStack_18be != 0) * (uStack_18be < 0x100) * (char)(uVar169 >> 0x10) -
                (0xff < uStack_18be);
      bVar113 = (uStack_18ba != 0) * (uStack_18ba < 0x100) * (char)(uVar169 >> 0x30) -
                (0xff < uStack_18ba);
      uVar195 = (ulong)CONCAT16((0 < sStack_2c5c) * (sStack_2c5c < 0x100) * (char)sStack_2c5c -
                                (0xff < sStack_2c5c),
                                CONCAT15(bVar22,CONCAT14((0 < sVar212) * (sVar212 < 0x100) *
                                                         (char)sVar212 - (0xff < sVar212),
                                                         CONCAT13(bVar21,CONCAT12((0 < sStack_2c64)
                                                                                  * (sStack_2c64 <
                                                                                    0x100) *
                                                                                  (char)sStack_2c64
                                                                                  - (0xff < 
                                                  sStack_2c64),
                                                  CONCAT11(bVar20,(0 < sVar177) * (sVar177 < 0x100)
                                                                  * (char)sVar177 - (0xff < sVar177)
                                                          )))))) & 0xff00ff00ff00ff;
      uVar230 = (ulong)CONCAT16((0 < sStack_2c9c) * (sStack_2c9c < 0x100) * (char)sStack_2c9c -
                                (0xff < sStack_2c9c),
                                CONCAT15(bVar26,CONCAT14((0 < sVar215) * (sVar215 < 0x100) *
                                                         (char)sVar215 - (0xff < sVar215),
                                                         CONCAT13(bVar25,CONCAT12((0 < sStack_2ca4)
                                                                                  * (sStack_2ca4 <
                                                                                    0x100) *
                                                                                  (char)sStack_2ca4
                                                                                  - (0xff < 
                                                  sStack_2ca4),
                                                  CONCAT11(bVar24,(0 < sVar180) * (sVar180 < 0x100)
                                                                  * (char)sVar180 - (0xff < sVar180)
                                                          )))))) & 0xff00ff00ff00ff;
      uVar158 = (ulong)CONCAT16((0 < sStack_2d7c) * (sStack_2d7c < 0x100) * (char)sStack_2d7c -
                                (0xff < sStack_2d7c),
                                CONCAT15(bVar69,CONCAT14((0 < sVar224) * (sVar224 < 0x100) *
                                                         (char)sVar224 - (0xff < sVar224),
                                                         CONCAT13(bVar68,CONCAT12((0 < sStack_2d84)
                                                                                  * (sStack_2d84 <
                                                                                    0x100) *
                                                                                  (char)sStack_2d84
                                                                                  - (0xff < 
                                                  sStack_2d84),
                                                  CONCAT11(bVar67,(0 < sVar189) * (sVar189 < 0x100)
                                                                  * (char)sVar189 - (0xff < sVar189)
                                                          )))))) & 0xff00ff00ff00ff;
      uVar170 = (ulong)CONCAT16((0 < sStack_2dbc) * (sStack_2dbc < 0x100) * (char)sStack_2dbc -
                                (0xff < sStack_2dbc),
                                CONCAT15(bVar73,CONCAT14((0 < sVar227) * (sVar227 < 0x100) *
                                                         (char)sVar227 - (0xff < sVar227),
                                                         CONCAT13(bVar72,CONCAT12((0 < sStack_2dc4)
                                                                                  * (sStack_2dc4 <
                                                                                    0x100) *
                                                                                  (char)sStack_2dc4
                                                                                  - (0xff < 
                                                  sStack_2dc4),
                                                  CONCAT11(bVar71,(0 < sVar192) * (sVar192 < 0x100)
                                                                  * (char)sVar192 - (0xff < sVar192)
                                                          )))))) & 0xff00ff00ff00ff;
      local_18d8 = (ushort)uVar195;
      uStack_18d6 = (ushort)(uVar195 >> 0x10);
      uStack_18d4 = (ushort)(uVar195 >> 0x20);
      uStack_18d2 = (ushort)(uVar195 >> 0x30);
      uStack_18d0 = (ushort)uVar230;
      uStack_18ce = (ushort)(uVar230 >> 0x10);
      uStack_18cc = (ushort)(uVar230 >> 0x20);
      uStack_18ca = (ushort)(uVar230 >> 0x30);
      local_18e8 = (ushort)uVar158;
      uStack_18e6 = (ushort)(uVar158 >> 0x10);
      uStack_18e4 = (ushort)(uVar158 >> 0x20);
      uStack_18e2 = (ushort)(uVar158 >> 0x30);
      uStack_18e0 = (ushort)uVar170;
      uStack_18de = (ushort)(uVar170 >> 0x10);
      uStack_18dc = (ushort)(uVar170 >> 0x20);
      uStack_18da = (ushort)(uVar170 >> 0x30);
      bVar114 = (uStack_18d6 != 0) * (uStack_18d6 < 0x100) * (char)(uVar195 >> 0x10) -
                (0xff < uStack_18d6);
      bVar115 = (uStack_18d2 != 0) * (uStack_18d2 < 0x100) * (char)(uVar195 >> 0x30) -
                (0xff < uStack_18d2);
      bVar116 = (uStack_18ce != 0) * (uStack_18ce < 0x100) * (char)(uVar230 >> 0x10) -
                (0xff < uStack_18ce);
      bVar117 = (uStack_18ca != 0) * (uStack_18ca < 0x100) * (char)(uVar230 >> 0x30) -
                (0xff < uStack_18ca);
      bVar118 = (uStack_18e6 != 0) * (uStack_18e6 < 0x100) * (char)(uVar158 >> 0x10) -
                (0xff < uStack_18e6);
      bVar119 = (uStack_18e2 != 0) * (uStack_18e2 < 0x100) * (char)(uVar158 >> 0x30) -
                (0xff < uStack_18e2);
      bVar120 = (uStack_18de != 0) * (uStack_18de < 0x100) * (char)(uVar170 >> 0x10) -
                (0xff < uStack_18de);
      bVar121 = (uStack_18da != 0) * (uStack_18da < 0x100) * (char)(uVar170 >> 0x30) -
                (0xff < uStack_18da);
      uVar196 = (ushort)(((uint)bVar5 << 0x18) >> 0x18);
      uVar198 = (ushort)(((uint6)bVar6 << 0x28) >> 0x28);
      uVar203 = (ushort)(((ulong)bVar7 << 0x38) >> 0x38);
      uVar231 = (ushort)(((uint)bVar9 << 0x18) >> 0x18);
      uVar237 = (ushort)(((uint6)bVar10 << 0x28) >> 0x28);
      uVar243 = (ushort)(((ulong)bVar11 << 0x38) >> 0x38);
      uVar173 = (ushort)(((uint)bVar53 << 0x18) >> 0x18);
      uVar174 = (ushort)(((uint6)bVar54 << 0x28) >> 0x28);
      uVar208 = (ushort)(((ulong)bVar55 << 0x38) >> 0x38);
      uVar209 = (ushort)(((uint)bVar57 << 0x18) >> 0x18);
      uVar171 = (ushort)(((uint6)bVar2 << 0x28) >> 0x28);
      uVar172 = (ushort)(((ulong)bVar58 << 0x38) >> 0x38);
      bVar122 = (uVar196 != 0) * (uVar196 < 0x100) * bVar5 - (0xff < uVar196);
      bVar123 = (uVar203 != 0) * (uVar203 < 0x100) * bVar7 - (0xff < uVar203);
      bVar124 = (uVar231 != 0) * (uVar231 < 0x100) * bVar9 - (0xff < uVar231);
      bVar125 = (uVar243 != 0) * (uVar243 < 0x100) * bVar11 - (0xff < uVar243);
      bVar5 = (uVar173 != 0) * (uVar173 < 0x100) * bVar53 - (0xff < uVar173);
      bVar7 = (uVar208 != 0) * (uVar208 < 0x100) * bVar55 - (0xff < uVar208);
      bVar11 = (uVar209 != 0) * (uVar209 < 0x100) * bVar57 - (0xff < uVar209);
      bVar9 = (uVar172 != 0) * (uVar172 < 0x100) * bVar58 - (0xff < uVar172);
      uVar231 = (ushort)(((uint)bVar13 << 0x18) >> 0x18);
      uVar199 = (ushort)(((uint6)bVar14 << 0x28) >> 0x28);
      uVar243 = (ushort)(((ulong)bVar15 << 0x38) >> 0x38);
      uVar232 = (ushort)(((uint)bVar17 << 0x18) >> 0x18);
      uVar238 = (ushort)(((uint6)bVar18 << 0x28) >> 0x28);
      uVar244 = (ushort)(((ulong)bVar19 << 0x38) >> 0x38);
      uVar173 = (ushort)(((uint)bVar60 << 0x18) >> 0x18);
      uVar208 = (ushort)(((uint6)bVar61 << 0x28) >> 0x28);
      uVar209 = (ushort)(((ulong)bVar62 << 0x38) >> 0x38);
      uVar172 = (ushort)(((uint)bVar64 << 0x18) >> 0x18);
      uVar203 = (ushort)(((uint6)bVar65 << 0x28) >> 0x28);
      uVar196 = (ushort)(((ulong)bVar66 << 0x38) >> 0x38);
      bVar13 = (uVar231 != 0) * (uVar231 < 0x100) * bVar13 - (0xff < uVar231);
      bVar15 = (uVar243 != 0) * (uVar243 < 0x100) * bVar15 - (0xff < uVar243);
      bVar17 = (uVar232 != 0) * (uVar232 < 0x100) * bVar17 - (0xff < uVar232);
      bVar19 = (uVar244 != 0) * (uVar244 < 0x100) * bVar19 - (0xff < uVar244);
      bVar58 = (uVar173 != 0) * (uVar173 < 0x100) * bVar60 - (0xff < uVar173);
      bVar57 = (uVar209 != 0) * (uVar209 < 0x100) * bVar62 - (0xff < uVar209);
      bVar53 = (uVar172 != 0) * (uVar172 < 0x100) * bVar64 - (0xff < uVar172);
      bVar55 = (uVar196 != 0) * (uVar196 < 0x100) * bVar66 - (0xff < uVar196);
      uVar232 = (ushort)(((uint)bVar21 << 0x18) >> 0x18);
      uVar244 = (ushort)(((uint6)bVar22 << 0x28) >> 0x28);
      uVar204 = (ushort)(((ulong)bVar23 << 0x38) >> 0x38);
      uVar233 = (ushort)(((uint)bVar25 << 0x18) >> 0x18);
      uVar239 = (ushort)(((uint6)bVar26 << 0x28) >> 0x28);
      uVar245 = (ushort)(((ulong)bVar27 << 0x38) >> 0x38);
      uVar173 = (ushort)(((uint)bVar68 << 0x18) >> 0x18);
      uVar209 = (ushort)(((uint6)bVar69 << 0x28) >> 0x28);
      uVar172 = (ushort)(((ulong)bVar70 << 0x38) >> 0x38);
      uVar196 = (ushort)(((uint)bVar72 << 0x18) >> 0x18);
      uVar231 = (ushort)(((uint6)bVar73 << 0x28) >> 0x28);
      uVar243 = (ushort)(((ulong)bVar74 << 0x38) >> 0x38);
      bVar66 = (uVar232 != 0) * (uVar232 < 0x100) * bVar21 - (0xff < uVar232);
      bVar23 = (uVar204 != 0) * (uVar204 < 0x100) * bVar23 - (0xff < uVar204);
      bVar64 = (uVar233 != 0) * (uVar233 < 0x100) * bVar25 - (0xff < uVar233);
      bVar62 = (uVar245 != 0) * (uVar245 < 0x100) * bVar27 - (0xff < uVar245);
      bVar60 = (uVar173 != 0) * (uVar173 < 0x100) * bVar68 - (0xff < uVar173);
      bVar21 = (uVar172 != 0) * (uVar172 < 0x100) * bVar70 - (0xff < uVar172);
      bVar25 = (uVar196 != 0) * (uVar196 < 0x100) * bVar72 - (0xff < uVar196);
      bVar27 = (uVar243 != 0) * (uVar243 < 0x100) * bVar74 - (0xff < uVar243);
      uVar193 = (ulong)CONCAT16((uStack_188c != 0) * (uStack_188c < 0x100) * (char)(uVar228 >> 0x20)
                                - (0xff < uStack_188c),
                                CONCAT15(bVar100,CONCAT14((uStack_1890 != 0) * (uStack_1890 < 0x100)
                                                          * (char)uVar228 - (0xff < uStack_1890),
                                                          CONCAT13(bVar99,CONCAT12((uStack_1894 != 0
                                                                                   ) * (uStack_1894
                                                                                       < 0x100) *
                                                                                   (char)(uVar193 >>
                                                                                         0x20) -
                                                                                   (0xff < 
                                                  uStack_1894),
                                                  CONCAT11(bVar98,(local_1898 != 0) *
                                                                  (local_1898 < 0x100) *
                                                                  (char)uVar193 -
                                                                  (0xff < local_1898))))))) &
                0xff00ff00ff00ff;
      uVar228 = (ulong)CONCAT16((uStack_189c != 0) * (uStack_189c < 0x100) * (char)(uVar168 >> 0x20)
                                - (0xff < uStack_189c),
                                CONCAT15(bVar104,CONCAT14((uStack_18a0 != 0) * (uStack_18a0 < 0x100)
                                                          * (char)uVar168 - (0xff < uStack_18a0),
                                                          CONCAT13(bVar103,CONCAT12((uStack_18a4 !=
                                                                                    0) * (
                                                  uStack_18a4 < 0x100) * (char)(uVar156 >> 0x20) -
                                                  (0xff < uStack_18a4),
                                                  CONCAT11(bVar102,(local_18a8 != 0) *
                                                                   (local_18a8 < 0x100) *
                                                                   (char)uVar156 -
                                                                   (0xff < local_18a8))))))) &
                0xff00ff00ff00ff;
      uVar156 = (ulong)CONCAT16((uStack_18ac != 0) * (uStack_18ac < 0x100) * (char)(uVar229 >> 0x20)
                                - (0xff < uStack_18ac),
                                CONCAT15(bVar108,CONCAT14((uStack_18b0 != 0) * (uStack_18b0 < 0x100)
                                                          * (char)uVar229 - (0xff < uStack_18b0),
                                                          CONCAT13(bVar107,CONCAT12((uStack_18b4 !=
                                                                                    0) * (
                                                  uStack_18b4 < 0x100) * (char)(uVar194 >> 0x20) -
                                                  (0xff < uStack_18b4),
                                                  CONCAT11(bVar106,(local_18b8 != 0) *
                                                                   (local_18b8 < 0x100) *
                                                                   (char)uVar194 -
                                                                   (0xff < local_18b8))))))) &
                0xff00ff00ff00ff;
      uVar168 = (ulong)CONCAT16((uStack_18bc != 0) * (uStack_18bc < 0x100) * (char)(uVar169 >> 0x20)
                                - (0xff < uStack_18bc),
                                CONCAT15(bVar112,CONCAT14((uStack_18c0 != 0) * (uStack_18c0 < 0x100)
                                                          * (char)uVar169 - (0xff < uStack_18c0),
                                                          CONCAT13(bVar111,CONCAT12((uStack_18c4 !=
                                                                                    0) * (
                                                  uStack_18c4 < 0x100) * (char)(uVar157 >> 0x20) -
                                                  (0xff < uStack_18c4),
                                                  CONCAT11(bVar110,(local_18c8 != 0) *
                                                                   (local_18c8 < 0x100) *
                                                                   (char)uVar157 -
                                                                   (0xff < local_18c8))))))) &
                0xff00ff00ff00ff;
      local_1958 = (ushort)uVar193;
      uStack_1956 = (ushort)(uVar193 >> 0x10);
      uStack_1954 = (ushort)(uVar193 >> 0x20);
      uStack_1952 = (ushort)(uVar193 >> 0x30);
      uStack_1950 = (ushort)uVar228;
      uStack_194e = (ushort)(uVar228 >> 0x10);
      uStack_194c = (ushort)(uVar228 >> 0x20);
      uStack_194a = (ushort)(uVar228 >> 0x30);
      local_1968 = (ushort)uVar156;
      uStack_1966 = (ushort)(uVar156 >> 0x10);
      uStack_1964 = (ushort)(uVar156 >> 0x20);
      uStack_1962 = (ushort)(uVar156 >> 0x30);
      uStack_1960 = (ushort)uVar168;
      uStack_195e = (ushort)(uVar168 >> 0x10);
      uStack_195c = (ushort)(uVar168 >> 0x20);
      uStack_195a = (ushort)(uVar168 >> 0x30);
      bVar126 = (uStack_1956 != 0) * (uStack_1956 < 0x100) * (char)(uVar193 >> 0x10) -
                (0xff < uStack_1956);
      bVar74 = (uStack_1952 != 0) * (uStack_1952 < 0x100) * (char)(uVar193 >> 0x30) -
               (0xff < uStack_1952);
      bVar127 = (uStack_194e != 0) * (uStack_194e < 0x100) * (char)(uVar228 >> 0x10) -
                (0xff < uStack_194e);
      bVar128 = (uStack_194a != 0) * (uStack_194a < 0x100) * (char)(uVar228 >> 0x30) -
                (0xff < uStack_194a);
      bVar129 = (uStack_1966 != 0) * (uStack_1966 < 0x100) * (char)(uVar156 >> 0x10) -
                (0xff < uStack_1966);
      bVar68 = (uStack_1962 != 0) * (uStack_1962 < 0x100) * (char)(uVar156 >> 0x30) -
               (0xff < uStack_1962);
      bVar70 = (uStack_195e != 0) * (uStack_195e < 0x100) * (char)(uVar168 >> 0x10) -
               (0xff < uStack_195e);
      bVar72 = (uStack_195a != 0) * (uStack_195a < 0x100) * (char)(uVar168 >> 0x30) -
               (0xff < uStack_195a);
      uVar194 = (ulong)CONCAT16((uStack_18cc != 0) * (uStack_18cc < 0x100) * (char)(uVar230 >> 0x20)
                                - (0xff < uStack_18cc),
                                CONCAT15(bVar116,CONCAT14((uStack_18d0 != 0) * (uStack_18d0 < 0x100)
                                                          * (char)uVar230 - (0xff < uStack_18d0),
                                                          CONCAT13(bVar115,CONCAT12((uStack_18d4 !=
                                                                                    0) * (
                                                  uStack_18d4 < 0x100) * (char)(uVar195 >> 0x20) -
                                                  (0xff < uStack_18d4),
                                                  CONCAT11(bVar114,(local_18d8 != 0) *
                                                                   (local_18d8 < 0x100) *
                                                                   (char)uVar195 -
                                                                   (0xff < local_18d8))))))) &
                0xff00ff00ff00ff;
      uVar229 = (ulong)CONCAT16((uStack_18dc != 0) * (uStack_18dc < 0x100) * (char)(uVar170 >> 0x20)
                                - (0xff < uStack_18dc),
                                CONCAT15(bVar120,CONCAT14((uStack_18e0 != 0) * (uStack_18e0 < 0x100)
                                                          * (char)uVar170 - (0xff < uStack_18e0),
                                                          CONCAT13(bVar119,CONCAT12((uStack_18e4 !=
                                                                                    0) * (
                                                  uStack_18e4 < 0x100) * (char)(uVar158 >> 0x20) -
                                                  (0xff < uStack_18e4),
                                                  CONCAT11(bVar118,(local_18e8 != 0) *
                                                                   (local_18e8 < 0x100) *
                                                                   (char)uVar158 -
                                                                   (0xff < local_18e8))))))) &
                0xff00ff00ff00ff;
      uVar157 = (ulong)CONCAT16((uVar237 != 0) * (uVar237 < 0x100) * bVar10 - (0xff < uVar237),
                                CONCAT15(bVar124,CONCAT14((bVar8 != 0) * (bVar8 < 0x100) * bVar8 -
                                                          (0xff < bVar8),
                                                          CONCAT13(bVar123,CONCAT12((uVar198 != 0) *
                                                                                    (uVar198 < 0x100
                                                                                    ) * bVar6 -
                                                                                    (0xff < uVar198)
                                                                                    ,CONCAT11(
                                                  bVar122,(bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                                          (0xff < bVar4))))))) & 0xff00ff00ff00ff;
      uVar169 = (ulong)CONCAT16((uVar171 != 0) * (uVar171 < 0x100) * bVar2 - (0xff < uVar171),
                                CONCAT15(bVar11,CONCAT14((bVar56 != 0) * (bVar56 < 0x100) * bVar56 -
                                                         (0xff < bVar56),
                                                         CONCAT13(bVar7,CONCAT12((uVar174 != 0) *
                                                                                 (uVar174 < 0x100) *
                                                                                 bVar54 - (0xff < 
                                                  uVar174),CONCAT11(bVar5,(bVar52 != 0) *
                                                                          (bVar52 < 0x100) * bVar52
                                                                          - (0xff < bVar52))))))) &
                0xff00ff00ff00ff;
      local_1978 = (ushort)uVar194;
      uStack_1976 = (ushort)(uVar194 >> 0x10);
      uStack_1974 = (ushort)(uVar194 >> 0x20);
      uStack_1972 = (ushort)(uVar194 >> 0x30);
      uStack_1970 = (ushort)uVar229;
      uStack_196e = (ushort)(uVar229 >> 0x10);
      uStack_196c = (ushort)(uVar229 >> 0x20);
      uStack_196a = (ushort)(uVar229 >> 0x30);
      local_1988 = (ushort)uVar157;
      uStack_1986 = (ushort)(uVar157 >> 0x10);
      uStack_1984 = (ushort)(uVar157 >> 0x20);
      uStack_1982 = (ushort)(uVar157 >> 0x30);
      uStack_1980 = (ushort)uVar169;
      uStack_197e = (ushort)(uVar169 >> 0x10);
      uStack_197c = (ushort)(uVar169 >> 0x20);
      uStack_197a = (ushort)(uVar169 >> 0x30);
      bVar2 = (uStack_1976 != 0) * (uStack_1976 < 0x100) * (char)(uVar194 >> 0x10) -
              (0xff < uStack_1976);
      bVar6 = (uStack_1972 != 0) * (uStack_1972 < 0x100) * (char)(uVar194 >> 0x30) -
              (0xff < uStack_1972);
      bVar10 = (uStack_196e != 0) * (uStack_196e < 0x100) * (char)(uVar229 >> 0x10) -
               (0xff < uStack_196e);
      bVar8 = (uStack_196a != 0) * (uStack_196a < 0x100) * (char)(uVar229 >> 0x30) -
              (0xff < uStack_196a);
      bVar4 = (uStack_1986 != 0) * (uStack_1986 < 0x100) * (char)(uVar157 >> 0x10) -
              (0xff < uStack_1986);
      bVar56 = (uStack_1982 != 0) * (uStack_1982 < 0x100) * (char)(uVar157 >> 0x30) -
               (0xff < uStack_1982);
      bVar54 = (uStack_197e != 0) * (uStack_197e < 0x100) * (char)(uVar169 >> 0x10) -
               (0xff < uStack_197e);
      bVar52 = (uStack_197a != 0) * (uStack_197a < 0x100) * (char)(uVar169 >> 0x30) -
               (0xff < uStack_197a);
      uVar195 = (ulong)CONCAT16((uVar238 != 0) * (uVar238 < 0x100) * bVar18 - (0xff < uVar238),
                                CONCAT15(bVar17,CONCAT14((bVar16 != 0) * (bVar16 < 0x100) * bVar16 -
                                                         (0xff < bVar16),
                                                         CONCAT13(bVar15,CONCAT12((uVar199 != 0) *
                                                                                  (uVar199 < 0x100)
                                                                                  * bVar14 -
                                                                                  (0xff < uVar199),
                                                                                  CONCAT11(bVar13,(
                                                  bVar12 != 0) * (bVar12 < 0x100) * bVar12 -
                                                  (0xff < bVar12))))))) & 0xff00ff00ff00ff;
      uVar230 = (ulong)CONCAT16((uVar203 != 0) * (uVar203 < 0x100) * bVar65 - (0xff < uVar203),
                                CONCAT15(bVar53,CONCAT14((bVar63 != 0) * (bVar63 < 0x100) * bVar63 -
                                                         (0xff < bVar63),
                                                         CONCAT13(bVar57,CONCAT12((uVar208 != 0) *
                                                                                  (uVar208 < 0x100)
                                                                                  * bVar61 -
                                                                                  (0xff < uVar208),
                                                                                  CONCAT11(bVar58,(
                                                  bVar59 != 0) * (bVar59 < 0x100) * bVar59 -
                                                  (0xff < bVar59))))))) & 0xff00ff00ff00ff;
      uVar158 = (ulong)CONCAT16((uVar239 != 0) * (uVar239 < 0x100) * bVar26 - (0xff < uVar239),
                                CONCAT15(bVar64,CONCAT14((bVar24 != 0) * (bVar24 < 0x100) * bVar24 -
                                                         (0xff < bVar24),
                                                         CONCAT13(bVar23,CONCAT12((uVar244 != 0) *
                                                                                  (uVar244 < 0x100)
                                                                                  * bVar22 -
                                                                                  (0xff < uVar244),
                                                                                  CONCAT11(bVar66,(
                                                  bVar20 != 0) * (bVar20 < 0x100) * bVar20 -
                                                  (0xff < bVar20))))))) & 0xff00ff00ff00ff;
      uVar170 = (ulong)CONCAT16((uVar231 != 0) * (uVar231 < 0x100) * bVar73 - (0xff < uVar231),
                                CONCAT15(bVar25,CONCAT14((bVar71 != 0) * (bVar71 < 0x100) * bVar71 -
                                                         (0xff < bVar71),
                                                         CONCAT13(bVar21,CONCAT12((uVar209 != 0) *
                                                                                  (uVar209 < 0x100)
                                                                                  * bVar69 -
                                                                                  (0xff < uVar209),
                                                                                  CONCAT11(bVar60,(
                                                  bVar67 != 0) * (bVar67 < 0x100) * bVar67 -
                                                  (0xff < bVar67))))))) & 0xff00ff00ff00ff;
      local_1998 = (ushort)uVar195;
      uStack_1996 = (ushort)(uVar195 >> 0x10);
      uStack_1994 = (ushort)(uVar195 >> 0x20);
      uStack_1992 = (ushort)(uVar195 >> 0x30);
      uStack_1990 = (ushort)uVar230;
      uStack_198e = (ushort)(uVar230 >> 0x10);
      uStack_198c = (ushort)(uVar230 >> 0x20);
      uStack_198a = (ushort)(uVar230 >> 0x30);
      local_19a8 = (ushort)uVar158;
      uStack_19a6 = (ushort)(uVar158 >> 0x10);
      uStack_19a4 = (ushort)(uVar158 >> 0x20);
      uStack_19a2 = (ushort)(uVar158 >> 0x30);
      uStack_19a0 = (ushort)uVar170;
      uStack_199e = (ushort)(uVar170 >> 0x10);
      uStack_199c = (ushort)(uVar170 >> 0x20);
      uStack_199a = (ushort)(uVar170 >> 0x30);
      bVar20 = (uStack_1996 != 0) * (uStack_1996 < 0x100) * (char)(uVar195 >> 0x10) -
               (0xff < uStack_1996);
      bVar12 = (uStack_1992 != 0) * (uStack_1992 < 0x100) * (char)(uVar195 >> 0x30) -
               (0xff < uStack_1992);
      bVar26 = (uStack_198e != 0) * (uStack_198e < 0x100) * (char)(uVar230 >> 0x10) -
               (0xff < uStack_198e);
      bVar22 = (uStack_198a != 0) * (uStack_198a < 0x100) * (char)(uVar230 >> 0x30) -
               (0xff < uStack_198a);
      bVar24 = (uStack_19a6 != 0) * (uStack_19a6 < 0x100) * (char)(uVar158 >> 0x10) -
               (0xff < uStack_19a6);
      bVar18 = (uStack_19a2 != 0) * (uStack_19a2 < 0x100) * (char)(uVar158 >> 0x30) -
               (0xff < uStack_19a2);
      bVar16 = (uStack_199e != 0) * (uStack_199e < 0x100) * (char)(uVar170 >> 0x10) -
               (0xff < uStack_199e);
      bVar14 = (uStack_199a != 0) * (uStack_199a < 0x100) * (char)(uVar170 >> 0x30) -
               (0xff < uStack_199a);
      uVar196 = (ushort)(((uint)bVar99 << 0x18) >> 0x18);
      uVar198 = (ushort)(((uint6)bVar100 << 0x28) >> 0x28);
      uVar203 = (ushort)(((ulong)bVar101 << 0x38) >> 0x38);
      uVar231 = (ushort)(((uint)bVar103 << 0x18) >> 0x18);
      uVar237 = (ushort)(((uint6)bVar104 << 0x28) >> 0x28);
      uVar243 = (ushort)(((ulong)bVar105 << 0x38) >> 0x38);
      uVar173 = (ushort)(((uint)bVar107 << 0x18) >> 0x18);
      uVar174 = (ushort)(((uint6)bVar108 << 0x28) >> 0x28);
      uVar208 = (ushort)(((ulong)bVar109 << 0x38) >> 0x38);
      uVar209 = (ushort)(((uint)bVar111 << 0x18) >> 0x18);
      uVar171 = (ushort)(((uint6)bVar112 << 0x28) >> 0x28);
      uVar172 = (ushort)(((ulong)bVar113 << 0x38) >> 0x38);
      bVar59 = (uVar196 != 0) * (uVar196 < 0x100) * bVar99 - (0xff < uVar196);
      bVar61 = (uVar203 != 0) * (uVar203 < 0x100) * bVar101 - (0xff < uVar203);
      bVar63 = (uVar231 != 0) * (uVar231 < 0x100) * bVar103 - (0xff < uVar231);
      bVar65 = (uVar243 != 0) * (uVar243 < 0x100) * bVar105 - (0xff < uVar243);
      bVar67 = (uVar173 != 0) * (uVar173 < 0x100) * bVar107 - (0xff < uVar173);
      bVar73 = (uVar208 != 0) * (uVar208 < 0x100) * bVar109 - (0xff < uVar208);
      bVar71 = (uVar209 != 0) * (uVar209 < 0x100) * bVar111 - (0xff < uVar209);
      bVar69 = (uVar172 != 0) * (uVar172 < 0x100) * bVar113 - (0xff < uVar172);
      uVar231 = (ushort)(((uint)bVar115 << 0x18) >> 0x18);
      uVar199 = (ushort)(((uint6)bVar116 << 0x28) >> 0x28);
      uVar243 = (ushort)(((ulong)bVar117 << 0x38) >> 0x38);
      uVar232 = (ushort)(((uint)bVar119 << 0x18) >> 0x18);
      uVar238 = (ushort)(((uint6)bVar120 << 0x28) >> 0x28);
      uVar244 = (ushort)(((ulong)bVar121 << 0x38) >> 0x38);
      uVar173 = (ushort)(((uint)bVar123 << 0x18) >> 0x18);
      uVar208 = (ushort)(((uint6)bVar124 << 0x28) >> 0x28);
      uVar209 = (ushort)(((ulong)bVar125 << 0x38) >> 0x38);
      uVar172 = (ushort)(((uint)bVar7 << 0x18) >> 0x18);
      uVar203 = (ushort)(((uint6)bVar11 << 0x28) >> 0x28);
      uVar196 = (ushort)(((ulong)bVar9 << 0x38) >> 0x38);
      bVar111 = (uVar231 != 0) * (uVar231 < 0x100) * bVar115 - (0xff < uVar231);
      bVar113 = (uVar243 != 0) * (uVar243 < 0x100) * bVar117 - (0xff < uVar243);
      bVar105 = (uVar232 != 0) * (uVar232 < 0x100) * bVar119 - (0xff < uVar232);
      bVar103 = (uVar244 != 0) * (uVar244 < 0x100) * bVar121 - (0xff < uVar244);
      bVar99 = (uVar173 != 0) * (uVar173 < 0x100) * bVar123 - (0xff < uVar173);
      bVar101 = (uVar209 != 0) * (uVar209 < 0x100) * bVar125 - (0xff < uVar209);
      bVar7 = (uVar172 != 0) * (uVar172 < 0x100) * bVar7 - (0xff < uVar172);
      bVar9 = (uVar196 != 0) * (uVar196 < 0x100) * bVar9 - (0xff < uVar196);
      uVar232 = (ushort)(((uint)bVar15 << 0x18) >> 0x18);
      uVar244 = (ushort)(((uint6)bVar17 << 0x28) >> 0x28);
      uVar204 = (ushort)(((ulong)bVar19 << 0x38) >> 0x38);
      uVar233 = (ushort)(((uint)bVar57 << 0x18) >> 0x18);
      uVar239 = (ushort)(((uint6)bVar53 << 0x28) >> 0x28);
      uVar245 = (ushort)(((ulong)bVar55 << 0x38) >> 0x38);
      uVar173 = (ushort)(((uint)bVar23 << 0x18) >> 0x18);
      uVar209 = (ushort)(((uint6)bVar64 << 0x28) >> 0x28);
      uVar172 = (ushort)(((ulong)bVar62 << 0x38) >> 0x38);
      uVar196 = (ushort)(((uint)bVar21 << 0x18) >> 0x18);
      uVar231 = (ushort)(((uint6)bVar25 << 0x28) >> 0x28);
      uVar243 = (ushort)(((ulong)bVar27 << 0x38) >> 0x38);
      bVar15 = (uVar232 != 0) * (uVar232 < 0x100) * bVar15 - (0xff < uVar232);
      bVar19 = (uVar204 != 0) * (uVar204 < 0x100) * bVar19 - (0xff < uVar204);
      bVar57 = (uVar233 != 0) * (uVar233 < 0x100) * bVar57 - (0xff < uVar233);
      bVar55 = (uVar245 != 0) * (uVar245 < 0x100) * bVar55 - (0xff < uVar245);
      bVar23 = (uVar173 != 0) * (uVar173 < 0x100) * bVar23 - (0xff < uVar173);
      bVar62 = (uVar172 != 0) * (uVar172 < 0x100) * bVar62 - (0xff < uVar172);
      bVar21 = (uVar196 != 0) * (uVar196 < 0x100) * bVar21 - (0xff < uVar196);
      bVar27 = (uVar243 != 0) * (uVar243 < 0x100) * bVar27 - (0xff < uVar243);
      uVar193 = (ulong)CONCAT16((uStack_194c != 0) * (uStack_194c < 0x100) * (char)(uVar228 >> 0x20)
                                - (0xff < uStack_194c),
                                CONCAT15(bVar127,CONCAT14((uStack_1950 != 0) * (uStack_1950 < 0x100)
                                                          * (char)uVar228 - (0xff < uStack_1950),
                                                          CONCAT13(bVar74,CONCAT12((uStack_1954 != 0
                                                                                   ) * (uStack_1954
                                                                                       < 0x100) *
                                                                                   (char)(uVar193 >>
                                                                                         0x20) -
                                                                                   (0xff < 
                                                  uStack_1954),
                                                  CONCAT11(bVar126,(local_1958 != 0) *
                                                                   (local_1958 < 0x100) *
                                                                   (char)uVar193 -
                                                                   (0xff < local_1958))))))) &
                0xff00ff00ff00ff;
      uVar228 = (ulong)CONCAT16((uStack_195c != 0) * (uStack_195c < 0x100) * (char)(uVar168 >> 0x20)
                                - (0xff < uStack_195c),
                                CONCAT15(bVar70,CONCAT14((uStack_1960 != 0) * (uStack_1960 < 0x100)
                                                         * (char)uVar168 - (0xff < uStack_1960),
                                                         CONCAT13(bVar68,CONCAT12((uStack_1964 != 0)
                                                                                  * (uStack_1964 <
                                                                                    0x100) *
                                                                                  (char)(uVar156 >>
                                                                                        0x20) -
                                                                                  (0xff < 
                                                  uStack_1964),
                                                  CONCAT11(bVar129,(local_1968 != 0) *
                                                                   (local_1968 < 0x100) *
                                                                   (char)uVar156 -
                                                                   (0xff < local_1968))))))) &
                0xff00ff00ff00ff;
      uVar156 = (ulong)CONCAT16((uStack_196c != 0) * (uStack_196c < 0x100) * (char)(uVar229 >> 0x20)
                                - (0xff < uStack_196c),
                                CONCAT15(bVar10,CONCAT14((uStack_1970 != 0) * (uStack_1970 < 0x100)
                                                         * (char)uVar229 - (0xff < uStack_1970),
                                                         CONCAT13(bVar6,CONCAT12((uStack_1974 != 0)
                                                                                 * (uStack_1974 <
                                                                                   0x100) *
                                                                                 (char)(uVar194 >>
                                                                                       0x20) -
                                                                                 (0xff < uStack_1974
                                                                                 ),CONCAT11(bVar2,(
                                                  local_1978 != 0) * (local_1978 < 0x100) *
                                                  (char)uVar194 - (0xff < local_1978))))))) &
                0xff00ff00ff00ff;
      uVar168 = (ulong)CONCAT16((uStack_197c != 0) * (uStack_197c < 0x100) * (char)(uVar169 >> 0x20)
                                - (0xff < uStack_197c),
                                CONCAT15(bVar54,CONCAT14((uStack_1980 != 0) * (uStack_1980 < 0x100)
                                                         * (char)uVar169 - (0xff < uStack_1980),
                                                         CONCAT13(bVar56,CONCAT12((uStack_1984 != 0)
                                                                                  * (uStack_1984 <
                                                                                    0x100) *
                                                                                  (char)(uVar157 >>
                                                                                        0x20) -
                                                                                  (0xff < 
                                                  uStack_1984),
                                                  CONCAT11(bVar4,(local_1988 != 0) *
                                                                 (local_1988 < 0x100) *
                                                                 (char)uVar157 - (0xff < local_1988)
                                                          )))))) & 0xff00ff00ff00ff;
      local_1a18 = (ushort)uVar193;
      uStack_1a16 = (ushort)(uVar193 >> 0x10);
      uStack_1a14 = (ushort)(uVar193 >> 0x20);
      uStack_1a12 = (ushort)(uVar193 >> 0x30);
      uStack_1a10 = (ushort)uVar228;
      uStack_1a0e = (ushort)(uVar228 >> 0x10);
      uStack_1a0c = (ushort)(uVar228 >> 0x20);
      uStack_1a0a = (ushort)(uVar228 >> 0x30);
      local_1a28 = (ushort)uVar156;
      uStack_1a26 = (ushort)(uVar156 >> 0x10);
      uStack_1a24 = (ushort)(uVar156 >> 0x20);
      uStack_1a22 = (ushort)(uVar156 >> 0x30);
      uStack_1a20 = (ushort)uVar168;
      uStack_1a1e = (ushort)(uVar168 >> 0x10);
      uStack_1a1c = (ushort)(uVar168 >> 0x20);
      uStack_1a1a = (ushort)(uVar168 >> 0x30);
      bVar125 = (uStack_1a16 != 0) * (uStack_1a16 < 0x100) * (char)(uVar193 >> 0x10) -
                (0xff < uStack_1a16);
      bVar121 = (uStack_1a12 != 0) * (uStack_1a12 < 0x100) * (char)(uVar193 >> 0x30) -
                (0xff < uStack_1a12);
      bVar119 = (uStack_1a0e != 0) * (uStack_1a0e < 0x100) * (char)(uVar228 >> 0x10) -
                (0xff < uStack_1a0e);
      bVar123 = (uStack_1a0a != 0) * (uStack_1a0a < 0x100) * (char)(uVar228 >> 0x30) -
                (0xff < uStack_1a0a);
      bVar117 = (uStack_1a26 != 0) * (uStack_1a26 < 0x100) * (char)(uVar156 >> 0x10) -
                (0xff < uStack_1a26);
      bVar115 = (uStack_1a22 != 0) * (uStack_1a22 < 0x100) * (char)(uVar156 >> 0x30) -
                (0xff < uStack_1a22);
      bVar107 = (uStack_1a1e != 0) * (uStack_1a1e < 0x100) * (char)(uVar168 >> 0x10) -
                (0xff < uStack_1a1e);
      bVar109 = (uStack_1a1a != 0) * (uStack_1a1a < 0x100) * (char)(uVar168 >> 0x30) -
                (0xff < uStack_1a1a);
      uVar194 = (ulong)CONCAT16((uStack_198c != 0) * (uStack_198c < 0x100) * (char)(uVar230 >> 0x20)
                                - (0xff < uStack_198c),
                                CONCAT15(bVar26,CONCAT14((uStack_1990 != 0) * (uStack_1990 < 0x100)
                                                         * (char)uVar230 - (0xff < uStack_1990),
                                                         CONCAT13(bVar12,CONCAT12((uStack_1994 != 0)
                                                                                  * (uStack_1994 <
                                                                                    0x100) *
                                                                                  (char)(uVar195 >>
                                                                                        0x20) -
                                                                                  (0xff < 
                                                  uStack_1994),
                                                  CONCAT11(bVar20,(local_1998 != 0) *
                                                                  (local_1998 < 0x100) *
                                                                  (char)uVar195 -
                                                                  (0xff < local_1998))))))) &
                0xff00ff00ff00ff;
      uVar229 = (ulong)CONCAT16((uStack_199c != 0) * (uStack_199c < 0x100) * (char)(uVar170 >> 0x20)
                                - (0xff < uStack_199c),
                                CONCAT15(bVar16,CONCAT14((uStack_19a0 != 0) * (uStack_19a0 < 0x100)
                                                         * (char)uVar170 - (0xff < uStack_19a0),
                                                         CONCAT13(bVar18,CONCAT12((uStack_19a4 != 0)
                                                                                  * (uStack_19a4 <
                                                                                    0x100) *
                                                                                  (char)(uVar158 >>
                                                                                        0x20) -
                                                                                  (0xff < 
                                                  uStack_19a4),
                                                  CONCAT11(bVar24,(local_19a8 != 0) *
                                                                  (local_19a8 < 0x100) *
                                                                  (char)uVar158 -
                                                                  (0xff < local_19a8))))))) &
                0xff00ff00ff00ff;
      uVar157 = (ulong)CONCAT16((uVar237 != 0) * (uVar237 < 0x100) * bVar104 - (0xff < uVar237),
                                CONCAT15(bVar63,CONCAT14((bVar102 != 0) * (bVar102 < 0x100) *
                                                         bVar102 - (0xff < bVar102),
                                                         CONCAT13(bVar61,CONCAT12((uVar198 != 0) *
                                                                                  (uVar198 < 0x100)
                                                                                  * bVar100 -
                                                                                  (0xff < uVar198),
                                                                                  CONCAT11(bVar59,(
                                                  bVar98 != 0) * (bVar98 < 0x100) * bVar98 -
                                                  (0xff < bVar98))))))) & 0xff00ff00ff00ff;
      uVar169 = (ulong)CONCAT16((uVar171 != 0) * (uVar171 < 0x100) * bVar112 - (0xff < uVar171),
                                CONCAT15(bVar71,CONCAT14((bVar110 != 0) * (bVar110 < 0x100) *
                                                         bVar110 - (0xff < bVar110),
                                                         CONCAT13(bVar73,CONCAT12((uVar174 != 0) *
                                                                                  (uVar174 < 0x100)
                                                                                  * bVar108 -
                                                                                  (0xff < uVar174),
                                                                                  CONCAT11(bVar67,(
                                                  bVar106 != 0) * (bVar106 < 0x100) * bVar106 -
                                                  (0xff < bVar106))))))) & 0xff00ff00ff00ff;
      local_1a38 = (ushort)uVar194;
      uStack_1a36 = (ushort)(uVar194 >> 0x10);
      uStack_1a34 = (ushort)(uVar194 >> 0x20);
      uStack_1a32 = (ushort)(uVar194 >> 0x30);
      uStack_1a30 = (ushort)uVar229;
      uStack_1a2e = (ushort)(uVar229 >> 0x10);
      uStack_1a2c = (ushort)(uVar229 >> 0x20);
      uStack_1a2a = (ushort)(uVar229 >> 0x30);
      local_1a48 = (ushort)uVar157;
      uStack_1a46 = (ushort)(uVar157 >> 0x10);
      uStack_1a44 = (ushort)(uVar157 >> 0x20);
      uStack_1a42 = (ushort)(uVar157 >> 0x30);
      uStack_1a40 = (ushort)uVar169;
      uStack_1a3e = (ushort)(uVar169 >> 0x10);
      uStack_1a3c = (ushort)(uVar169 >> 0x20);
      uStack_1a3a = (ushort)(uVar169 >> 0x30);
      bVar98 = (uStack_1a36 != 0) * (uStack_1a36 < 0x100) * (char)(uVar194 >> 0x10) -
               (0xff < uStack_1a36);
      bVar100 = (uStack_1a32 != 0) * (uStack_1a32 < 0x100) * (char)(uVar194 >> 0x30) -
                (0xff < uStack_1a32);
      bVar102 = (uStack_1a2e != 0) * (uStack_1a2e < 0x100) * (char)(uVar229 >> 0x10) -
                (0xff < uStack_1a2e);
      bVar104 = (uStack_1a2a != 0) * (uStack_1a2a < 0x100) * (char)(uVar229 >> 0x30) -
                (0xff < uStack_1a2a);
      bVar110 = (uStack_1a46 != 0) * (uStack_1a46 < 0x100) * (char)(uVar157 >> 0x10) -
                (0xff < uStack_1a46);
      bVar112 = (uStack_1a42 != 0) * (uStack_1a42 < 0x100) * (char)(uVar157 >> 0x30) -
                (0xff < uStack_1a42);
      bVar108 = (uStack_1a3e != 0) * (uStack_1a3e < 0x100) * (char)(uVar169 >> 0x10) -
                (0xff < uStack_1a3e);
      bVar106 = (uStack_1a3a != 0) * (uStack_1a3a < 0x100) * (char)(uVar169 >> 0x30) -
                (0xff < uStack_1a3a);
      uVar195 = (ulong)CONCAT16((uVar238 != 0) * (uVar238 < 0x100) * bVar120 - (0xff < uVar238),
                                CONCAT15(bVar105,CONCAT14((bVar118 != 0) * (bVar118 < 0x100) *
                                                          bVar118 - (0xff < bVar118),
                                                          CONCAT13(bVar113,CONCAT12((uVar199 != 0) *
                                                                                    (uVar199 < 0x100
                                                                                    ) * bVar116 -
                                                                                    (0xff < uVar199)
                                                                                    ,CONCAT11(
                                                  bVar111,(bVar114 != 0) * (bVar114 < 0x100) *
                                                          bVar114 - (0xff < bVar114))))))) &
                0xff00ff00ff00ff;
      uVar230 = (ulong)CONCAT16((uVar203 != 0) * (uVar203 < 0x100) * bVar11 - (0xff < uVar203),
                                CONCAT15(bVar7,CONCAT14((bVar5 != 0) * (bVar5 < 0x100) * bVar5 -
                                                        (0xff < bVar5),
                                                        CONCAT13(bVar101,CONCAT12((uVar208 != 0) *
                                                                                  (uVar208 < 0x100)
                                                                                  * bVar124 -
                                                                                  (0xff < uVar208),
                                                                                  CONCAT11(bVar99,(
                                                  bVar122 != 0) * (bVar122 < 0x100) * bVar122 -
                                                  (0xff < bVar122))))))) & 0xff00ff00ff00ff;
      uVar158 = (ulong)CONCAT16((uVar239 != 0) * (uVar239 < 0x100) * bVar53 - (0xff < uVar239),
                                CONCAT15(bVar57,CONCAT14((bVar58 != 0) * (bVar58 < 0x100) * bVar58 -
                                                         (0xff < bVar58),
                                                         CONCAT13(bVar19,CONCAT12((uVar244 != 0) *
                                                                                  (uVar244 < 0x100)
                                                                                  * bVar17 -
                                                                                  (0xff < uVar244),
                                                                                  CONCAT11(bVar15,(
                                                  bVar13 != 0) * (bVar13 < 0x100) * bVar13 -
                                                  (0xff < bVar13))))))) & 0xff00ff00ff00ff;
      uVar170 = (ulong)CONCAT16((uVar231 != 0) * (uVar231 < 0x100) * bVar25 - (0xff < uVar231),
                                CONCAT15(bVar21,CONCAT14((bVar60 != 0) * (bVar60 < 0x100) * bVar60 -
                                                         (0xff < bVar60),
                                                         CONCAT13(bVar62,CONCAT12((uVar209 != 0) *
                                                                                  (uVar209 < 0x100)
                                                                                  * bVar64 -
                                                                                  (0xff < uVar209),
                                                                                  CONCAT11(bVar23,(
                                                  bVar66 != 0) * (bVar66 < 0x100) * bVar66 -
                                                  (0xff < bVar66))))))) & 0xff00ff00ff00ff;
      local_1a58 = (ushort)uVar195;
      uStack_1a56 = (ushort)(uVar195 >> 0x10);
      uStack_1a54 = (ushort)(uVar195 >> 0x20);
      uStack_1a52 = (ushort)(uVar195 >> 0x30);
      uStack_1a50 = (ushort)uVar230;
      uStack_1a4e = (ushort)(uVar230 >> 0x10);
      uStack_1a4c = (ushort)(uVar230 >> 0x20);
      uStack_1a4a = (ushort)(uVar230 >> 0x30);
      local_1a68 = (ushort)uVar158;
      uStack_1a66 = (ushort)(uVar158 >> 0x10);
      uStack_1a64 = (ushort)(uVar158 >> 0x20);
      uStack_1a62 = (ushort)(uVar158 >> 0x30);
      uStack_1a60 = (ushort)uVar170;
      uStack_1a5e = (ushort)(uVar170 >> 0x10);
      uStack_1a5c = (ushort)(uVar170 >> 0x20);
      uStack_1a5a = (ushort)(uVar170 >> 0x30);
      bVar11 = (uStack_1a56 != 0) * (uStack_1a56 < 0x100) * (char)(uVar195 >> 0x10) -
               (0xff < uStack_1a56);
      bVar60 = (uStack_1a52 != 0) * (uStack_1a52 < 0x100) * (char)(uVar195 >> 0x30) -
               (0xff < uStack_1a52);
      bVar53 = (uStack_1a4e != 0) * (uStack_1a4e < 0x100) * (char)(uVar230 >> 0x10) -
               (0xff < uStack_1a4e);
      bVar58 = (uStack_1a4a != 0) * (uStack_1a4a < 0x100) * (char)(uVar230 >> 0x30) -
               (0xff < uStack_1a4a);
      bVar25 = (uStack_1a66 != 0) * (uStack_1a66 < 0x100) * (char)(uVar158 >> 0x10) -
               (0xff < uStack_1a66);
      bVar17 = (uStack_1a62 != 0) * (uStack_1a62 < 0x100) * (char)(uVar158 >> 0x30) -
               (0xff < uStack_1a62);
      bVar13 = (uStack_1a5e != 0) * (uStack_1a5e < 0x100) * (char)(uVar170 >> 0x10) -
               (0xff < uStack_1a5e);
      bVar5 = (uStack_1a5a != 0) * (uStack_1a5a < 0x100) * (char)(uVar170 >> 0x30) -
              (0xff < uStack_1a5a);
      uVar196 = (ushort)(((uint)bVar74 << 0x18) >> 0x18);
      uVar198 = (ushort)(((uint6)bVar127 << 0x28) >> 0x28);
      uVar203 = (ushort)(((ulong)bVar128 << 0x38) >> 0x38);
      uVar231 = (ushort)(((uint)bVar68 << 0x18) >> 0x18);
      uVar237 = (ushort)(((uint6)bVar70 << 0x28) >> 0x28);
      uVar243 = (ushort)(((ulong)bVar72 << 0x38) >> 0x38);
      uVar173 = (ushort)(((uint)bVar6 << 0x18) >> 0x18);
      uVar174 = (ushort)(((uint6)bVar10 << 0x28) >> 0x28);
      uVar208 = (ushort)(((ulong)bVar8 << 0x38) >> 0x38);
      uVar209 = (ushort)(((uint)bVar56 << 0x18) >> 0x18);
      uVar171 = (ushort)(((uint6)bVar54 << 0x28) >> 0x28);
      uVar172 = (ushort)(((ulong)bVar52 << 0x38) >> 0x38);
      bVar64 = (uVar196 != 0) * (uVar196 < 0x100) * bVar74 - (0xff < uVar196);
      bVar114 = (uVar203 != 0) * (uVar203 < 0x100) * bVar128 - (0xff < uVar203);
      bVar68 = (uVar231 != 0) * (uVar231 < 0x100) * bVar68 - (0xff < uVar231);
      bVar72 = (uVar243 != 0) * (uVar243 < 0x100) * bVar72 - (0xff < uVar243);
      bVar74 = (uVar173 != 0) * (uVar173 < 0x100) * bVar6 - (0xff < uVar173);
      bVar66 = (uVar208 != 0) * (uVar208 < 0x100) * bVar8 - (0xff < uVar208);
      bVar8 = (uVar209 != 0) * (uVar209 < 0x100) * bVar56 - (0xff < uVar209);
      bVar6 = (uVar172 != 0) * (uVar172 < 0x100) * bVar52 - (0xff < uVar172);
      uVar231 = (ushort)(((uint)bVar12 << 0x18) >> 0x18);
      uVar199 = (ushort)(((uint6)bVar26 << 0x28) >> 0x28);
      uVar243 = (ushort)(((ulong)bVar22 << 0x38) >> 0x38);
      uVar232 = (ushort)(((uint)bVar18 << 0x18) >> 0x18);
      uVar238 = (ushort)(((uint6)bVar16 << 0x28) >> 0x28);
      uVar244 = (ushort)(((ulong)bVar14 << 0x38) >> 0x38);
      uVar173 = (ushort)(((uint)bVar61 << 0x18) >> 0x18);
      uVar208 = (ushort)(((uint6)bVar63 << 0x28) >> 0x28);
      uVar209 = (ushort)(((ulong)bVar65 << 0x38) >> 0x38);
      uVar172 = (ushort)(((uint)bVar73 << 0x18) >> 0x18);
      uVar203 = (ushort)(((uint6)bVar71 << 0x28) >> 0x28);
      uVar196 = (ushort)(((ulong)bVar69 << 0x38) >> 0x38);
      bVar12 = (uVar231 != 0) * (uVar231 < 0x100) * bVar12 - (0xff < uVar231);
      bVar22 = (uVar243 != 0) * (uVar243 < 0x100) * bVar22 - (0xff < uVar243);
      bVar18 = (uVar232 != 0) * (uVar232 < 0x100) * bVar18 - (0xff < uVar232);
      bVar14 = (uVar244 != 0) * (uVar244 < 0x100) * bVar14 - (0xff < uVar244);
      bVar56 = (uVar173 != 0) * (uVar173 < 0x100) * bVar61 - (0xff < uVar173);
      bVar52 = (uVar209 != 0) * (uVar209 < 0x100) * bVar65 - (0xff < uVar209);
      bVar61 = (uVar172 != 0) * (uVar172 < 0x100) * bVar73 - (0xff < uVar172);
      bVar65 = (uVar196 != 0) * (uVar196 < 0x100) * bVar69 - (0xff < uVar196);
      uVar232 = (ushort)(((uint)bVar113 << 0x18) >> 0x18);
      uVar244 = (ushort)(((uint6)bVar105 << 0x28) >> 0x28);
      uVar204 = (ushort)(((ulong)bVar103 << 0x38) >> 0x38);
      uVar233 = (ushort)(((uint)bVar101 << 0x18) >> 0x18);
      uVar239 = (ushort)(((uint6)bVar7 << 0x28) >> 0x28);
      uVar245 = (ushort)(((ulong)bVar9 << 0x38) >> 0x38);
      uVar173 = (ushort)(((uint)bVar19 << 0x18) >> 0x18);
      uVar209 = (ushort)(((uint6)bVar57 << 0x28) >> 0x28);
      uVar172 = (ushort)(((ulong)bVar55 << 0x38) >> 0x38);
      uVar196 = (ushort)(((uint)bVar62 << 0x18) >> 0x18);
      uVar231 = (ushort)(((uint6)bVar21 << 0x28) >> 0x28);
      uVar243 = (ushort)(((ulong)bVar27 << 0x38) >> 0x38);
      bVar73 = (uVar232 != 0) * (uVar232 < 0x100) * bVar113 - (0xff < uVar232);
      bVar103 = (uVar204 != 0) * (uVar204 < 0x100) * bVar103 - (0xff < uVar204);
      bVar101 = (uVar233 != 0) * (uVar233 < 0x100) * bVar101 - (0xff < uVar233);
      bVar69 = (uVar245 != 0) * (uVar245 < 0x100) * bVar9 - (0xff < uVar245);
      bVar113 = (uVar173 != 0) * (uVar173 < 0x100) * bVar19 - (0xff < uVar173);
      bVar55 = (uVar172 != 0) * (uVar172 < 0x100) * bVar55 - (0xff < uVar172);
      bVar19 = (uVar196 != 0) * (uVar196 < 0x100) * bVar62 - (0xff < uVar196);
      bVar9 = (uVar243 != 0) * (uVar243 < 0x100) * bVar27 - (0xff < uVar243);
      uVar193 = (ulong)CONCAT16((uStack_1a0c != 0) * (uStack_1a0c < 0x100) * (char)(uVar228 >> 0x20)
                                - (0xff < uStack_1a0c),
                                CONCAT15(bVar119,CONCAT14((uStack_1a10 != 0) * (uStack_1a10 < 0x100)
                                                          * (char)uVar228 - (0xff < uStack_1a10),
                                                          CONCAT13(bVar121,CONCAT12((uStack_1a14 !=
                                                                                    0) * (
                                                  uStack_1a14 < 0x100) * (char)(uVar193 >> 0x20) -
                                                  (0xff < uStack_1a14),
                                                  CONCAT11(bVar125,(local_1a18 != 0) *
                                                                   (local_1a18 < 0x100) *
                                                                   (char)uVar193 -
                                                                   (0xff < local_1a18))))))) &
                0xff00ff00ff00ff;
      uVar228 = (ulong)CONCAT16((uStack_1a1c != 0) * (uStack_1a1c < 0x100) * (char)(uVar168 >> 0x20)
                                - (0xff < uStack_1a1c),
                                CONCAT15(bVar107,CONCAT14((uStack_1a20 != 0) * (uStack_1a20 < 0x100)
                                                          * (char)uVar168 - (0xff < uStack_1a20),
                                                          CONCAT13(bVar115,CONCAT12((uStack_1a24 !=
                                                                                    0) * (
                                                  uStack_1a24 < 0x100) * (char)(uVar156 >> 0x20) -
                                                  (0xff < uStack_1a24),
                                                  CONCAT11(bVar117,(local_1a28 != 0) *
                                                                   (local_1a28 < 0x100) *
                                                                   (char)uVar156 -
                                                                   (0xff < local_1a28))))))) &
                0xff00ff00ff00ff;
      uVar156 = (ulong)CONCAT16((uStack_1a2c != 0) * (uStack_1a2c < 0x100) * (char)(uVar229 >> 0x20)
                                - (0xff < uStack_1a2c),
                                CONCAT15(bVar102,CONCAT14((uStack_1a30 != 0) * (uStack_1a30 < 0x100)
                                                          * (char)uVar229 - (0xff < uStack_1a30),
                                                          CONCAT13(bVar100,CONCAT12((uStack_1a34 !=
                                                                                    0) * (
                                                  uStack_1a34 < 0x100) * (char)(uVar194 >> 0x20) -
                                                  (0xff < uStack_1a34),
                                                  CONCAT11(bVar98,(local_1a38 != 0) *
                                                                  (local_1a38 < 0x100) *
                                                                  (char)uVar194 -
                                                                  (0xff < local_1a38))))))) &
                0xff00ff00ff00ff;
      uVar168 = (ulong)CONCAT16((uStack_1a3c != 0) * (uStack_1a3c < 0x100) * (char)(uVar169 >> 0x20)
                                - (0xff < uStack_1a3c),
                                CONCAT15(bVar108,CONCAT14((uStack_1a40 != 0) * (uStack_1a40 < 0x100)
                                                          * (char)uVar169 - (0xff < uStack_1a40),
                                                          CONCAT13(bVar112,CONCAT12((uStack_1a44 !=
                                                                                    0) * (
                                                  uStack_1a44 < 0x100) * (char)(uVar157 >> 0x20) -
                                                  (0xff < uStack_1a44),
                                                  CONCAT11(bVar110,(local_1a48 != 0) *
                                                                   (local_1a48 < 0x100) *
                                                                   (char)uVar157 -
                                                                   (0xff < local_1a48))))))) &
                0xff00ff00ff00ff;
      local_1ad8 = (ushort)uVar193;
      uStack_1ad6 = (ushort)(uVar193 >> 0x10);
      uStack_1ad4 = (ushort)(uVar193 >> 0x20);
      uStack_1ad2 = (ushort)(uVar193 >> 0x30);
      uStack_1ad0 = (ushort)uVar228;
      uStack_1ace = (ushort)(uVar228 >> 0x10);
      uStack_1acc = (ushort)(uVar228 >> 0x20);
      uStack_1aca = (ushort)(uVar228 >> 0x30);
      local_1ae8 = (ushort)uVar156;
      uStack_1ae6 = (ushort)(uVar156 >> 0x10);
      uStack_1ae4 = (ushort)(uVar156 >> 0x20);
      uStack_1ae2 = (ushort)(uVar156 >> 0x30);
      uStack_1ae0 = (ushort)uVar168;
      uStack_1ade = (ushort)(uVar168 >> 0x10);
      uStack_1adc = (ushort)(uVar168 >> 0x20);
      uStack_1ada = (ushort)(uVar168 >> 0x30);
      bVar27 = (uStack_1ad6 != 0) * (uStack_1ad6 < 0x100) * (char)(uVar193 >> 0x10) -
               (0xff < uStack_1ad6);
      bVar62 = (uStack_1ad2 != 0) * (uStack_1ad2 < 0x100) * (char)(uVar193 >> 0x30) -
               (0xff < uStack_1ad2);
      bVar116 = (uStack_1ace != 0) * (uStack_1ace < 0x100) * (char)(uVar228 >> 0x10) -
                (0xff < uStack_1ace);
      bVar118 = (uStack_1aca != 0) * (uStack_1aca < 0x100) * (char)(uVar228 >> 0x30) -
                (0xff < uStack_1aca);
      bVar120 = (uStack_1ae6 != 0) * (uStack_1ae6 < 0x100) * (char)(uVar156 >> 0x10) -
                (0xff < uStack_1ae6);
      bVar124 = (uStack_1ae2 != 0) * (uStack_1ae2 < 0x100) * (char)(uVar156 >> 0x30) -
                (0xff < uStack_1ae2);
      bVar122 = (uStack_1ade != 0) * (uStack_1ade < 0x100) * (char)(uVar168 >> 0x10) -
                (0xff < uStack_1ade);
      bVar128 = (uStack_1ada != 0) * (uStack_1ada < 0x100) * (char)(uVar168 >> 0x30) -
                (0xff < uStack_1ada);
      uVar194 = (ulong)CONCAT16((uStack_1a4c != 0) * (uStack_1a4c < 0x100) * (char)(uVar230 >> 0x20)
                                - (0xff < uStack_1a4c),
                                CONCAT15(bVar53,CONCAT14((uStack_1a50 != 0) * (uStack_1a50 < 0x100)
                                                         * (char)uVar230 - (0xff < uStack_1a50),
                                                         CONCAT13(bVar60,CONCAT12((uStack_1a54 != 0)
                                                                                  * (uStack_1a54 <
                                                                                    0x100) *
                                                                                  (char)(uVar195 >>
                                                                                        0x20) -
                                                                                  (0xff < 
                                                  uStack_1a54),
                                                  CONCAT11(bVar11,(local_1a58 != 0) *
                                                                  (local_1a58 < 0x100) *
                                                                  (char)uVar195 -
                                                                  (0xff < local_1a58))))))) &
                0xff00ff00ff00ff;
      uVar229 = (ulong)CONCAT16((uStack_1a5c != 0) * (uStack_1a5c < 0x100) * (char)(uVar170 >> 0x20)
                                - (0xff < uStack_1a5c),
                                CONCAT15(bVar13,CONCAT14((uStack_1a60 != 0) * (uStack_1a60 < 0x100)
                                                         * (char)uVar170 - (0xff < uStack_1a60),
                                                         CONCAT13(bVar17,CONCAT12((uStack_1a64 != 0)
                                                                                  * (uStack_1a64 <
                                                                                    0x100) *
                                                                                  (char)(uVar158 >>
                                                                                        0x20) -
                                                                                  (0xff < 
                                                  uStack_1a64),
                                                  CONCAT11(bVar25,(local_1a68 != 0) *
                                                                  (local_1a68 < 0x100) *
                                                                  (char)uVar158 -
                                                                  (0xff < local_1a68))))))) &
                0xff00ff00ff00ff;
      uVar157 = (ulong)CONCAT16((uVar237 != 0) * (uVar237 < 0x100) * bVar70 - (0xff < uVar237),
                                CONCAT15(bVar68,CONCAT14((bVar129 != 0) * (bVar129 < 0x100) *
                                                         bVar129 - (0xff < bVar129),
                                                         CONCAT13(bVar114,CONCAT12((uVar198 != 0) *
                                                                                   (uVar198 < 0x100)
                                                                                   * bVar127 -
                                                                                   (0xff < uVar198),
                                                                                   CONCAT11(bVar64,(
                                                  bVar126 != 0) * (bVar126 < 0x100) * bVar126 -
                                                  (0xff < bVar126))))))) & 0xff00ff00ff00ff;
      uVar169 = (ulong)CONCAT16((uVar171 != 0) * (uVar171 < 0x100) * bVar54 - (0xff < uVar171),
                                CONCAT15(bVar8,CONCAT14((bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                                        (0xff < bVar4),
                                                        CONCAT13(bVar66,CONCAT12((uVar174 != 0) *
                                                                                 (uVar174 < 0x100) *
                                                                                 bVar10 - (0xff < 
                                                  uVar174),CONCAT11(bVar74,(bVar2 != 0) *
                                                                           (bVar2 < 0x100) * bVar2 -
                                                                           (0xff < bVar2))))))) &
                0xff00ff00ff00ff;
      local_1af8 = (ushort)uVar194;
      uStack_1af6 = (ushort)(uVar194 >> 0x10);
      uStack_1af4 = (ushort)(uVar194 >> 0x20);
      uStack_1af2 = (ushort)(uVar194 >> 0x30);
      uStack_1af0 = (ushort)uVar229;
      uStack_1aee = (ushort)(uVar229 >> 0x10);
      uStack_1aec = (ushort)(uVar229 >> 0x20);
      uStack_1aea = (ushort)(uVar229 >> 0x30);
      local_1b08 = (ushort)uVar157;
      uStack_1b06 = (ushort)(uVar157 >> 0x10);
      uStack_1b04 = (ushort)(uVar157 >> 0x20);
      uStack_1b02 = (ushort)(uVar157 >> 0x30);
      uStack_1b00 = (ushort)uVar169;
      uStack_1afe = (ushort)(uVar169 >> 0x10);
      uStack_1afc = (ushort)(uVar169 >> 0x20);
      uStack_1afa = (ushort)(uVar169 >> 0x30);
      bVar126 = (uStack_1af6 != 0) * (uStack_1af6 < 0x100) * (char)(uVar194 >> 0x10) -
                (0xff < uStack_1af6);
      bVar127 = (uStack_1af2 != 0) * (uStack_1af2 < 0x100) * (char)(uVar194 >> 0x30) -
                (0xff < uStack_1af2);
      bVar129 = (uStack_1aee != 0) * (uStack_1aee < 0x100) * (char)(uVar229 >> 0x10) -
                (0xff < uStack_1aee);
      bVar70 = (uStack_1aea != 0) * (uStack_1aea < 0x100) * (char)(uVar229 >> 0x30) -
               (0xff < uStack_1aea);
      bVar2 = (uStack_1b06 != 0) * (uStack_1b06 < 0x100) * (char)(uVar157 >> 0x10) -
              (0xff < uStack_1b06);
      bVar54 = (uStack_1b02 != 0) * (uStack_1b02 < 0x100) * (char)(uVar157 >> 0x30) -
               (0xff < uStack_1b02);
      bVar4 = (uStack_1afe != 0) * (uStack_1afe < 0x100) * (char)(uVar169 >> 0x10) -
              (0xff < uStack_1afe);
      bVar10 = (uStack_1afa != 0) * (uStack_1afa < 0x100) * (char)(uVar169 >> 0x30) -
               (0xff < uStack_1afa);
      uVar195 = (ulong)CONCAT16((uVar238 != 0) * (uVar238 < 0x100) * bVar16 - (0xff < uVar238),
                                CONCAT15(bVar18,CONCAT14((bVar24 != 0) * (bVar24 < 0x100) * bVar24 -
                                                         (0xff < bVar24),
                                                         CONCAT13(bVar22,CONCAT12((uVar199 != 0) *
                                                                                  (uVar199 < 0x100)
                                                                                  * bVar26 -
                                                                                  (0xff < uVar199),
                                                                                  CONCAT11(bVar12,(
                                                  bVar20 != 0) * (bVar20 < 0x100) * bVar20 -
                                                  (0xff < bVar20))))))) & 0xff00ff00ff00ff;
      uVar230 = (ulong)CONCAT16((uVar203 != 0) * (uVar203 < 0x100) * bVar71 - (0xff < uVar203),
                                CONCAT15(bVar61,CONCAT14((bVar67 != 0) * (bVar67 < 0x100) * bVar67 -
                                                         (0xff < bVar67),
                                                         CONCAT13(bVar52,CONCAT12((uVar208 != 0) *
                                                                                  (uVar208 < 0x100)
                                                                                  * bVar63 -
                                                                                  (0xff < uVar208),
                                                                                  CONCAT11(bVar56,(
                                                  bVar59 != 0) * (bVar59 < 0x100) * bVar59 -
                                                  (0xff < bVar59))))))) & 0xff00ff00ff00ff;
      uVar158 = (ulong)CONCAT16((uVar239 != 0) * (uVar239 < 0x100) * bVar7 - (0xff < uVar239),
                                CONCAT15(bVar101,CONCAT14((bVar99 != 0) * (bVar99 < 0x100) * bVar99
                                                          - (0xff < bVar99),
                                                          CONCAT13(bVar103,CONCAT12((uVar244 != 0) *
                                                                                    (uVar244 < 0x100
                                                                                    ) * bVar105 -
                                                                                    (0xff < uVar244)
                                                                                    ,CONCAT11(bVar73
                                                  ,(bVar111 != 0) * (bVar111 < 0x100) * bVar111 -
                                                   (0xff < bVar111))))))) & 0xff00ff00ff00ff;
      uVar170 = (ulong)CONCAT16((uVar231 != 0) * (uVar231 < 0x100) * bVar21 - (0xff < uVar231),
                                CONCAT15(bVar19,CONCAT14((bVar23 != 0) * (bVar23 < 0x100) * bVar23 -
                                                         (0xff < bVar23),
                                                         CONCAT13(bVar55,CONCAT12((uVar209 != 0) *
                                                                                  (uVar209 < 0x100)
                                                                                  * bVar57 -
                                                                                  (0xff < uVar209),
                                                                                  CONCAT11(bVar113,(
                                                  bVar15 != 0) * (bVar15 < 0x100) * bVar15 -
                                                  (0xff < bVar15))))))) & 0xff00ff00ff00ff;
      local_1b18 = (ushort)uVar195;
      uStack_1b16 = (ushort)(uVar195 >> 0x10);
      uStack_1b14 = (ushort)(uVar195 >> 0x20);
      uStack_1b12 = (ushort)(uVar195 >> 0x30);
      uStack_1b10 = (ushort)uVar230;
      uStack_1b0e = (ushort)(uVar230 >> 0x10);
      uStack_1b0c = (ushort)(uVar230 >> 0x20);
      uStack_1b0a = (ushort)(uVar230 >> 0x30);
      local_1b28 = (ushort)uVar158;
      uStack_1b26 = (ushort)(uVar158 >> 0x10);
      uStack_1b24 = (ushort)(uVar158 >> 0x20);
      uStack_1b22 = (ushort)(uVar158 >> 0x30);
      uStack_1b20 = (ushort)uVar170;
      uStack_1b1e = (ushort)(uVar170 >> 0x10);
      uStack_1b1c = (ushort)(uVar170 >> 0x20);
      uStack_1b1a = (ushort)(uVar170 >> 0x30);
      bVar7 = (uStack_1b16 != 0) * (uStack_1b16 < 0x100) * (char)(uVar195 >> 0x10) -
              (0xff < uStack_1b16);
      bVar15 = (uStack_1b12 != 0) * (uStack_1b12 < 0x100) * (char)(uVar195 >> 0x30) -
               (0xff < uStack_1b12);
      bVar16 = (uStack_1b0e != 0) * (uStack_1b0e < 0x100) * (char)(uVar230 >> 0x10) -
               (0xff < uStack_1b0e);
      bVar26 = (uStack_1b0a != 0) * (uStack_1b0a < 0x100) * (char)(uVar230 >> 0x30) -
               (0xff < uStack_1b0a);
      bVar23 = (uStack_1b26 != 0) * (uStack_1b26 < 0x100) * (char)(uVar158 >> 0x10) -
               (0xff < uStack_1b26);
      bVar20 = (uStack_1b22 != 0) * (uStack_1b22 < 0x100) * (char)(uVar158 >> 0x30) -
               (0xff < uStack_1b22);
      bVar21 = (uStack_1b1e != 0) * (uStack_1b1e < 0x100) * (char)(uVar170 >> 0x10) -
               (0xff < uStack_1b1e);
      bVar24 = (uStack_1b1a != 0) * (uStack_1b1a < 0x100) * (char)(uVar170 >> 0x30) -
               (0xff < uStack_1b1a);
      uVar196 = (ushort)(((uint)bVar121 << 0x18) >> 0x18);
      uVar198 = (ushort)(((uint6)bVar119 << 0x28) >> 0x28);
      uVar203 = (ushort)(((ulong)bVar123 << 0x38) >> 0x38);
      uVar231 = (ushort)(((uint)bVar115 << 0x18) >> 0x18);
      uVar237 = (ushort)(((uint6)bVar107 << 0x28) >> 0x28);
      uVar243 = (ushort)(((ulong)bVar109 << 0x38) >> 0x38);
      uVar173 = (ushort)(((uint)bVar100 << 0x18) >> 0x18);
      uVar174 = (ushort)(((uint6)bVar102 << 0x28) >> 0x28);
      uVar208 = (ushort)(((ulong)bVar104 << 0x38) >> 0x38);
      uVar209 = (ushort)(((uint)bVar112 << 0x18) >> 0x18);
      uVar171 = (ushort)(((uint6)bVar108 << 0x28) >> 0x28);
      uVar172 = (ushort)(((ulong)bVar106 << 0x38) >> 0x38);
      bVar105 = (uVar196 != 0) * (uVar196 < 0x100) * bVar121 - (0xff < uVar196);
      bVar111 = (uVar203 != 0) * (uVar203 < 0x100) * bVar123 - (0xff < uVar203);
      bVar71 = (uVar231 != 0) * (uVar231 < 0x100) * bVar115 - (0xff < uVar231);
      bVar99 = (uVar243 != 0) * (uVar243 < 0x100) * bVar109 - (0xff < uVar243);
      bVar67 = (uVar173 != 0) * (uVar173 < 0x100) * bVar100 - (0xff < uVar173);
      bVar63 = (uVar208 != 0) * (uVar208 < 0x100) * bVar104 - (0xff < uVar208);
      bVar59 = (uVar209 != 0) * (uVar209 < 0x100) * bVar112 - (0xff < uVar209);
      bVar57 = (uVar172 != 0) * (uVar172 < 0x100) * bVar106 - (0xff < uVar172);
      uVar231 = (ushort)(((uint)bVar60 << 0x18) >> 0x18);
      uVar199 = (ushort)(((uint6)bVar53 << 0x28) >> 0x28);
      uVar243 = (ushort)(((ulong)bVar58 << 0x38) >> 0x38);
      uVar232 = (ushort)(((uint)bVar17 << 0x18) >> 0x18);
      uVar238 = (ushort)(((uint6)bVar13 << 0x28) >> 0x28);
      uVar244 = (ushort)(((ulong)bVar5 << 0x38) >> 0x38);
      uVar173 = (ushort)(((uint)bVar114 << 0x18) >> 0x18);
      uVar208 = (ushort)(((uint6)bVar68 << 0x28) >> 0x28);
      uVar209 = (ushort)(((ulong)bVar72 << 0x38) >> 0x38);
      uVar172 = (ushort)(((uint)bVar66 << 0x18) >> 0x18);
      uVar203 = (ushort)(((uint6)bVar8 << 0x28) >> 0x28);
      uVar196 = (ushort)(((ulong)bVar6 << 0x38) >> 0x38);
      bVar60 = (uVar231 != 0) * (uVar231 < 0x100) * bVar60 - (0xff < uVar231);
      bVar58 = (uVar243 != 0) * (uVar243 < 0x100) * bVar58 - (0xff < uVar243);
      bVar17 = (uVar232 != 0) * (uVar232 < 0x100) * bVar17 - (0xff < uVar232);
      bVar5 = (uVar244 != 0) * (uVar244 < 0x100) * bVar5 - (0xff < uVar244);
      bVar100 = (uVar173 != 0) * (uVar173 < 0x100) * bVar114 - (0xff < uVar173);
      bVar72 = (uVar209 != 0) * (uVar209 < 0x100) * bVar72 - (0xff < uVar209);
      bVar66 = (uVar172 != 0) * (uVar172 < 0x100) * bVar66 - (0xff < uVar172);
      bVar6 = (uVar196 != 0) * (uVar196 < 0x100) * bVar6 - (0xff < uVar196);
      uVar232 = (ushort)(((uint)bVar22 << 0x18) >> 0x18);
      uVar244 = (ushort)(((uint6)bVar18 << 0x28) >> 0x28);
      uVar204 = (ushort)(((ulong)bVar14 << 0x38) >> 0x38);
      uVar233 = (ushort)(((uint)bVar52 << 0x18) >> 0x18);
      uVar239 = (ushort)(((uint6)bVar61 << 0x28) >> 0x28);
      uVar245 = (ushort)(((ulong)bVar65 << 0x38) >> 0x38);
      uVar173 = (ushort)(((uint)bVar103 << 0x18) >> 0x18);
      uVar209 = (ushort)(((uint6)bVar101 << 0x28) >> 0x28);
      uVar172 = (ushort)(((ulong)bVar69 << 0x38) >> 0x38);
      uVar196 = (ushort)(((uint)bVar55 << 0x18) >> 0x18);
      uVar231 = (ushort)(((uint6)bVar19 << 0x28) >> 0x28);
      uVar243 = (ushort)(((ulong)bVar9 << 0x38) >> 0x38);
      bVar109 = (uVar232 != 0) * (uVar232 < 0x100) * bVar22 - (0xff < uVar232);
      bVar14 = (uVar204 != 0) * (uVar204 < 0x100) * bVar14 - (0xff < uVar204);
      bVar112 = (uVar233 != 0) * (uVar233 < 0x100) * bVar52 - (0xff < uVar233);
      bVar104 = (uVar245 != 0) * (uVar245 < 0x100) * bVar65 - (0xff < uVar245);
      bVar65 = (uVar173 != 0) * (uVar173 < 0x100) * bVar103 - (0xff < uVar173);
      bVar52 = (uVar172 != 0) * (uVar172 < 0x100) * bVar69 - (0xff < uVar172);
      bVar22 = (uVar196 != 0) * (uVar196 < 0x100) * bVar55 - (0xff < uVar196);
      bVar9 = (uVar243 != 0) * (uVar243 < 0x100) * bVar9 - (0xff < uVar243);
      uVar193 = (ulong)CONCAT16((uStack_1acc != 0) * (uStack_1acc < 0x100) * (char)(uVar228 >> 0x20)
                                - (0xff < uStack_1acc),
                                CONCAT15(bVar116,CONCAT14((uStack_1ad0 != 0) * (uStack_1ad0 < 0x100)
                                                          * (char)uVar228 - (0xff < uStack_1ad0),
                                                          CONCAT13(bVar62,CONCAT12((uStack_1ad4 != 0
                                                                                   ) * (uStack_1ad4
                                                                                       < 0x100) *
                                                                                   (char)(uVar193 >>
                                                                                         0x20) -
                                                                                   (0xff < 
                                                  uStack_1ad4),
                                                  CONCAT11(bVar27,(local_1ad8 != 0) *
                                                                  (local_1ad8 < 0x100) *
                                                                  (char)uVar193 -
                                                                  (0xff < local_1ad8))))))) &
                0xff00ff00ff00ff;
      uVar228 = (ulong)CONCAT16((uStack_1adc != 0) * (uStack_1adc < 0x100) * (char)(uVar168 >> 0x20)
                                - (0xff < uStack_1adc),
                                CONCAT15(bVar122,CONCAT14((uStack_1ae0 != 0) * (uStack_1ae0 < 0x100)
                                                          * (char)uVar168 - (0xff < uStack_1ae0),
                                                          CONCAT13(bVar124,CONCAT12((uStack_1ae4 !=
                                                                                    0) * (
                                                  uStack_1ae4 < 0x100) * (char)(uVar156 >> 0x20) -
                                                  (0xff < uStack_1ae4),
                                                  CONCAT11(bVar120,(local_1ae8 != 0) *
                                                                   (local_1ae8 < 0x100) *
                                                                   (char)uVar156 -
                                                                   (0xff < local_1ae8))))))) &
                0xff00ff00ff00ff;
      uVar156 = (ulong)CONCAT16((uStack_1aec != 0) * (uStack_1aec < 0x100) * (char)(uVar229 >> 0x20)
                                - (0xff < uStack_1aec),
                                CONCAT15(bVar129,CONCAT14((uStack_1af0 != 0) * (uStack_1af0 < 0x100)
                                                          * (char)uVar229 - (0xff < uStack_1af0),
                                                          CONCAT13(bVar127,CONCAT12((uStack_1af4 !=
                                                                                    0) * (
                                                  uStack_1af4 < 0x100) * (char)(uVar194 >> 0x20) -
                                                  (0xff < uStack_1af4),
                                                  CONCAT11(bVar126,(local_1af8 != 0) *
                                                                   (local_1af8 < 0x100) *
                                                                   (char)uVar194 -
                                                                   (0xff < local_1af8))))))) &
                0xff00ff00ff00ff;
      uVar168 = (ulong)CONCAT16((uStack_1afc != 0) * (uStack_1afc < 0x100) * (char)(uVar169 >> 0x20)
                                - (0xff < uStack_1afc),
                                CONCAT15(bVar4,CONCAT14((uStack_1b00 != 0) * (uStack_1b00 < 0x100) *
                                                        (char)uVar169 - (0xff < uStack_1b00),
                                                        CONCAT13(bVar54,CONCAT12((uStack_1b04 != 0)
                                                                                 * (uStack_1b04 <
                                                                                   0x100) *
                                                                                 (char)(uVar157 >>
                                                                                       0x20) -
                                                                                 (0xff < uStack_1b04
                                                                                 ),CONCAT11(bVar2,(
                                                  local_1b08 != 0) * (local_1b08 < 0x100) *
                                                  (char)uVar157 - (0xff < local_1b08))))))) &
                0xff00ff00ff00ff;
      local_1b98 = (ushort)uVar193;
      uStack_1b96 = (ushort)(uVar193 >> 0x10);
      uStack_1b94 = (ushort)(uVar193 >> 0x20);
      uStack_1b92 = (ushort)(uVar193 >> 0x30);
      uStack_1b90 = (ushort)uVar228;
      uStack_1b8e = (ushort)(uVar228 >> 0x10);
      uStack_1b8c = (ushort)(uVar228 >> 0x20);
      uStack_1b8a = (ushort)(uVar228 >> 0x30);
      local_1ba8 = (ushort)uVar156;
      uStack_1ba6 = (ushort)(uVar156 >> 0x10);
      uStack_1ba4 = (ushort)(uVar156 >> 0x20);
      uStack_1ba2 = (ushort)(uVar156 >> 0x30);
      uStack_1ba0 = (ushort)uVar168;
      uStack_1b9e = (ushort)(uVar168 >> 0x10);
      uStack_1b9c = (ushort)(uVar168 >> 0x20);
      uStack_1b9a = (ushort)(uVar168 >> 0x30);
      uVar194 = (ulong)CONCAT16((uStack_1b0c != 0) * (uStack_1b0c < 0x100) * (char)(uVar230 >> 0x20)
                                - (0xff < uStack_1b0c),
                                CONCAT15(bVar16,CONCAT14((uStack_1b10 != 0) * (uStack_1b10 < 0x100)
                                                         * (char)uVar230 - (0xff < uStack_1b10),
                                                         CONCAT13(bVar15,CONCAT12((uStack_1b14 != 0)
                                                                                  * (uStack_1b14 <
                                                                                    0x100) *
                                                                                  (char)(uVar195 >>
                                                                                        0x20) -
                                                                                  (0xff < 
                                                  uStack_1b14),
                                                  CONCAT11(bVar7,(local_1b18 != 0) *
                                                                 (local_1b18 < 0x100) *
                                                                 (char)uVar195 - (0xff < local_1b18)
                                                          )))))) & 0xff00ff00ff00ff;
      uVar229 = (ulong)CONCAT16((uStack_1b1c != 0) * (uStack_1b1c < 0x100) * (char)(uVar170 >> 0x20)
                                - (0xff < uStack_1b1c),
                                CONCAT15(bVar21,CONCAT14((uStack_1b20 != 0) * (uStack_1b20 < 0x100)
                                                         * (char)uVar170 - (0xff < uStack_1b20),
                                                         CONCAT13(bVar20,CONCAT12((uStack_1b24 != 0)
                                                                                  * (uStack_1b24 <
                                                                                    0x100) *
                                                                                  (char)(uVar158 >>
                                                                                        0x20) -
                                                                                  (0xff < 
                                                  uStack_1b24),
                                                  CONCAT11(bVar23,(local_1b28 != 0) *
                                                                  (local_1b28 < 0x100) *
                                                                  (char)uVar158 -
                                                                  (0xff < local_1b28))))))) &
                0xff00ff00ff00ff;
      uVar157 = (ulong)CONCAT16((uVar237 != 0) * (uVar237 < 0x100) * bVar107 - (0xff < uVar237),
                                CONCAT15(bVar71,CONCAT14((bVar117 != 0) * (bVar117 < 0x100) *
                                                         bVar117 - (0xff < bVar117),
                                                         CONCAT13(bVar111,CONCAT12((uVar198 != 0) *
                                                                                   (uVar198 < 0x100)
                                                                                   * bVar119 -
                                                                                   (0xff < uVar198),
                                                                                   CONCAT11(bVar105,
                                                  (bVar125 != 0) * (bVar125 < 0x100) * bVar125 -
                                                  (0xff < bVar125))))))) & 0xff00ff00ff00ff;
      uVar169 = (ulong)CONCAT16((uVar171 != 0) * (uVar171 < 0x100) * bVar108 - (0xff < uVar171),
                                CONCAT15(bVar59,CONCAT14((bVar110 != 0) * (bVar110 < 0x100) *
                                                         bVar110 - (0xff < bVar110),
                                                         CONCAT13(bVar63,CONCAT12((uVar174 != 0) *
                                                                                  (uVar174 < 0x100)
                                                                                  * bVar102 -
                                                                                  (0xff < uVar174),
                                                                                  CONCAT11(bVar67,(
                                                  bVar98 != 0) * (bVar98 < 0x100) * bVar98 -
                                                  (0xff < bVar98))))))) & 0xff00ff00ff00ff;
      local_1bb8 = (ushort)uVar194;
      uStack_1bb6 = (ushort)(uVar194 >> 0x10);
      uStack_1bb4 = (ushort)(uVar194 >> 0x20);
      uStack_1bb2 = (ushort)(uVar194 >> 0x30);
      uStack_1bb0 = (ushort)uVar229;
      uStack_1bae = (ushort)(uVar229 >> 0x10);
      uStack_1bac = (ushort)(uVar229 >> 0x20);
      uStack_1baa = (ushort)(uVar229 >> 0x30);
      local_1bc8 = (ushort)uVar157;
      uStack_1bc6 = (ushort)(uVar157 >> 0x10);
      uStack_1bc4 = (ushort)(uVar157 >> 0x20);
      uStack_1bc2 = (ushort)(uVar157 >> 0x30);
      uStack_1bc0 = (ushort)uVar169;
      uStack_1bbe = (ushort)(uVar169 >> 0x10);
      uStack_1bbc = (ushort)(uVar169 >> 0x20);
      uStack_1bba = (ushort)(uVar169 >> 0x30);
      uVar195 = (ulong)CONCAT16((uVar238 != 0) * (uVar238 < 0x100) * bVar13 - (0xff < uVar238),
                                CONCAT15(bVar17,CONCAT14((bVar25 != 0) * (bVar25 < 0x100) * bVar25 -
                                                         (0xff < bVar25),
                                                         CONCAT13(bVar58,CONCAT12((uVar199 != 0) *
                                                                                  (uVar199 < 0x100)
                                                                                  * bVar53 -
                                                                                  (0xff < uVar199),
                                                                                  CONCAT11(bVar60,(
                                                  bVar11 != 0) * (bVar11 < 0x100) * bVar11 -
                                                  (0xff < bVar11))))))) & 0xff00ff00ff00ff;
      uVar230 = (ulong)CONCAT16((uVar203 != 0) * (uVar203 < 0x100) * bVar8 - (0xff < uVar203),
                                CONCAT15(bVar66,CONCAT14((bVar74 != 0) * (bVar74 < 0x100) * bVar74 -
                                                         (0xff < bVar74),
                                                         CONCAT13(bVar72,CONCAT12((uVar208 != 0) *
                                                                                  (uVar208 < 0x100)
                                                                                  * bVar68 -
                                                                                  (0xff < uVar208),
                                                                                  CONCAT11(bVar100,(
                                                  bVar64 != 0) * (bVar64 < 0x100) * bVar64 -
                                                  (0xff < bVar64))))))) & 0xff00ff00ff00ff;
      uVar158 = (ulong)CONCAT16((uVar239 != 0) * (uVar239 < 0x100) * bVar61 - (0xff < uVar239),
                                CONCAT15(bVar112,CONCAT14((bVar56 != 0) * (bVar56 < 0x100) * bVar56
                                                          - (0xff < bVar56),
                                                          CONCAT13(bVar14,CONCAT12((uVar244 != 0) *
                                                                                   (uVar244 < 0x100)
                                                                                   * bVar18 -
                                                                                   (0xff < uVar244),
                                                                                   CONCAT11(bVar109,
                                                  (bVar12 != 0) * (bVar12 < 0x100) * bVar12 -
                                                  (0xff < bVar12))))))) & 0xff00ff00ff00ff;
      uVar170 = (ulong)CONCAT16((uVar231 != 0) * (uVar231 < 0x100) * bVar19 - (0xff < uVar231),
                                CONCAT15(bVar22,CONCAT14((bVar113 != 0) * (bVar113 < 0x100) *
                                                         bVar113 - (0xff < bVar113),
                                                         CONCAT13(bVar52,CONCAT12((uVar209 != 0) *
                                                                                  (uVar209 < 0x100)
                                                                                  * bVar101 -
                                                                                  (0xff < uVar209),
                                                                                  CONCAT11(bVar65,(
                                                  bVar73 != 0) * (bVar73 < 0x100) * bVar73 -
                                                  (0xff < bVar73))))))) & 0xff00ff00ff00ff;
      local_1bd8 = (ushort)uVar195;
      uStack_1bd6 = (ushort)(uVar195 >> 0x10);
      uStack_1bd4 = (ushort)(uVar195 >> 0x20);
      uStack_1bd2 = (ushort)(uVar195 >> 0x30);
      uStack_1bd0 = (ushort)uVar230;
      uStack_1bce = (ushort)(uVar230 >> 0x10);
      uStack_1bcc = (ushort)(uVar230 >> 0x20);
      uStack_1bca = (ushort)(uVar230 >> 0x30);
      local_1be8 = (ushort)uVar158;
      uStack_1be6 = (ushort)(uVar158 >> 0x10);
      uStack_1be4 = (ushort)(uVar158 >> 0x20);
      uStack_1be2 = (ushort)(uVar158 >> 0x30);
      uStack_1be0 = (ushort)uVar170;
      uStack_1bde = (ushort)(uVar170 >> 0x10);
      uStack_1bdc = (ushort)(uVar170 >> 0x20);
      uStack_1bda = (ushort)(uVar170 >> 0x30);
      uVar239 = (ushort)(((uint)bVar62 << 0x18) >> 0x18);
      uVar200 = (ushort)(((uint6)bVar116 << 0x28) >> 0x28);
      uVar205 = (ushort)(((ulong)bVar118 << 0x38) >> 0x38);
      uVar234 = (ushort)(((uint)bVar124 << 0x18) >> 0x18);
      uVar240 = (ushort)(((uint6)bVar122 << 0x28) >> 0x28);
      uVar246 = (ushort)(((ulong)bVar128 << 0x38) >> 0x38);
      uVar173 = (ushort)(((uint)bVar127 << 0x18) >> 0x18);
      uVar209 = (ushort)(((uint6)bVar129 << 0x28) >> 0x28);
      uVar171 = (ushort)(((ulong)bVar70 << 0x38) >> 0x38);
      uVar243 = (ushort)(((uint)bVar54 << 0x18) >> 0x18);
      uVar199 = (ushort)(((uint6)bVar4 << 0x28) >> 0x28);
      uVar233 = (ushort)(((ulong)bVar10 << 0x38) >> 0x38);
      uVar245 = (ushort)(((uint)bVar15 << 0x18) >> 0x18);
      uVar201 = (ushort)(((uint6)bVar16 << 0x28) >> 0x28);
      uVar206 = (ushort)(((ulong)bVar26 << 0x38) >> 0x38);
      uVar235 = (ushort)(((uint)bVar20 << 0x18) >> 0x18);
      uVar241 = (ushort)(((uint6)bVar21 << 0x28) >> 0x28);
      uVar247 = (ushort)(((ulong)bVar24 << 0x38) >> 0x38);
      uVar174 = (ushort)(((uint)bVar111 << 0x18) >> 0x18);
      uVar172 = (ushort)(((uint6)bVar71 << 0x28) >> 0x28);
      uVar203 = (ushort)(((ulong)bVar99 << 0x38) >> 0x38);
      uVar232 = (ushort)(((uint)bVar63 << 0x18) >> 0x18);
      uVar244 = (ushort)(((uint6)bVar59 << 0x28) >> 0x28);
      uVar237 = (ushort)(((ulong)bVar57 << 0x38) >> 0x38);
      uVar197 = (ushort)(((uint)bVar58 << 0x18) >> 0x18);
      uVar202 = (ushort)(((uint6)bVar17 << 0x28) >> 0x28);
      uVar207 = (ushort)(((ulong)bVar5 << 0x38) >> 0x38);
      uVar236 = (ushort)(((uint)bVar72 << 0x18) >> 0x18);
      uVar242 = (ushort)(((uint6)bVar66 << 0x28) >> 0x28);
      uVar248 = (ushort)(((ulong)bVar6 << 0x38) >> 0x38);
      uVar208 = (ushort)(((uint)bVar14 << 0x18) >> 0x18);
      uVar196 = (ushort)(((uint6)bVar112 << 0x28) >> 0x28);
      uVar231 = (ushort)(((ulong)bVar104 << 0x38) >> 0x38);
      uVar198 = (ushort)(((uint)bVar52 << 0x18) >> 0x18);
      uVar204 = (ushort)(((uint6)bVar22 << 0x28) >> 0x28);
      uVar238 = (ushort)(((ulong)bVar9 << 0x38) >> 0x38);
      *(ulong *)rgb_ptr2 =
           CONCAT17((uStack_1b8a != 0) * (uStack_1b8a < 0x100) * (char)(uVar228 >> 0x30) -
                    (0xff < uStack_1b8a),
                    CONCAT16((uStack_1b8c != 0) * (uStack_1b8c < 0x100) * (char)(uVar228 >> 0x20) -
                             (0xff < uStack_1b8c),
                             CONCAT15((uStack_1b8e != 0) * (uStack_1b8e < 0x100) *
                                      (char)(uVar228 >> 0x10) - (0xff < uStack_1b8e),
                                      CONCAT14((uStack_1b90 != 0) * (uStack_1b90 < 0x100) *
                                               (char)uVar228 - (0xff < uStack_1b90),
                                               CONCAT13((uStack_1b92 != 0) * (uStack_1b92 < 0x100) *
                                                        (char)(uVar193 >> 0x30) -
                                                        (0xff < uStack_1b92),
                                                        CONCAT12((uStack_1b94 != 0) *
                                                                 (uStack_1b94 < 0x100) *
                                                                 (char)(uVar193 >> 0x20) -
                                                                 (0xff < uStack_1b94),
                                                                 CONCAT11((uStack_1b96 != 0) *
                                                                          (uStack_1b96 < 0x100) *
                                                                          (char)(uVar193 >> 0x10) -
                                                                          (0xff < uStack_1b96),
                                                                          (local_1b98 != 0) *
                                                                          (local_1b98 < 0x100) *
                                                                          (char)uVar193 -
                                                                          (0xff < local_1b98))))))))
      ;
      *(ulong *)(rgb_ptr2 + 8) =
           CONCAT17((uStack_1b9a != 0) * (uStack_1b9a < 0x100) * (char)(uVar168 >> 0x30) -
                    (0xff < uStack_1b9a),
                    CONCAT16((uStack_1b9c != 0) * (uStack_1b9c < 0x100) * (char)(uVar168 >> 0x20) -
                             (0xff < uStack_1b9c),
                             CONCAT15((uStack_1b9e != 0) * (uStack_1b9e < 0x100) *
                                      (char)(uVar168 >> 0x10) - (0xff < uStack_1b9e),
                                      CONCAT14((uStack_1ba0 != 0) * (uStack_1ba0 < 0x100) *
                                               (char)uVar168 - (0xff < uStack_1ba0),
                                               CONCAT13((uStack_1ba2 != 0) * (uStack_1ba2 < 0x100) *
                                                        (char)(uVar156 >> 0x30) -
                                                        (0xff < uStack_1ba2),
                                                        CONCAT12((uStack_1ba4 != 0) *
                                                                 (uStack_1ba4 < 0x100) *
                                                                 (char)(uVar156 >> 0x20) -
                                                                 (0xff < uStack_1ba4),
                                                                 CONCAT11((uStack_1ba6 != 0) *
                                                                          (uStack_1ba6 < 0x100) *
                                                                          (char)(uVar156 >> 0x10) -
                                                                          (0xff < uStack_1ba6),
                                                                          (local_1ba8 != 0) *
                                                                          (local_1ba8 < 0x100) *
                                                                          (char)uVar156 -
                                                                          (0xff < local_1ba8))))))))
      ;
      *(ulong *)(rgb_ptr2 + 0x10) =
           CONCAT17((uStack_1baa != 0) * (uStack_1baa < 0x100) * (char)(uVar229 >> 0x30) -
                    (0xff < uStack_1baa),
                    CONCAT16((uStack_1bac != 0) * (uStack_1bac < 0x100) * (char)(uVar229 >> 0x20) -
                             (0xff < uStack_1bac),
                             CONCAT15((uStack_1bae != 0) * (uStack_1bae < 0x100) *
                                      (char)(uVar229 >> 0x10) - (0xff < uStack_1bae),
                                      CONCAT14((uStack_1bb0 != 0) * (uStack_1bb0 < 0x100) *
                                               (char)uVar229 - (0xff < uStack_1bb0),
                                               CONCAT13((uStack_1bb2 != 0) * (uStack_1bb2 < 0x100) *
                                                        (char)(uVar194 >> 0x30) -
                                                        (0xff < uStack_1bb2),
                                                        CONCAT12((uStack_1bb4 != 0) *
                                                                 (uStack_1bb4 < 0x100) *
                                                                 (char)(uVar194 >> 0x20) -
                                                                 (0xff < uStack_1bb4),
                                                                 CONCAT11((uStack_1bb6 != 0) *
                                                                          (uStack_1bb6 < 0x100) *
                                                                          (char)(uVar194 >> 0x10) -
                                                                          (0xff < uStack_1bb6),
                                                                          (local_1bb8 != 0) *
                                                                          (local_1bb8 < 0x100) *
                                                                          (char)uVar194 -
                                                                          (0xff < local_1bb8))))))))
      ;
      *(ulong *)(rgb_ptr2 + 0x18) =
           CONCAT17((uStack_1bba != 0) * (uStack_1bba < 0x100) * (char)(uVar169 >> 0x30) -
                    (0xff < uStack_1bba),
                    CONCAT16((uStack_1bbc != 0) * (uStack_1bbc < 0x100) * (char)(uVar169 >> 0x20) -
                             (0xff < uStack_1bbc),
                             CONCAT15((uStack_1bbe != 0) * (uStack_1bbe < 0x100) *
                                      (char)(uVar169 >> 0x10) - (0xff < uStack_1bbe),
                                      CONCAT14((uStack_1bc0 != 0) * (uStack_1bc0 < 0x100) *
                                               (char)uVar169 - (0xff < uStack_1bc0),
                                               CONCAT13((uStack_1bc2 != 0) * (uStack_1bc2 < 0x100) *
                                                        (char)(uVar157 >> 0x30) -
                                                        (0xff < uStack_1bc2),
                                                        CONCAT12((uStack_1bc4 != 0) *
                                                                 (uStack_1bc4 < 0x100) *
                                                                 (char)(uVar157 >> 0x20) -
                                                                 (0xff < uStack_1bc4),
                                                                 CONCAT11((uStack_1bc6 != 0) *
                                                                          (uStack_1bc6 < 0x100) *
                                                                          (char)(uVar157 >> 0x10) -
                                                                          (0xff < uStack_1bc6),
                                                                          (local_1bc8 != 0) *
                                                                          (local_1bc8 < 0x100) *
                                                                          (char)uVar157 -
                                                                          (0xff < local_1bc8))))))))
      ;
      *(ulong *)(rgb_ptr2 + 0x20) =
           CONCAT17((uStack_1bca != 0) * (uStack_1bca < 0x100) * (char)(uVar230 >> 0x30) -
                    (0xff < uStack_1bca),
                    CONCAT16((uStack_1bcc != 0) * (uStack_1bcc < 0x100) * (char)(uVar230 >> 0x20) -
                             (0xff < uStack_1bcc),
                             CONCAT15((uStack_1bce != 0) * (uStack_1bce < 0x100) *
                                      (char)(uVar230 >> 0x10) - (0xff < uStack_1bce),
                                      CONCAT14((uStack_1bd0 != 0) * (uStack_1bd0 < 0x100) *
                                               (char)uVar230 - (0xff < uStack_1bd0),
                                               CONCAT13((uStack_1bd2 != 0) * (uStack_1bd2 < 0x100) *
                                                        (char)(uVar195 >> 0x30) -
                                                        (0xff < uStack_1bd2),
                                                        CONCAT12((uStack_1bd4 != 0) *
                                                                 (uStack_1bd4 < 0x100) *
                                                                 (char)(uVar195 >> 0x20) -
                                                                 (0xff < uStack_1bd4),
                                                                 CONCAT11((uStack_1bd6 != 0) *
                                                                          (uStack_1bd6 < 0x100) *
                                                                          (char)(uVar195 >> 0x10) -
                                                                          (0xff < uStack_1bd6),
                                                                          (local_1bd8 != 0) *
                                                                          (local_1bd8 < 0x100) *
                                                                          (char)uVar195 -
                                                                          (0xff < local_1bd8))))))))
      ;
      *(ulong *)(rgb_ptr2 + 0x28) =
           CONCAT17((uStack_1bda != 0) * (uStack_1bda < 0x100) * (char)(uVar170 >> 0x30) -
                    (0xff < uStack_1bda),
                    CONCAT16((uStack_1bdc != 0) * (uStack_1bdc < 0x100) * (char)(uVar170 >> 0x20) -
                             (0xff < uStack_1bdc),
                             CONCAT15((uStack_1bde != 0) * (uStack_1bde < 0x100) *
                                      (char)(uVar170 >> 0x10) - (0xff < uStack_1bde),
                                      CONCAT14((uStack_1be0 != 0) * (uStack_1be0 < 0x100) *
                                               (char)uVar170 - (0xff < uStack_1be0),
                                               CONCAT13((uStack_1be2 != 0) * (uStack_1be2 < 0x100) *
                                                        (char)(uVar158 >> 0x30) -
                                                        (0xff < uStack_1be2),
                                                        CONCAT12((uStack_1be4 != 0) *
                                                                 (uStack_1be4 < 0x100) *
                                                                 (char)(uVar158 >> 0x20) -
                                                                 (0xff < uStack_1be4),
                                                                 CONCAT11((uStack_1be6 != 0) *
                                                                          (uStack_1be6 < 0x100) *
                                                                          (char)(uVar158 >> 0x10) -
                                                                          (0xff < uStack_1be6),
                                                                          (local_1be8 != 0) *
                                                                          (local_1be8 < 0x100) *
                                                                          (char)uVar158 -
                                                                          (0xff < local_1be8))))))))
      ;
      *(ulong *)(rgb_ptr2 + 0x30) =
           CONCAT17((uVar246 != 0) * (uVar246 < 0x100) * bVar128 - (0xff < uVar246),
                    CONCAT16((uVar240 != 0) * (uVar240 < 0x100) * bVar122 - (0xff < uVar240),
                             CONCAT15((uVar234 != 0) * (uVar234 < 0x100) * bVar124 -
                                      (0xff < uVar234),
                                      CONCAT14((bVar120 != 0) * (bVar120 < 0x100) * bVar120 -
                                               (0xff < bVar120),
                                               CONCAT13((uVar205 != 0) * (uVar205 < 0x100) * bVar118
                                                        - (0xff < uVar205),
                                                        CONCAT12((uVar200 != 0) * (uVar200 < 0x100)
                                                                 * bVar116 - (0xff < uVar200),
                                                                 CONCAT11((uVar239 != 0) *
                                                                          (uVar239 < 0x100) * bVar62
                                                                          - (0xff < uVar239),
                                                                          (bVar27 != 0) *
                                                                          (bVar27 < 0x100) * bVar27
                                                                          - (0xff < bVar27))))))));
      *(ulong *)(rgb_ptr2 + 0x38) =
           CONCAT17((uVar233 != 0) * (uVar233 < 0x100) * bVar10 - (0xff < uVar233),
                    CONCAT16((uVar199 != 0) * (uVar199 < 0x100) * bVar4 - (0xff < uVar199),
                             CONCAT15((uVar243 != 0) * (uVar243 < 0x100) * bVar54 - (0xff < uVar243)
                                      ,CONCAT14((bVar2 != 0) * (bVar2 < 0x100) * bVar2 -
                                                (0xff < bVar2),
                                                CONCAT13((uVar171 != 0) * (uVar171 < 0x100) * bVar70
                                                         - (0xff < uVar171),
                                                         CONCAT12((uVar209 != 0) * (uVar209 < 0x100)
                                                                  * bVar129 - (0xff < uVar209),
                                                                  CONCAT11((uVar173 != 0) *
                                                                           (uVar173 < 0x100) *
                                                                           bVar127 - (0xff < uVar173
                                                                                     ),
                                                                           (bVar126 != 0) *
                                                                           (bVar126 < 0x100) *
                                                                           bVar126 - (0xff < bVar126
                                                                                     ))))))));
      *(ulong *)(rgb_ptr2 + 0x40) =
           CONCAT17((uVar247 != 0) * (uVar247 < 0x100) * bVar24 - (0xff < uVar247),
                    CONCAT16((uVar241 != 0) * (uVar241 < 0x100) * bVar21 - (0xff < uVar241),
                             CONCAT15((uVar235 != 0) * (uVar235 < 0x100) * bVar20 - (0xff < uVar235)
                                      ,CONCAT14((bVar23 != 0) * (bVar23 < 0x100) * bVar23 -
                                                (0xff < bVar23),
                                                CONCAT13((uVar206 != 0) * (uVar206 < 0x100) * bVar26
                                                         - (0xff < uVar206),
                                                         CONCAT12((uVar201 != 0) * (uVar201 < 0x100)
                                                                  * bVar16 - (0xff < uVar201),
                                                                  CONCAT11((uVar245 != 0) *
                                                                           (uVar245 < 0x100) *
                                                                           bVar15 - (0xff < uVar245)
                                                                           ,(bVar7 != 0) *
                                                                            (bVar7 < 0x100) * bVar7
                                                                            - (0xff < bVar7))))))));
      *(ulong *)(rgb_ptr2 + 0x48) =
           CONCAT17((uVar237 != 0) * (uVar237 < 0x100) * bVar57 - (0xff < uVar237),
                    CONCAT16((uVar244 != 0) * (uVar244 < 0x100) * bVar59 - (0xff < uVar244),
                             CONCAT15((uVar232 != 0) * (uVar232 < 0x100) * bVar63 - (0xff < uVar232)
                                      ,CONCAT14((bVar67 != 0) * (bVar67 < 0x100) * bVar67 -
                                                (0xff < bVar67),
                                                CONCAT13((uVar203 != 0) * (uVar203 < 0x100) * bVar99
                                                         - (0xff < uVar203),
                                                         CONCAT12((uVar172 != 0) * (uVar172 < 0x100)
                                                                  * bVar71 - (0xff < uVar172),
                                                                  CONCAT11((uVar174 != 0) *
                                                                           (uVar174 < 0x100) *
                                                                           bVar111 - (0xff < uVar174
                                                                                     ),
                                                                           (bVar105 != 0) *
                                                                           (bVar105 < 0x100) *
                                                                           bVar105 - (0xff < bVar105
                                                                                     ))))))));
      *(ulong *)(rgb_ptr2 + 0x50) =
           CONCAT17((uVar248 != 0) * (uVar248 < 0x100) * bVar6 - (0xff < uVar248),
                    CONCAT16((uVar242 != 0) * (uVar242 < 0x100) * bVar66 - (0xff < uVar242),
                             CONCAT15((uVar236 != 0) * (uVar236 < 0x100) * bVar72 - (0xff < uVar236)
                                      ,CONCAT14((bVar100 != 0) * (bVar100 < 0x100) * bVar100 -
                                                (0xff < bVar100),
                                                CONCAT13((uVar207 != 0) * (uVar207 < 0x100) * bVar5
                                                         - (0xff < uVar207),
                                                         CONCAT12((uVar202 != 0) * (uVar202 < 0x100)
                                                                  * bVar17 - (0xff < uVar202),
                                                                  CONCAT11((uVar197 != 0) *
                                                                           (uVar197 < 0x100) *
                                                                           bVar58 - (0xff < uVar197)
                                                                           ,(bVar60 != 0) *
                                                                            (bVar60 < 0x100) *
                                                                            bVar60 - (0xff < bVar60)
                                                                          )))))));
      *(ulong *)(rgb_ptr2 + 0x58) =
           CONCAT17((uVar238 != 0) * (uVar238 < 0x100) * bVar9 - (0xff < uVar238),
                    CONCAT16((uVar204 != 0) * (uVar204 < 0x100) * bVar22 - (0xff < uVar204),
                             CONCAT15((uVar198 != 0) * (uVar198 < 0x100) * bVar52 - (0xff < uVar198)
                                      ,CONCAT14((bVar65 != 0) * (bVar65 < 0x100) * bVar65 -
                                                (0xff < bVar65),
                                                CONCAT13((uVar231 != 0) * (uVar231 < 0x100) *
                                                         bVar104 - (0xff < uVar231),
                                                         CONCAT12((uVar196 != 0) * (uVar196 < 0x100)
                                                                  * bVar112 - (0xff < uVar196),
                                                                  CONCAT11((uVar208 != 0) *
                                                                           (uVar208 < 0x100) *
                                                                           bVar14 - (0xff < uVar208)
                                                                           ,(bVar109 != 0) *
                                                                            (bVar109 < 0x100) *
                                                                            bVar109 - (0xff < 
                                                  bVar109))))))));
      uVar193 = (ulong)CONCAT16((0 < sStack_2cbc) * (sStack_2cbc < 0x100) * (char)sStack_2cbc -
                                (0xff < sStack_2cbc),
                                CONCAT15(bVar30,CONCAT14((0 < sVar216) * (sVar216 < 0x100) *
                                                         (char)sVar216 - (0xff < sVar216),
                                                         CONCAT13(bVar29,CONCAT12((0 < sStack_2cc4)
                                                                                  * (sStack_2cc4 <
                                                                                    0x100) *
                                                                                  (char)sStack_2cc4
                                                                                  - (0xff < 
                                                  sStack_2cc4),
                                                  CONCAT11(bVar28,(0 < sVar181) * (sVar181 < 0x100)
                                                                  * (char)sVar181 - (0xff < sVar181)
                                                          )))))) & 0xff00ff00ff00ff;
      uVar228 = (ulong)CONCAT16((0 < sStack_2cfc) * (sStack_2cfc < 0x100) * (char)sStack_2cfc -
                                (0xff < sStack_2cfc),
                                CONCAT15(bVar34,CONCAT14((0 < sVar219) * (sVar219 < 0x100) *
                                                         (char)sVar219 - (0xff < sVar219),
                                                         CONCAT13(bVar33,CONCAT12((0 < sStack_2d04)
                                                                                  * (sStack_2d04 <
                                                                                    0x100) *
                                                                                  (char)sStack_2d04
                                                                                  - (0xff < 
                                                  sStack_2d04),
                                                  CONCAT11(bVar32,(0 < sVar184) * (sVar184 < 0x100)
                                                                  * (char)sVar184 - (0xff < sVar184)
                                                          )))))) & 0xff00ff00ff00ff;
      uVar156 = (ulong)CONCAT16((0 < sStack_2ddc) * (sStack_2ddc < 0x100) * (char)sStack_2ddc -
                                (0xff < sStack_2ddc),
                                CONCAT15(bVar76,CONCAT14((0 < sVar162) * (sVar162 < 0x100) *
                                                         (char)sVar162 - (0xff < sVar162),
                                                         CONCAT13(bVar75,CONCAT12((0 < sStack_2de4)
                                                                                  * (sStack_2de4 <
                                                                                    0x100) *
                                                                                  (char)sStack_2de4
                                                                                  - (0xff < 
                                                  sStack_2de4),
                                                  CONCAT11(bVar1,(0 < sVar150) * (sVar150 < 0x100) *
                                                                 (char)sVar150 - (0xff < sVar150))))
                                                  ))) & 0xff00ff00ff00ff;
      uVar168 = (ulong)CONCAT16((0 < sStack_2e1c) * (sStack_2e1c < 0x100) * (char)sStack_2e1c -
                                (0xff < sStack_2e1c),
                                CONCAT15(bVar80,CONCAT14((0 < sVar165) * (sVar165 < 0x100) *
                                                         (char)sVar165 - (0xff < sVar165),
                                                         CONCAT13(bVar79,CONCAT12((0 < sStack_2e24)
                                                                                  * (sStack_2e24 <
                                                                                    0x100) *
                                                                                  (char)sStack_2e24
                                                                                  - (0xff < 
                                                  sStack_2e24),
                                                  CONCAT11(bVar78,(0 < sVar153) * (sVar153 < 0x100)
                                                                  * (char)sVar153 - (0xff < sVar153)
                                                          )))))) & 0xff00ff00ff00ff;
      local_1c58 = (ushort)uVar193;
      uStack_1c56 = (ushort)(uVar193 >> 0x10);
      uStack_1c54 = (ushort)(uVar193 >> 0x20);
      uStack_1c52 = (ushort)(uVar193 >> 0x30);
      uStack_1c50 = (ushort)uVar228;
      uStack_1c4e = (ushort)(uVar228 >> 0x10);
      uStack_1c4c = (ushort)(uVar228 >> 0x20);
      uStack_1c4a = (ushort)(uVar228 >> 0x30);
      local_1c68 = (ushort)uVar156;
      uStack_1c66 = (ushort)(uVar156 >> 0x10);
      uStack_1c64 = (ushort)(uVar156 >> 0x20);
      uStack_1c62 = (ushort)(uVar156 >> 0x30);
      uStack_1c60 = (ushort)uVar168;
      uStack_1c5e = (ushort)(uVar168 >> 0x10);
      uStack_1c5c = (ushort)(uVar168 >> 0x20);
      uStack_1c5a = (ushort)(uVar168 >> 0x30);
      bVar5 = (uStack_1c56 != 0) * (uStack_1c56 < 0x100) * (char)(uVar193 >> 0x10) -
              (0xff < uStack_1c56);
      bVar2 = (uStack_1c52 != 0) * (uStack_1c52 < 0x100) * (char)(uVar193 >> 0x30) -
              (0xff < uStack_1c52);
      bVar7 = (uStack_1c4e != 0) * (uStack_1c4e < 0x100) * (char)(uVar228 >> 0x10) -
              (0xff < uStack_1c4e);
      bVar8 = (uStack_1c4a != 0) * (uStack_1c4a < 0x100) * (char)(uVar228 >> 0x30) -
              (0xff < uStack_1c4a);
      bVar9 = (uStack_1c66 != 0) * (uStack_1c66 < 0x100) * (char)(uVar156 >> 0x10) -
              (0xff < uStack_1c66);
      bVar10 = (uStack_1c62 != 0) * (uStack_1c62 < 0x100) * (char)(uVar156 >> 0x30) -
               (0xff < uStack_1c62);
      bVar11 = (uStack_1c5e != 0) * (uStack_1c5e < 0x100) * (char)(uVar168 >> 0x10) -
               (0xff < uStack_1c5e);
      bVar6 = (uStack_1c5a != 0) * (uStack_1c5a < 0x100) * (char)(uVar168 >> 0x30) -
              (0xff < uStack_1c5a);
      uVar194 = (ulong)CONCAT16((0 < sStack_204c) * (sStack_204c < 0x100) * (char)sStack_204c -
                                (0xff < sStack_204c),
                                CONCAT15(bVar38,CONCAT14((0 < sVar217) * (sVar217 < 0x100) *
                                                         (char)sVar217 - (0xff < sVar217),
                                                         CONCAT13(bVar37,CONCAT12((0 < sStack_2054)
                                                                                  * (sStack_2054 <
                                                                                    0x100) *
                                                                                  (char)sStack_2054
                                                                                  - (0xff < 
                                                  sStack_2054),
                                                  CONCAT11(bVar36,(0 < sVar182) * (sVar182 < 0x100)
                                                                  * (char)sVar182 - (0xff < sVar182)
                                                          )))))) & 0xff00ff00ff00ff;
      uVar229 = (ulong)CONCAT16((0 < sStack_206c) * (sStack_206c < 0x100) * (char)sStack_206c -
                                (0xff < sStack_206c),
                                CONCAT15(bVar42,CONCAT14((0 < sVar220) * (sVar220 < 0x100) *
                                                         (char)sVar220 - (0xff < sVar220),
                                                         CONCAT13(bVar41,CONCAT12((0 < sStack_2074)
                                                                                  * (sStack_2074 <
                                                                                    0x100) *
                                                                                  (char)sStack_2074
                                                                                  - (0xff < 
                                                  sStack_2074),
                                                  CONCAT11(bVar40,(0 < sVar185) * (sVar185 < 0x100)
                                                                  * (char)sVar185 - (0xff < sVar185)
                                                          )))))) & 0xff00ff00ff00ff;
      uVar157 = (ulong)CONCAT16((0 < sStack_20cc) * (sStack_20cc < 0x100) * (char)sStack_20cc -
                                (0xff < sStack_20cc),
                                CONCAT15(bVar84,CONCAT14((0 < sVar163) * (sVar163 < 0x100) *
                                                         (char)sVar163 - (0xff < sVar163),
                                                         CONCAT13(bVar83,CONCAT12((0 < sStack_20d4)
                                                                                  * (sStack_20d4 <
                                                                                    0x100) *
                                                                                  (char)sStack_20d4
                                                                                  - (0xff < 
                                                  sStack_20d4),
                                                  CONCAT11(bVar82,(0 < sVar151) * (sVar151 < 0x100)
                                                                  * (char)sVar151 - (0xff < sVar151)
                                                          )))))) & 0xff00ff00ff00ff;
      uVar169 = (ulong)CONCAT16((0 < sStack_20ec) * (sStack_20ec < 0x100) * (char)sStack_20ec -
                                (0xff < sStack_20ec),
                                CONCAT15(bVar88,CONCAT14((0 < sVar166) * (sVar166 < 0x100) *
                                                         (char)sVar166 - (0xff < sVar166),
                                                         CONCAT13(bVar87,CONCAT12((0 < sStack_20f4)
                                                                                  * (sStack_20f4 <
                                                                                    0x100) *
                                                                                  (char)sStack_20f4
                                                                                  - (0xff < 
                                                  sStack_20f4),
                                                  CONCAT11(bVar86,(0 < sVar154) * (sVar154 < 0x100)
                                                                  * (char)sVar154 - (0xff < sVar154)
                                                          )))))) & 0xff00ff00ff00ff;
      local_1c78 = (ushort)uVar194;
      uStack_1c76 = (ushort)(uVar194 >> 0x10);
      uStack_1c74 = (ushort)(uVar194 >> 0x20);
      uStack_1c72 = (ushort)(uVar194 >> 0x30);
      uStack_1c70 = (ushort)uVar229;
      uStack_1c6e = (ushort)(uVar229 >> 0x10);
      uStack_1c6c = (ushort)(uVar229 >> 0x20);
      uStack_1c6a = (ushort)(uVar229 >> 0x30);
      local_1c88 = (ushort)uVar157;
      uStack_1c86 = (ushort)(uVar157 >> 0x10);
      uStack_1c84 = (ushort)(uVar157 >> 0x20);
      uStack_1c82 = (ushort)(uVar157 >> 0x30);
      uStack_1c80 = (ushort)uVar169;
      uStack_1c7e = (ushort)(uVar169 >> 0x10);
      uStack_1c7c = (ushort)(uVar169 >> 0x20);
      uStack_1c7a = (ushort)(uVar169 >> 0x30);
      bVar4 = (uStack_1c76 != 0) * (uStack_1c76 < 0x100) * (char)(uVar194 >> 0x10) -
              (0xff < uStack_1c76);
      bVar12 = (uStack_1c72 != 0) * (uStack_1c72 < 0x100) * (char)(uVar194 >> 0x30) -
               (0xff < uStack_1c72);
      bVar13 = (uStack_1c6e != 0) * (uStack_1c6e < 0x100) * (char)(uVar229 >> 0x10) -
               (0xff < uStack_1c6e);
      bVar14 = (uStack_1c6a != 0) * (uStack_1c6a < 0x100) * (char)(uVar229 >> 0x30) -
               (0xff < uStack_1c6a);
      bVar15 = (uStack_1c86 != 0) * (uStack_1c86 < 0x100) * (char)(uVar157 >> 0x10) -
               (0xff < uStack_1c86);
      bVar16 = (uStack_1c82 != 0) * (uStack_1c82 < 0x100) * (char)(uVar157 >> 0x30) -
               (0xff < uStack_1c82);
      bVar17 = (uStack_1c7e != 0) * (uStack_1c7e < 0x100) * (char)(uVar169 >> 0x10) -
               (0xff < uStack_1c7e);
      bVar18 = (uStack_1c7a != 0) * (uStack_1c7a < 0x100) * (char)(uVar169 >> 0x30) -
               (0xff < uStack_1c7a);
      uVar195 = (ulong)CONCAT16((0 < sStack_2cdc) * (sStack_2cdc < 0x100) * (char)sStack_2cdc -
                                (0xff < sStack_2cdc),
                                CONCAT15(bVar46,CONCAT14((0 < sVar218) * (sVar218 < 0x100) *
                                                         (char)sVar218 - (0xff < sVar218),
                                                         CONCAT13(bVar45,CONCAT12((0 < sStack_2ce4)
                                                                                  * (sStack_2ce4 <
                                                                                    0x100) *
                                                                                  (char)sStack_2ce4
                                                                                  - (0xff < 
                                                  sStack_2ce4),
                                                  CONCAT11(bVar44,(0 < sVar183) * (sVar183 < 0x100)
                                                                  * (char)sVar183 - (0xff < sVar183)
                                                          )))))) & 0xff00ff00ff00ff;
      uVar230 = (ulong)CONCAT16((0 < sStack_2d1c) * (sStack_2d1c < 0x100) * (char)sStack_2d1c -
                                (0xff < sStack_2d1c),
                                CONCAT15(bVar50,CONCAT14((0 < sVar221) * (sVar221 < 0x100) *
                                                         (char)sVar221 - (0xff < sVar221),
                                                         CONCAT13(bVar49,CONCAT12((0 < sStack_2d24)
                                                                                  * (sStack_2d24 <
                                                                                    0x100) *
                                                                                  (char)sStack_2d24
                                                                                  - (0xff < 
                                                  sStack_2d24),
                                                  CONCAT11(bVar48,(0 < sVar186) * (sVar186 < 0x100)
                                                                  * (char)sVar186 - (0xff < sVar186)
                                                          )))))) & 0xff00ff00ff00ff;
      uVar158 = (ulong)CONCAT16((0 < sStack_2dfc) * (sStack_2dfc < 0x100) * (char)sStack_2dfc -
                                (0xff < sStack_2dfc),
                                CONCAT15(bVar92,CONCAT14((0 < sVar164) * (sVar164 < 0x100) *
                                                         (char)sVar164 - (0xff < sVar164),
                                                         CONCAT13(bVar91,CONCAT12((0 < sStack_2e04)
                                                                                  * (sStack_2e04 <
                                                                                    0x100) *
                                                                                  (char)sStack_2e04
                                                                                  - (0xff < 
                                                  sStack_2e04),
                                                  CONCAT11(bVar90,(0 < sVar152) * (sVar152 < 0x100)
                                                                  * (char)sVar152 - (0xff < sVar152)
                                                          )))))) & 0xff00ff00ff00ff;
      uVar170 = (ulong)CONCAT16((0 < sStack_2e3c) * (sStack_2e3c < 0x100) * (char)sStack_2e3c -
                                (0xff < sStack_2e3c),
                                CONCAT15(bVar96,CONCAT14((0 < sVar167) * (sVar167 < 0x100) *
                                                         (char)sVar167 - (0xff < sVar167),
                                                         CONCAT13(bVar95,CONCAT12((0 < sStack_2e44)
                                                                                  * (sStack_2e44 <
                                                                                    0x100) *
                                                                                  (char)sStack_2e44
                                                                                  - (0xff < 
                                                  sStack_2e44),
                                                  CONCAT11(bVar94,(0 < sVar155) * (sVar155 < 0x100)
                                                                  * (char)sVar155 - (0xff < sVar155)
                                                          )))))) & 0xff00ff00ff00ff;
      local_1c98 = (ushort)uVar195;
      uStack_1c96 = (ushort)(uVar195 >> 0x10);
      uStack_1c94 = (ushort)(uVar195 >> 0x20);
      uStack_1c92 = (ushort)(uVar195 >> 0x30);
      uStack_1c90 = (ushort)uVar230;
      uStack_1c8e = (ushort)(uVar230 >> 0x10);
      uStack_1c8c = (ushort)(uVar230 >> 0x20);
      uStack_1c8a = (ushort)(uVar230 >> 0x30);
      local_1ca8 = (ushort)uVar158;
      uStack_1ca6 = (ushort)(uVar158 >> 0x10);
      uStack_1ca4 = (ushort)(uVar158 >> 0x20);
      uStack_1ca2 = (ushort)(uVar158 >> 0x30);
      uStack_1ca0 = (ushort)uVar170;
      uStack_1c9e = (ushort)(uVar170 >> 0x10);
      uStack_1c9c = (ushort)(uVar170 >> 0x20);
      uStack_1c9a = (ushort)(uVar170 >> 0x30);
      bVar20 = (uStack_1c96 != 0) * (uStack_1c96 < 0x100) * (char)(uVar195 >> 0x10) -
               (0xff < uStack_1c96);
      bVar19 = (uStack_1c92 != 0) * (uStack_1c92 < 0x100) * (char)(uVar195 >> 0x30) -
               (0xff < uStack_1c92);
      bVar23 = (uStack_1c8e != 0) * (uStack_1c8e < 0x100) * (char)(uVar230 >> 0x10) -
               (0xff < uStack_1c8e);
      bVar25 = (uStack_1c8a != 0) * (uStack_1c8a < 0x100) * (char)(uVar230 >> 0x30) -
               (0xff < uStack_1c8a);
      bVar21 = (uStack_1ca6 != 0) * (uStack_1ca6 < 0x100) * (char)(uVar158 >> 0x10) -
               (0xff < uStack_1ca6);
      bVar26 = (uStack_1ca2 != 0) * (uStack_1ca2 < 0x100) * (char)(uVar158 >> 0x30) -
               (0xff < uStack_1ca2);
      bVar27 = (uStack_1c9e != 0) * (uStack_1c9e < 0x100) * (char)(uVar170 >> 0x10) -
               (0xff < uStack_1c9e);
      bVar22 = (uStack_1c9a != 0) * (uStack_1c9a < 0x100) * (char)(uVar170 >> 0x30) -
               (0xff < uStack_1c9a);
      uVar196 = (ushort)(((uint)bVar29 << 0x18) >> 0x18);
      uVar198 = (ushort)(((uint6)bVar30 << 0x28) >> 0x28);
      uVar203 = (ushort)(((ulong)bVar31 << 0x38) >> 0x38);
      uVar231 = (ushort)(((uint)bVar33 << 0x18) >> 0x18);
      uVar237 = (ushort)(((uint6)bVar34 << 0x28) >> 0x28);
      uVar243 = (ushort)(((ulong)bVar35 << 0x38) >> 0x38);
      uVar173 = (ushort)(((uint)bVar75 << 0x18) >> 0x18);
      uVar174 = (ushort)(((uint6)bVar76 << 0x28) >> 0x28);
      uVar208 = (ushort)(((ulong)bVar77 << 0x38) >> 0x38);
      uVar209 = (ushort)(((uint)bVar79 << 0x18) >> 0x18);
      uVar171 = (ushort)(((uint6)bVar80 << 0x28) >> 0x28);
      uVar172 = (ushort)(((ulong)bVar81 << 0x38) >> 0x38);
      bVar24 = (uVar196 != 0) * (uVar196 < 0x100) * bVar29 - (0xff < uVar196);
      bVar29 = (uVar203 != 0) * (uVar203 < 0x100) * bVar31 - (0xff < uVar203);
      bVar31 = (uVar231 != 0) * (uVar231 < 0x100) * bVar33 - (0xff < uVar231);
      bVar33 = (uVar243 != 0) * (uVar243 < 0x100) * bVar35 - (0xff < uVar243);
      bVar35 = (uVar173 != 0) * (uVar173 < 0x100) * bVar75 - (0xff < uVar173);
      bVar58 = (uVar208 != 0) * (uVar208 < 0x100) * bVar77 - (0xff < uVar208);
      bVar57 = (uVar209 != 0) * (uVar209 < 0x100) * bVar79 - (0xff < uVar209);
      bVar56 = (uVar172 != 0) * (uVar172 < 0x100) * bVar81 - (0xff < uVar172);
      uVar231 = (ushort)(((uint)bVar37 << 0x18) >> 0x18);
      uVar199 = (ushort)(((uint6)bVar38 << 0x28) >> 0x28);
      uVar243 = (ushort)(((ulong)bVar39 << 0x38) >> 0x38);
      uVar232 = (ushort)(((uint)bVar41 << 0x18) >> 0x18);
      uVar238 = (ushort)(((uint6)bVar42 << 0x28) >> 0x28);
      uVar244 = (ushort)(((ulong)bVar43 << 0x38) >> 0x38);
      uVar173 = (ushort)(((uint)bVar83 << 0x18) >> 0x18);
      uVar208 = (ushort)(((uint6)bVar84 << 0x28) >> 0x28);
      uVar209 = (ushort)(((ulong)bVar85 << 0x38) >> 0x38);
      uVar172 = (ushort)(((uint)bVar87 << 0x18) >> 0x18);
      uVar203 = (ushort)(((uint6)bVar88 << 0x28) >> 0x28);
      uVar196 = (ushort)(((ulong)bVar89 << 0x38) >> 0x38);
      bVar55 = (uVar231 != 0) * (uVar231 < 0x100) * bVar37 - (0xff < uVar231);
      bVar53 = (uVar243 != 0) * (uVar243 < 0x100) * bVar39 - (0xff < uVar243);
      bVar52 = (uVar232 != 0) * (uVar232 < 0x100) * bVar41 - (0xff < uVar232);
      bVar54 = (uVar244 != 0) * (uVar244 < 0x100) * bVar43 - (0xff < uVar244);
      bVar43 = (uVar173 != 0) * (uVar173 < 0x100) * bVar83 - (0xff < uVar173);
      bVar37 = (uVar209 != 0) * (uVar209 < 0x100) * bVar85 - (0xff < uVar209);
      bVar39 = (uVar172 != 0) * (uVar172 < 0x100) * bVar87 - (0xff < uVar172);
      bVar41 = (uVar196 != 0) * (uVar196 < 0x100) * bVar89 - (0xff < uVar196);
      uVar232 = (ushort)(((uint)bVar45 << 0x18) >> 0x18);
      uVar244 = (ushort)(((uint6)bVar46 << 0x28) >> 0x28);
      uVar204 = (ushort)(((ulong)bVar47 << 0x38) >> 0x38);
      uVar233 = (ushort)(((uint)bVar49 << 0x18) >> 0x18);
      uVar239 = (ushort)(((uint6)bVar50 << 0x28) >> 0x28);
      uVar245 = (ushort)(((ulong)bVar51 << 0x38) >> 0x38);
      uVar173 = (ushort)(((uint)bVar91 << 0x18) >> 0x18);
      uVar209 = (ushort)(((uint6)bVar92 << 0x28) >> 0x28);
      uVar172 = (ushort)(((ulong)bVar93 << 0x38) >> 0x38);
      uVar196 = (ushort)(((uint)bVar95 << 0x18) >> 0x18);
      uVar231 = (ushort)(((uint6)bVar96 << 0x28) >> 0x28);
      uVar243 = (ushort)(((ulong)bVar97 << 0x38) >> 0x38);
      bVar45 = (uVar232 != 0) * (uVar232 < 0x100) * bVar45 - (0xff < uVar232);
      bVar47 = (uVar204 != 0) * (uVar204 < 0x100) * bVar47 - (0xff < uVar204);
      bVar49 = (uVar233 != 0) * (uVar233 < 0x100) * bVar49 - (0xff < uVar233);
      bVar51 = (uVar245 != 0) * (uVar245 < 0x100) * bVar51 - (0xff < uVar245);
      bVar59 = (uVar173 != 0) * (uVar173 < 0x100) * bVar91 - (0xff < uVar173);
      bVar60 = (uVar172 != 0) * (uVar172 < 0x100) * bVar93 - (0xff < uVar172);
      bVar61 = (uVar196 != 0) * (uVar196 < 0x100) * bVar95 - (0xff < uVar196);
      bVar62 = (uVar243 != 0) * (uVar243 < 0x100) * bVar97 - (0xff < uVar243);
      uVar193 = (ulong)CONCAT16((uStack_1c4c != 0) * (uStack_1c4c < 0x100) * (char)(uVar228 >> 0x20)
                                - (0xff < uStack_1c4c),
                                CONCAT15(bVar7,CONCAT14((uStack_1c50 != 0) * (uStack_1c50 < 0x100) *
                                                        (char)uVar228 - (0xff < uStack_1c50),
                                                        CONCAT13(bVar2,CONCAT12((uStack_1c54 != 0) *
                                                                                (uStack_1c54 < 0x100
                                                                                ) * (char)(uVar193 
                                                  >> 0x20) - (0xff < uStack_1c54),
                                                  CONCAT11(bVar5,(local_1c58 != 0) *
                                                                 (local_1c58 < 0x100) *
                                                                 (char)uVar193 - (0xff < local_1c58)
                                                          )))))) & 0xff00ff00ff00ff;
      uVar228 = (ulong)CONCAT16((uStack_1c5c != 0) * (uStack_1c5c < 0x100) * (char)(uVar168 >> 0x20)
                                - (0xff < uStack_1c5c),
                                CONCAT15(bVar11,CONCAT14((uStack_1c60 != 0) * (uStack_1c60 < 0x100)
                                                         * (char)uVar168 - (0xff < uStack_1c60),
                                                         CONCAT13(bVar10,CONCAT12((uStack_1c64 != 0)
                                                                                  * (uStack_1c64 <
                                                                                    0x100) *
                                                                                  (char)(uVar156 >>
                                                                                        0x20) -
                                                                                  (0xff < 
                                                  uStack_1c64),
                                                  CONCAT11(bVar9,(local_1c68 != 0) *
                                                                 (local_1c68 < 0x100) *
                                                                 (char)uVar156 - (0xff < local_1c68)
                                                          )))))) & 0xff00ff00ff00ff;
      uVar156 = (ulong)CONCAT16((uStack_1c6c != 0) * (uStack_1c6c < 0x100) * (char)(uVar229 >> 0x20)
                                - (0xff < uStack_1c6c),
                                CONCAT15(bVar13,CONCAT14((uStack_1c70 != 0) * (uStack_1c70 < 0x100)
                                                         * (char)uVar229 - (0xff < uStack_1c70),
                                                         CONCAT13(bVar12,CONCAT12((uStack_1c74 != 0)
                                                                                  * (uStack_1c74 <
                                                                                    0x100) *
                                                                                  (char)(uVar194 >>
                                                                                        0x20) -
                                                                                  (0xff < 
                                                  uStack_1c74),
                                                  CONCAT11(bVar4,(local_1c78 != 0) *
                                                                 (local_1c78 < 0x100) *
                                                                 (char)uVar194 - (0xff < local_1c78)
                                                          )))))) & 0xff00ff00ff00ff;
      uVar168 = (ulong)CONCAT16((uStack_1c7c != 0) * (uStack_1c7c < 0x100) * (char)(uVar169 >> 0x20)
                                - (0xff < uStack_1c7c),
                                CONCAT15(bVar17,CONCAT14((uStack_1c80 != 0) * (uStack_1c80 < 0x100)
                                                         * (char)uVar169 - (0xff < uStack_1c80),
                                                         CONCAT13(bVar16,CONCAT12((uStack_1c84 != 0)
                                                                                  * (uStack_1c84 <
                                                                                    0x100) *
                                                                                  (char)(uVar157 >>
                                                                                        0x20) -
                                                                                  (0xff < 
                                                  uStack_1c84),
                                                  CONCAT11(bVar15,(local_1c88 != 0) *
                                                                  (local_1c88 < 0x100) *
                                                                  (char)uVar157 -
                                                                  (0xff < local_1c88))))))) &
                0xff00ff00ff00ff;
      local_1d18 = (ushort)uVar193;
      uStack_1d16 = (ushort)(uVar193 >> 0x10);
      uStack_1d14 = (ushort)(uVar193 >> 0x20);
      uStack_1d12 = (ushort)(uVar193 >> 0x30);
      uStack_1d10 = (ushort)uVar228;
      uStack_1d0e = (ushort)(uVar228 >> 0x10);
      uStack_1d0c = (ushort)(uVar228 >> 0x20);
      uStack_1d0a = (ushort)(uVar228 >> 0x30);
      local_1d28 = (ushort)uVar156;
      uStack_1d26 = (ushort)(uVar156 >> 0x10);
      uStack_1d24 = (ushort)(uVar156 >> 0x20);
      uStack_1d22 = (ushort)(uVar156 >> 0x30);
      uStack_1d20 = (ushort)uVar168;
      uStack_1d1e = (ushort)(uVar168 >> 0x10);
      uStack_1d1c = (ushort)(uVar168 >> 0x20);
      uStack_1d1a = (ushort)(uVar168 >> 0x30);
      bVar73 = (uStack_1d16 != 0) * (uStack_1d16 < 0x100) * (char)(uVar193 >> 0x10) -
               (0xff < uStack_1d16);
      bVar74 = (uStack_1d12 != 0) * (uStack_1d12 < 0x100) * (char)(uVar193 >> 0x30) -
               (0xff < uStack_1d12);
      bVar67 = (uStack_1d0e != 0) * (uStack_1d0e < 0x100) * (char)(uVar228 >> 0x10) -
               (0xff < uStack_1d0e);
      bVar72 = (uStack_1d0a != 0) * (uStack_1d0a < 0x100) * (char)(uVar228 >> 0x30) -
               (0xff < uStack_1d0a);
      bVar66 = (uStack_1d26 != 0) * (uStack_1d26 < 0x100) * (char)(uVar156 >> 0x10) -
               (0xff < uStack_1d26);
      bVar65 = (uStack_1d22 != 0) * (uStack_1d22 < 0x100) * (char)(uVar156 >> 0x30) -
               (0xff < uStack_1d22);
      bVar64 = (uStack_1d1e != 0) * (uStack_1d1e < 0x100) * (char)(uVar168 >> 0x10) -
               (0xff < uStack_1d1e);
      bVar63 = (uStack_1d1a != 0) * (uStack_1d1a < 0x100) * (char)(uVar168 >> 0x30) -
               (0xff < uStack_1d1a);
      uVar194 = (ulong)CONCAT16((uStack_1c8c != 0) * (uStack_1c8c < 0x100) * (char)(uVar230 >> 0x20)
                                - (0xff < uStack_1c8c),
                                CONCAT15(bVar23,CONCAT14((uStack_1c90 != 0) * (uStack_1c90 < 0x100)
                                                         * (char)uVar230 - (0xff < uStack_1c90),
                                                         CONCAT13(bVar19,CONCAT12((uStack_1c94 != 0)
                                                                                  * (uStack_1c94 <
                                                                                    0x100) *
                                                                                  (char)(uVar195 >>
                                                                                        0x20) -
                                                                                  (0xff < 
                                                  uStack_1c94),
                                                  CONCAT11(bVar20,(local_1c98 != 0) *
                                                                  (local_1c98 < 0x100) *
                                                                  (char)uVar195 -
                                                                  (0xff < local_1c98))))))) &
                0xff00ff00ff00ff;
      uVar229 = (ulong)CONCAT16((uStack_1c9c != 0) * (uStack_1c9c < 0x100) * (char)(uVar170 >> 0x20)
                                - (0xff < uStack_1c9c),
                                CONCAT15(bVar27,CONCAT14((uStack_1ca0 != 0) * (uStack_1ca0 < 0x100)
                                                         * (char)uVar170 - (0xff < uStack_1ca0),
                                                         CONCAT13(bVar26,CONCAT12((uStack_1ca4 != 0)
                                                                                  * (uStack_1ca4 <
                                                                                    0x100) *
                                                                                  (char)(uVar158 >>
                                                                                        0x20) -
                                                                                  (0xff < 
                                                  uStack_1ca4),
                                                  CONCAT11(bVar21,(local_1ca8 != 0) *
                                                                  (local_1ca8 < 0x100) *
                                                                  (char)uVar158 -
                                                                  (0xff < local_1ca8))))))) &
                0xff00ff00ff00ff;
      uVar157 = (ulong)CONCAT16((uVar237 != 0) * (uVar237 < 0x100) * bVar34 - (0xff < uVar237),
                                CONCAT15(bVar31,CONCAT14((bVar32 != 0) * (bVar32 < 0x100) * bVar32 -
                                                         (0xff < bVar32),
                                                         CONCAT13(bVar29,CONCAT12((uVar198 != 0) *
                                                                                  (uVar198 < 0x100)
                                                                                  * bVar30 -
                                                                                  (0xff < uVar198),
                                                                                  CONCAT11(bVar24,(
                                                  bVar28 != 0) * (bVar28 < 0x100) * bVar28 -
                                                  (0xff < bVar28))))))) & 0xff00ff00ff00ff;
      uVar169 = (ulong)CONCAT16((uVar171 != 0) * (uVar171 < 0x100) * bVar80 - (0xff < uVar171),
                                CONCAT15(bVar57,CONCAT14((bVar78 != 0) * (bVar78 < 0x100) * bVar78 -
                                                         (0xff < bVar78),
                                                         CONCAT13(bVar58,CONCAT12((uVar174 != 0) *
                                                                                  (uVar174 < 0x100)
                                                                                  * bVar76 -
                                                                                  (0xff < uVar174),
                                                                                  CONCAT11(bVar35,(
                                                  bVar1 != 0) * (bVar1 < 0x100) * bVar1 -
                                                  (0xff < bVar1))))))) & 0xff00ff00ff00ff;
      local_1d38 = (ushort)uVar194;
      uStack_1d36 = (ushort)(uVar194 >> 0x10);
      uStack_1d34 = (ushort)(uVar194 >> 0x20);
      uStack_1d32 = (ushort)(uVar194 >> 0x30);
      uStack_1d30 = (ushort)uVar229;
      uStack_1d2e = (ushort)(uVar229 >> 0x10);
      uStack_1d2c = (ushort)(uVar229 >> 0x20);
      uStack_1d2a = (ushort)(uVar229 >> 0x30);
      local_1d48 = (ushort)uVar157;
      uStack_1d46 = (ushort)(uVar157 >> 0x10);
      uStack_1d44 = (ushort)(uVar157 >> 0x20);
      uStack_1d42 = (ushort)(uVar157 >> 0x30);
      uStack_1d40 = (ushort)uVar169;
      uStack_1d3e = (ushort)(uVar169 >> 0x10);
      uStack_1d3c = (ushort)(uVar169 >> 0x20);
      uStack_1d3a = (ushort)(uVar169 >> 0x30);
      bVar1 = (uStack_1d36 != 0) * (uStack_1d36 < 0x100) * (char)(uVar194 >> 0x10) -
              (0xff < uStack_1d36);
      bVar28 = (uStack_1d32 != 0) * (uStack_1d32 < 0x100) * (char)(uVar194 >> 0x30) -
               (0xff < uStack_1d32);
      bVar30 = (uStack_1d2e != 0) * (uStack_1d2e < 0x100) * (char)(uVar229 >> 0x10) -
               (0xff < uStack_1d2e);
      bVar32 = (uStack_1d2a != 0) * (uStack_1d2a < 0x100) * (char)(uVar229 >> 0x30) -
               (0xff < uStack_1d2a);
      bVar34 = (uStack_1d46 != 0) * (uStack_1d46 < 0x100) * (char)(uVar157 >> 0x10) -
               (0xff < uStack_1d46);
      bVar71 = (uStack_1d42 != 0) * (uStack_1d42 < 0x100) * (char)(uVar157 >> 0x30) -
               (0xff < uStack_1d42);
      bVar70 = (uStack_1d3e != 0) * (uStack_1d3e < 0x100) * (char)(uVar169 >> 0x10) -
               (0xff < uStack_1d3e);
      bVar69 = (uStack_1d3a != 0) * (uStack_1d3a < 0x100) * (char)(uVar169 >> 0x30) -
               (0xff < uStack_1d3a);
      uVar195 = (ulong)CONCAT16((uVar238 != 0) * (uVar238 < 0x100) * bVar42 - (0xff < uVar238),
                                CONCAT15(bVar52,CONCAT14((bVar40 != 0) * (bVar40 < 0x100) * bVar40 -
                                                         (0xff < bVar40),
                                                         CONCAT13(bVar53,CONCAT12((uVar199 != 0) *
                                                                                  (uVar199 < 0x100)
                                                                                  * bVar38 -
                                                                                  (0xff < uVar199),
                                                                                  CONCAT11(bVar55,(
                                                  bVar36 != 0) * (bVar36 < 0x100) * bVar36 -
                                                  (0xff < bVar36))))))) & 0xff00ff00ff00ff;
      uVar230 = (ulong)CONCAT16((uVar203 != 0) * (uVar203 < 0x100) * bVar88 - (0xff < uVar203),
                                CONCAT15(bVar39,CONCAT14((bVar86 != 0) * (bVar86 < 0x100) * bVar86 -
                                                         (0xff < bVar86),
                                                         CONCAT13(bVar37,CONCAT12((uVar208 != 0) *
                                                                                  (uVar208 < 0x100)
                                                                                  * bVar84 -
                                                                                  (0xff < uVar208),
                                                                                  CONCAT11(bVar43,(
                                                  bVar82 != 0) * (bVar82 < 0x100) * bVar82 -
                                                  (0xff < bVar82))))))) & 0xff00ff00ff00ff;
      uVar158 = (ulong)CONCAT16((uVar239 != 0) * (uVar239 < 0x100) * bVar50 - (0xff < uVar239),
                                CONCAT15(bVar49,CONCAT14((bVar48 != 0) * (bVar48 < 0x100) * bVar48 -
                                                         (0xff < bVar48),
                                                         CONCAT13(bVar47,CONCAT12((uVar244 != 0) *
                                                                                  (uVar244 < 0x100)
                                                                                  * bVar46 -
                                                                                  (0xff < uVar244),
                                                                                  CONCAT11(bVar45,(
                                                  bVar44 != 0) * (bVar44 < 0x100) * bVar44 -
                                                  (0xff < bVar44))))))) & 0xff00ff00ff00ff;
      uVar170 = (ulong)CONCAT16((uVar231 != 0) * (uVar231 < 0x100) * bVar96 - (0xff < uVar231),
                                CONCAT15(bVar61,CONCAT14((bVar94 != 0) * (bVar94 < 0x100) * bVar94 -
                                                         (0xff < bVar94),
                                                         CONCAT13(bVar60,CONCAT12((uVar209 != 0) *
                                                                                  (uVar209 < 0x100)
                                                                                  * bVar92 -
                                                                                  (0xff < uVar209),
                                                                                  CONCAT11(bVar59,(
                                                  bVar90 != 0) * (bVar90 < 0x100) * bVar90 -
                                                  (0xff < bVar90))))))) & 0xff00ff00ff00ff;
      local_1d58 = (ushort)uVar195;
      uStack_1d56 = (ushort)(uVar195 >> 0x10);
      uStack_1d54 = (ushort)(uVar195 >> 0x20);
      uStack_1d52 = (ushort)(uVar195 >> 0x30);
      uStack_1d50 = (ushort)uVar230;
      uStack_1d4e = (ushort)(uVar230 >> 0x10);
      uStack_1d4c = (ushort)(uVar230 >> 0x20);
      uStack_1d4a = (ushort)(uVar230 >> 0x30);
      local_1d68 = (ushort)uVar158;
      uStack_1d66 = (ushort)(uVar158 >> 0x10);
      uStack_1d64 = (ushort)(uVar158 >> 0x20);
      uStack_1d62 = (ushort)(uVar158 >> 0x30);
      uStack_1d60 = (ushort)uVar170;
      uStack_1d5e = (ushort)(uVar170 >> 0x10);
      uStack_1d5c = (ushort)(uVar170 >> 0x20);
      uStack_1d5a = (ushort)(uVar170 >> 0x30);
      bVar40 = (uStack_1d56 != 0) * (uStack_1d56 < 0x100) * (char)(uVar195 >> 0x10) -
               (0xff < uStack_1d56);
      bVar50 = (uStack_1d52 != 0) * (uStack_1d52 < 0x100) * (char)(uVar195 >> 0x30) -
               (0xff < uStack_1d52);
      bVar48 = (uStack_1d4e != 0) * (uStack_1d4e < 0x100) * (char)(uVar230 >> 0x10) -
               (0xff < uStack_1d4e);
      bVar46 = (uStack_1d4a != 0) * (uStack_1d4a < 0x100) * (char)(uVar230 >> 0x30) -
               (0xff < uStack_1d4a);
      bVar44 = (uStack_1d66 != 0) * (uStack_1d66 < 0x100) * (char)(uVar158 >> 0x10) -
               (0xff < uStack_1d66);
      bVar36 = (uStack_1d62 != 0) * (uStack_1d62 < 0x100) * (char)(uVar158 >> 0x30) -
               (0xff < uStack_1d62);
      bVar38 = (uStack_1d5e != 0) * (uStack_1d5e < 0x100) * (char)(uVar170 >> 0x10) -
               (0xff < uStack_1d5e);
      bVar42 = (uStack_1d5a != 0) * (uStack_1d5a < 0x100) * (char)(uVar170 >> 0x30) -
               (0xff < uStack_1d5a);
      uVar196 = (ushort)(((uint)bVar2 << 0x18) >> 0x18);
      uVar198 = (ushort)(((uint6)bVar7 << 0x28) >> 0x28);
      uVar203 = (ushort)(((ulong)bVar8 << 0x38) >> 0x38);
      uVar231 = (ushort)(((uint)bVar10 << 0x18) >> 0x18);
      uVar237 = (ushort)(((uint6)bVar11 << 0x28) >> 0x28);
      uVar243 = (ushort)(((ulong)bVar6 << 0x38) >> 0x38);
      uVar173 = (ushort)(((uint)bVar12 << 0x18) >> 0x18);
      uVar174 = (ushort)(((uint6)bVar13 << 0x28) >> 0x28);
      uVar208 = (ushort)(((ulong)bVar14 << 0x38) >> 0x38);
      uVar209 = (ushort)(((uint)bVar16 << 0x18) >> 0x18);
      uVar171 = (ushort)(((uint6)bVar17 << 0x28) >> 0x28);
      uVar172 = (ushort)(((ulong)bVar18 << 0x38) >> 0x38);
      bVar2 = (uVar196 != 0) * (uVar196 < 0x100) * bVar2 - (0xff < uVar196);
      bVar80 = (uVar203 != 0) * (uVar203 < 0x100) * bVar8 - (0xff < uVar203);
      bVar81 = (uVar231 != 0) * (uVar231 < 0x100) * bVar10 - (0xff < uVar231);
      bVar68 = (uVar243 != 0) * (uVar243 < 0x100) * bVar6 - (0xff < uVar243);
      bVar12 = (uVar173 != 0) * (uVar173 < 0x100) * bVar12 - (0xff < uVar173);
      bVar8 = (uVar208 != 0) * (uVar208 < 0x100) * bVar14 - (0xff < uVar208);
      bVar10 = (uVar209 != 0) * (uVar209 < 0x100) * bVar16 - (0xff < uVar209);
      bVar6 = (uVar172 != 0) * (uVar172 < 0x100) * bVar18 - (0xff < uVar172);
      uVar231 = (ushort)(((uint)bVar19 << 0x18) >> 0x18);
      uVar199 = (ushort)(((uint6)bVar23 << 0x28) >> 0x28);
      uVar243 = (ushort)(((ulong)bVar25 << 0x38) >> 0x38);
      uVar232 = (ushort)(((uint)bVar26 << 0x18) >> 0x18);
      uVar238 = (ushort)(((uint6)bVar27 << 0x28) >> 0x28);
      uVar244 = (ushort)(((ulong)bVar22 << 0x38) >> 0x38);
      uVar173 = (ushort)(((uint)bVar29 << 0x18) >> 0x18);
      uVar208 = (ushort)(((uint6)bVar31 << 0x28) >> 0x28);
      uVar209 = (ushort)(((ulong)bVar33 << 0x38) >> 0x38);
      uVar172 = (ushort)(((uint)bVar58 << 0x18) >> 0x18);
      uVar203 = (ushort)(((uint6)bVar57 << 0x28) >> 0x28);
      uVar196 = (ushort)(((ulong)bVar56 << 0x38) >> 0x38);
      bVar14 = (uVar231 != 0) * (uVar231 < 0x100) * bVar19 - (0xff < uVar231);
      bVar16 = (uVar243 != 0) * (uVar243 < 0x100) * bVar25 - (0xff < uVar243);
      bVar18 = (uVar232 != 0) * (uVar232 < 0x100) * bVar26 - (0xff < uVar232);
      bVar19 = (uVar244 != 0) * (uVar244 < 0x100) * bVar22 - (0xff < uVar244);
      bVar22 = (uVar173 != 0) * (uVar173 < 0x100) * bVar29 - (0xff < uVar173);
      bVar26 = (uVar209 != 0) * (uVar209 < 0x100) * bVar33 - (0xff < uVar209);
      bVar25 = (uVar172 != 0) * (uVar172 < 0x100) * bVar58 - (0xff < uVar172);
      bVar29 = (uVar196 != 0) * (uVar196 < 0x100) * bVar56 - (0xff < uVar196);
      uVar232 = (ushort)(((uint)bVar53 << 0x18) >> 0x18);
      uVar244 = (ushort)(((uint6)bVar52 << 0x28) >> 0x28);
      uVar204 = (ushort)(((ulong)bVar54 << 0x38) >> 0x38);
      uVar233 = (ushort)(((uint)bVar37 << 0x18) >> 0x18);
      uVar239 = (ushort)(((uint6)bVar39 << 0x28) >> 0x28);
      uVar245 = (ushort)(((ulong)bVar41 << 0x38) >> 0x38);
      uVar173 = (ushort)(((uint)bVar47 << 0x18) >> 0x18);
      uVar209 = (ushort)(((uint6)bVar49 << 0x28) >> 0x28);
      uVar172 = (ushort)(((ulong)bVar51 << 0x38) >> 0x38);
      uVar196 = (ushort)(((uint)bVar60 << 0x18) >> 0x18);
      uVar231 = (ushort)(((uint6)bVar61 << 0x28) >> 0x28);
      uVar243 = (ushort)(((ulong)bVar62 << 0x38) >> 0x38);
      bVar33 = (uVar232 != 0) * (uVar232 < 0x100) * bVar53 - (0xff < uVar232);
      bVar54 = (uVar204 != 0) * (uVar204 < 0x100) * bVar54 - (0xff < uVar204);
      bVar56 = (uVar233 != 0) * (uVar233 < 0x100) * bVar37 - (0xff < uVar233);
      bVar58 = (uVar245 != 0) * (uVar245 < 0x100) * bVar41 - (0xff < uVar245);
      bVar53 = (uVar173 != 0) * (uVar173 < 0x100) * bVar47 - (0xff < uVar173);
      bVar47 = (uVar172 != 0) * (uVar172 < 0x100) * bVar51 - (0xff < uVar172);
      bVar37 = (uVar196 != 0) * (uVar196 < 0x100) * bVar60 - (0xff < uVar196);
      bVar41 = (uVar243 != 0) * (uVar243 < 0x100) * bVar62 - (0xff < uVar243);
      uVar193 = (ulong)CONCAT16((uStack_1d0c != 0) * (uStack_1d0c < 0x100) * (char)(uVar228 >> 0x20)
                                - (0xff < uStack_1d0c),
                                CONCAT15(bVar67,CONCAT14((uStack_1d10 != 0) * (uStack_1d10 < 0x100)
                                                         * (char)uVar228 - (0xff < uStack_1d10),
                                                         CONCAT13(bVar74,CONCAT12((uStack_1d14 != 0)
                                                                                  * (uStack_1d14 <
                                                                                    0x100) *
                                                                                  (char)(uVar193 >>
                                                                                        0x20) -
                                                                                  (0xff < 
                                                  uStack_1d14),
                                                  CONCAT11(bVar73,(local_1d18 != 0) *
                                                                  (local_1d18 < 0x100) *
                                                                  (char)uVar193 -
                                                                  (0xff < local_1d18))))))) &
                0xff00ff00ff00ff;
      uVar228 = (ulong)CONCAT16((uStack_1d1c != 0) * (uStack_1d1c < 0x100) * (char)(uVar168 >> 0x20)
                                - (0xff < uStack_1d1c),
                                CONCAT15(bVar64,CONCAT14((uStack_1d20 != 0) * (uStack_1d20 < 0x100)
                                                         * (char)uVar168 - (0xff < uStack_1d20),
                                                         CONCAT13(bVar65,CONCAT12((uStack_1d24 != 0)
                                                                                  * (uStack_1d24 <
                                                                                    0x100) *
                                                                                  (char)(uVar156 >>
                                                                                        0x20) -
                                                                                  (0xff < 
                                                  uStack_1d24),
                                                  CONCAT11(bVar66,(local_1d28 != 0) *
                                                                  (local_1d28 < 0x100) *
                                                                  (char)uVar156 -
                                                                  (0xff < local_1d28))))))) &
                0xff00ff00ff00ff;
      uVar156 = (ulong)CONCAT16((uStack_1d2c != 0) * (uStack_1d2c < 0x100) * (char)(uVar229 >> 0x20)
                                - (0xff < uStack_1d2c),
                                CONCAT15(bVar30,CONCAT14((uStack_1d30 != 0) * (uStack_1d30 < 0x100)
                                                         * (char)uVar229 - (0xff < uStack_1d30),
                                                         CONCAT13(bVar28,CONCAT12((uStack_1d34 != 0)
                                                                                  * (uStack_1d34 <
                                                                                    0x100) *
                                                                                  (char)(uVar194 >>
                                                                                        0x20) -
                                                                                  (0xff < 
                                                  uStack_1d34),
                                                  CONCAT11(bVar1,(local_1d38 != 0) *
                                                                 (local_1d38 < 0x100) *
                                                                 (char)uVar194 - (0xff < local_1d38)
                                                          )))))) & 0xff00ff00ff00ff;
      uVar168 = (ulong)CONCAT16((uStack_1d3c != 0) * (uStack_1d3c < 0x100) * (char)(uVar169 >> 0x20)
                                - (0xff < uStack_1d3c),
                                CONCAT15(bVar70,CONCAT14((uStack_1d40 != 0) * (uStack_1d40 < 0x100)
                                                         * (char)uVar169 - (0xff < uStack_1d40),
                                                         CONCAT13(bVar71,CONCAT12((uStack_1d44 != 0)
                                                                                  * (uStack_1d44 <
                                                                                    0x100) *
                                                                                  (char)(uVar157 >>
                                                                                        0x20) -
                                                                                  (0xff < 
                                                  uStack_1d44),
                                                  CONCAT11(bVar34,(local_1d48 != 0) *
                                                                  (local_1d48 < 0x100) *
                                                                  (char)uVar157 -
                                                                  (0xff < local_1d48))))))) &
                0xff00ff00ff00ff;
      local_1dd8 = (ushort)uVar193;
      uStack_1dd6 = (ushort)(uVar193 >> 0x10);
      uStack_1dd4 = (ushort)(uVar193 >> 0x20);
      uStack_1dd2 = (ushort)(uVar193 >> 0x30);
      uStack_1dd0 = (ushort)uVar228;
      uStack_1dce = (ushort)(uVar228 >> 0x10);
      uStack_1dcc = (ushort)(uVar228 >> 0x20);
      uStack_1dca = (ushort)(uVar228 >> 0x30);
      local_1de8 = (ushort)uVar156;
      uStack_1de6 = (ushort)(uVar156 >> 0x10);
      uStack_1de4 = (ushort)(uVar156 >> 0x20);
      uStack_1de2 = (ushort)(uVar156 >> 0x30);
      uStack_1de0 = (ushort)uVar168;
      uStack_1dde = (ushort)(uVar168 >> 0x10);
      uStack_1ddc = (ushort)(uVar168 >> 0x20);
      uStack_1dda = (ushort)(uVar168 >> 0x30);
      bVar51 = (uStack_1dd6 != 0) * (uStack_1dd6 < 0x100) * (char)(uVar193 >> 0x10) -
               (0xff < uStack_1dd6);
      bVar60 = (uStack_1dd2 != 0) * (uStack_1dd2 < 0x100) * (char)(uVar193 >> 0x30) -
               (0xff < uStack_1dd2);
      bVar62 = (uStack_1dce != 0) * (uStack_1dce < 0x100) * (char)(uVar228 >> 0x10) -
               (0xff < uStack_1dce);
      bVar79 = (uStack_1dca != 0) * (uStack_1dca < 0x100) * (char)(uVar228 >> 0x30) -
               (0xff < uStack_1dca);
      bVar78 = (uStack_1de6 != 0) * (uStack_1de6 < 0x100) * (char)(uVar156 >> 0x10) -
               (0xff < uStack_1de6);
      bVar77 = (uStack_1de2 != 0) * (uStack_1de2 < 0x100) * (char)(uVar156 >> 0x30) -
               (0xff < uStack_1de2);
      bVar76 = (uStack_1dde != 0) * (uStack_1dde < 0x100) * (char)(uVar168 >> 0x10) -
               (0xff < uStack_1dde);
      bVar75 = (uStack_1dda != 0) * (uStack_1dda < 0x100) * (char)(uVar168 >> 0x30) -
               (0xff < uStack_1dda);
      uVar194 = (ulong)CONCAT16((uStack_1d4c != 0) * (uStack_1d4c < 0x100) * (char)(uVar230 >> 0x20)
                                - (0xff < uStack_1d4c),
                                CONCAT15(bVar48,CONCAT14((uStack_1d50 != 0) * (uStack_1d50 < 0x100)
                                                         * (char)uVar230 - (0xff < uStack_1d50),
                                                         CONCAT13(bVar50,CONCAT12((uStack_1d54 != 0)
                                                                                  * (uStack_1d54 <
                                                                                    0x100) *
                                                                                  (char)(uVar195 >>
                                                                                        0x20) -
                                                                                  (0xff < 
                                                  uStack_1d54),
                                                  CONCAT11(bVar40,(local_1d58 != 0) *
                                                                  (local_1d58 < 0x100) *
                                                                  (char)uVar195 -
                                                                  (0xff < local_1d58))))))) &
                0xff00ff00ff00ff;
      uVar229 = (ulong)CONCAT16((uStack_1d5c != 0) * (uStack_1d5c < 0x100) * (char)(uVar170 >> 0x20)
                                - (0xff < uStack_1d5c),
                                CONCAT15(bVar38,CONCAT14((uStack_1d60 != 0) * (uStack_1d60 < 0x100)
                                                         * (char)uVar170 - (0xff < uStack_1d60),
                                                         CONCAT13(bVar36,CONCAT12((uStack_1d64 != 0)
                                                                                  * (uStack_1d64 <
                                                                                    0x100) *
                                                                                  (char)(uVar158 >>
                                                                                        0x20) -
                                                                                  (0xff < 
                                                  uStack_1d64),
                                                  CONCAT11(bVar44,(local_1d68 != 0) *
                                                                  (local_1d68 < 0x100) *
                                                                  (char)uVar158 -
                                                                  (0xff < local_1d68))))))) &
                0xff00ff00ff00ff;
      uVar157 = (ulong)CONCAT16((uVar237 != 0) * (uVar237 < 0x100) * bVar11 - (0xff < uVar237),
                                CONCAT15(bVar81,CONCAT14((bVar9 != 0) * (bVar9 < 0x100) * bVar9 -
                                                         (0xff < bVar9),
                                                         CONCAT13(bVar80,CONCAT12((uVar198 != 0) *
                                                                                  (uVar198 < 0x100)
                                                                                  * bVar7 - (0xff < 
                                                  uVar198),CONCAT11(bVar2,(bVar5 != 0) *
                                                                          (bVar5 < 0x100) * bVar5 -
                                                                          (0xff < bVar5))))))) &
                0xff00ff00ff00ff;
      uVar169 = (ulong)CONCAT16((uVar171 != 0) * (uVar171 < 0x100) * bVar17 - (0xff < uVar171),
                                CONCAT15(bVar10,CONCAT14((bVar15 != 0) * (bVar15 < 0x100) * bVar15 -
                                                         (0xff < bVar15),
                                                         CONCAT13(bVar8,CONCAT12((uVar174 != 0) *
                                                                                 (uVar174 < 0x100) *
                                                                                 bVar13 - (0xff < 
                                                  uVar174),CONCAT11(bVar12,(bVar4 != 0) *
                                                                           (bVar4 < 0x100) * bVar4 -
                                                                           (0xff < bVar4))))))) &
                0xff00ff00ff00ff;
      local_1df8 = (ushort)uVar194;
      uStack_1df6 = (ushort)(uVar194 >> 0x10);
      uStack_1df4 = (ushort)(uVar194 >> 0x20);
      uStack_1df2 = (ushort)(uVar194 >> 0x30);
      uStack_1df0 = (ushort)uVar229;
      uStack_1dee = (ushort)(uVar229 >> 0x10);
      uStack_1dec = (ushort)(uVar229 >> 0x20);
      uStack_1dea = (ushort)(uVar229 >> 0x30);
      local_1e08 = (ushort)uVar157;
      uStack_1e06 = (ushort)(uVar157 >> 0x10);
      uStack_1e04 = (ushort)(uVar157 >> 0x20);
      uStack_1e02 = (ushort)(uVar157 >> 0x30);
      uStack_1e00 = (ushort)uVar169;
      uStack_1dfe = (ushort)(uVar169 >> 0x10);
      uStack_1dfc = (ushort)(uVar169 >> 0x20);
      uStack_1dfa = (ushort)(uVar169 >> 0x30);
      bVar17 = (uStack_1df6 != 0) * (uStack_1df6 < 0x100) * (char)(uVar194 >> 0x10) -
               (0xff < uStack_1df6);
      bVar15 = (uStack_1df2 != 0) * (uStack_1df2 < 0x100) * (char)(uVar194 >> 0x30) -
               (0xff < uStack_1df2);
      bVar13 = (uStack_1dee != 0) * (uStack_1dee < 0x100) * (char)(uVar229 >> 0x10) -
               (0xff < uStack_1dee);
      bVar4 = (uStack_1dea != 0) * (uStack_1dea < 0x100) * (char)(uVar229 >> 0x30) -
              (0xff < uStack_1dea);
      bVar11 = (uStack_1e06 != 0) * (uStack_1e06 < 0x100) * (char)(uVar157 >> 0x10) -
               (0xff < uStack_1e06);
      bVar5 = (uStack_1e02 != 0) * (uStack_1e02 < 0x100) * (char)(uVar157 >> 0x30) -
              (0xff < uStack_1e02);
      bVar7 = (uStack_1dfe != 0) * (uStack_1dfe < 0x100) * (char)(uVar169 >> 0x10) -
              (0xff < uStack_1dfe);
      bVar9 = (uStack_1dfa != 0) * (uStack_1dfa < 0x100) * (char)(uVar169 >> 0x30) -
              (0xff < uStack_1dfa);
      uVar195 = (ulong)CONCAT16((uVar238 != 0) * (uVar238 < 0x100) * bVar27 - (0xff < uVar238),
                                CONCAT15(bVar18,CONCAT14((bVar21 != 0) * (bVar21 < 0x100) * bVar21 -
                                                         (0xff < bVar21),
                                                         CONCAT13(bVar16,CONCAT12((uVar199 != 0) *
                                                                                  (uVar199 < 0x100)
                                                                                  * bVar23 -
                                                                                  (0xff < uVar199),
                                                                                  CONCAT11(bVar14,(
                                                  bVar20 != 0) * (bVar20 < 0x100) * bVar20 -
                                                  (0xff < bVar20))))))) & 0xff00ff00ff00ff;
      uVar230 = (ulong)CONCAT16((uVar203 != 0) * (uVar203 < 0x100) * bVar57 - (0xff < uVar203),
                                CONCAT15(bVar25,CONCAT14((bVar35 != 0) * (bVar35 < 0x100) * bVar35 -
                                                         (0xff < bVar35),
                                                         CONCAT13(bVar26,CONCAT12((uVar208 != 0) *
                                                                                  (uVar208 < 0x100)
                                                                                  * bVar31 -
                                                                                  (0xff < uVar208),
                                                                                  CONCAT11(bVar22,(
                                                  bVar24 != 0) * (bVar24 < 0x100) * bVar24 -
                                                  (0xff < bVar24))))))) & 0xff00ff00ff00ff;
      uVar158 = (ulong)CONCAT16((uVar239 != 0) * (uVar239 < 0x100) * bVar39 - (0xff < uVar239),
                                CONCAT15(bVar56,CONCAT14((bVar43 != 0) * (bVar43 < 0x100) * bVar43 -
                                                         (0xff < bVar43),
                                                         CONCAT13(bVar54,CONCAT12((uVar244 != 0) *
                                                                                  (uVar244 < 0x100)
                                                                                  * bVar52 -
                                                                                  (0xff < uVar244),
                                                                                  CONCAT11(bVar33,(
                                                  bVar55 != 0) * (bVar55 < 0x100) * bVar55 -
                                                  (0xff < bVar55))))))) & 0xff00ff00ff00ff;
      uVar170 = (ulong)CONCAT16((uVar231 != 0) * (uVar231 < 0x100) * bVar61 - (0xff < uVar231),
                                CONCAT15(bVar37,CONCAT14((bVar59 != 0) * (bVar59 < 0x100) * bVar59 -
                                                         (0xff < bVar59),
                                                         CONCAT13(bVar47,CONCAT12((uVar209 != 0) *
                                                                                  (uVar209 < 0x100)
                                                                                  * bVar49 -
                                                                                  (0xff < uVar209),
                                                                                  CONCAT11(bVar53,(
                                                  bVar45 != 0) * (bVar45 < 0x100) * bVar45 -
                                                  (0xff < bVar45))))))) & 0xff00ff00ff00ff;
      local_1e18 = (ushort)uVar195;
      uStack_1e16 = (ushort)(uVar195 >> 0x10);
      uStack_1e14 = (ushort)(uVar195 >> 0x20);
      uStack_1e12 = (ushort)(uVar195 >> 0x30);
      uStack_1e10 = (ushort)uVar230;
      uStack_1e0e = (ushort)(uVar230 >> 0x10);
      uStack_1e0c = (ushort)(uVar230 >> 0x20);
      uStack_1e0a = (ushort)(uVar230 >> 0x30);
      local_1e28 = (ushort)uVar158;
      uStack_1e26 = (ushort)(uVar158 >> 0x10);
      uStack_1e24 = (ushort)(uVar158 >> 0x20);
      uStack_1e22 = (ushort)(uVar158 >> 0x30);
      uStack_1e20 = (ushort)uVar170;
      uStack_1e1e = (ushort)(uVar170 >> 0x10);
      uStack_1e1c = (ushort)(uVar170 >> 0x20);
      uStack_1e1a = (ushort)(uVar170 >> 0x30);
      bVar27 = (uStack_1e16 != 0) * (uStack_1e16 < 0x100) * (char)(uVar195 >> 0x10) -
               (0xff < uStack_1e16);
      bVar23 = (uStack_1e12 != 0) * (uStack_1e12 < 0x100) * (char)(uVar195 >> 0x30) -
               (0xff < uStack_1e12);
      bVar20 = (uStack_1e0e != 0) * (uStack_1e0e < 0x100) * (char)(uVar230 >> 0x10) -
               (0xff < uStack_1e0e);
      bVar21 = (uStack_1e0a != 0) * (uStack_1e0a < 0x100) * (char)(uVar230 >> 0x30) -
               (0xff < uStack_1e0a);
      bVar24 = (uStack_1e26 != 0) * (uStack_1e26 < 0x100) * (char)(uVar158 >> 0x10) -
               (0xff < uStack_1e26);
      bVar31 = (uStack_1e22 != 0) * (uStack_1e22 < 0x100) * (char)(uVar158 >> 0x30) -
               (0xff < uStack_1e22);
      bVar35 = (uStack_1e1e != 0) * (uStack_1e1e < 0x100) * (char)(uVar170 >> 0x10) -
               (0xff < uStack_1e1e);
      bVar43 = (uStack_1e1a != 0) * (uStack_1e1a < 0x100) * (char)(uVar170 >> 0x30) -
               (0xff < uStack_1e1a);
      uVar196 = (ushort)(((uint)bVar74 << 0x18) >> 0x18);
      uVar198 = (ushort)(((uint6)bVar67 << 0x28) >> 0x28);
      uVar203 = (ushort)(((ulong)bVar72 << 0x38) >> 0x38);
      uVar231 = (ushort)(((uint)bVar65 << 0x18) >> 0x18);
      uVar237 = (ushort)(((uint6)bVar64 << 0x28) >> 0x28);
      uVar243 = (ushort)(((ulong)bVar63 << 0x38) >> 0x38);
      uVar173 = (ushort)(((uint)bVar28 << 0x18) >> 0x18);
      uVar174 = (ushort)(((uint6)bVar30 << 0x28) >> 0x28);
      uVar208 = (ushort)(((ulong)bVar32 << 0x38) >> 0x38);
      uVar209 = (ushort)(((uint)bVar71 << 0x18) >> 0x18);
      uVar171 = (ushort)(((uint6)bVar70 << 0x28) >> 0x28);
      uVar172 = (ushort)(((ulong)bVar69 << 0x38) >> 0x38);
      bVar52 = (uVar196 != 0) * (uVar196 < 0x100) * bVar74 - (0xff < uVar196);
      bVar55 = (uVar203 != 0) * (uVar203 < 0x100) * bVar72 - (0xff < uVar203);
      bVar49 = (uVar231 != 0) * (uVar231 < 0x100) * bVar65 - (0xff < uVar231);
      bVar57 = (uVar243 != 0) * (uVar243 < 0x100) * bVar63 - (0xff < uVar243);
      bVar45 = (uVar173 != 0) * (uVar173 < 0x100) * bVar28 - (0xff < uVar173);
      bVar39 = (uVar208 != 0) * (uVar208 < 0x100) * bVar32 - (0xff < uVar208);
      bVar32 = (uVar209 != 0) * (uVar209 < 0x100) * bVar71 - (0xff < uVar209);
      bVar28 = (uVar172 != 0) * (uVar172 < 0x100) * bVar69 - (0xff < uVar172);
      uVar231 = (ushort)(((uint)bVar50 << 0x18) >> 0x18);
      uVar199 = (ushort)(((uint6)bVar48 << 0x28) >> 0x28);
      uVar243 = (ushort)(((ulong)bVar46 << 0x38) >> 0x38);
      uVar232 = (ushort)(((uint)bVar36 << 0x18) >> 0x18);
      uVar238 = (ushort)(((uint6)bVar38 << 0x28) >> 0x28);
      uVar244 = (ushort)(((ulong)bVar42 << 0x38) >> 0x38);
      uVar173 = (ushort)(((uint)bVar80 << 0x18) >> 0x18);
      uVar208 = (ushort)(((uint6)bVar81 << 0x28) >> 0x28);
      uVar209 = (ushort)(((ulong)bVar68 << 0x38) >> 0x38);
      uVar172 = (ushort)(((uint)bVar8 << 0x18) >> 0x18);
      uVar203 = (ushort)(((uint6)bVar10 << 0x28) >> 0x28);
      uVar196 = (ushort)(((ulong)bVar6 << 0x38) >> 0x38);
      bVar50 = (uVar231 != 0) * (uVar231 < 0x100) * bVar50 - (0xff < uVar231);
      bVar46 = (uVar243 != 0) * (uVar243 < 0x100) * bVar46 - (0xff < uVar243);
      bVar36 = (uVar232 != 0) * (uVar232 < 0x100) * bVar36 - (0xff < uVar232);
      bVar42 = (uVar244 != 0) * (uVar244 < 0x100) * bVar42 - (0xff < uVar244);
      bVar59 = (uVar173 != 0) * (uVar173 < 0x100) * bVar80 - (0xff < uVar173);
      bVar61 = (uVar209 != 0) * (uVar209 < 0x100) * bVar68 - (0xff < uVar209);
      bVar8 = (uVar172 != 0) * (uVar172 < 0x100) * bVar8 - (0xff < uVar172);
      bVar6 = (uVar196 != 0) * (uVar196 < 0x100) * bVar6 - (0xff < uVar196);
      uVar232 = (ushort)(((uint)bVar16 << 0x18) >> 0x18);
      uVar244 = (ushort)(((uint6)bVar18 << 0x28) >> 0x28);
      uVar204 = (ushort)(((ulong)bVar19 << 0x38) >> 0x38);
      uVar233 = (ushort)(((uint)bVar26 << 0x18) >> 0x18);
      uVar239 = (ushort)(((uint6)bVar25 << 0x28) >> 0x28);
      uVar245 = (ushort)(((ulong)bVar29 << 0x38) >> 0x38);
      uVar173 = (ushort)(((uint)bVar54 << 0x18) >> 0x18);
      uVar209 = (ushort)(((uint6)bVar56 << 0x28) >> 0x28);
      uVar172 = (ushort)(((ulong)bVar58 << 0x38) >> 0x38);
      uVar196 = (ushort)(((uint)bVar47 << 0x18) >> 0x18);
      uVar231 = (ushort)(((uint6)bVar37 << 0x28) >> 0x28);
      uVar243 = (ushort)(((ulong)bVar41 << 0x38) >> 0x38);
      bVar74 = (uVar232 != 0) * (uVar232 < 0x100) * bVar16 - (0xff < uVar232);
      bVar16 = (uVar204 != 0) * (uVar204 < 0x100) * bVar19 - (0xff < uVar204);
      bVar65 = (uVar233 != 0) * (uVar233 < 0x100) * bVar26 - (0xff < uVar233);
      bVar63 = (uVar245 != 0) * (uVar245 < 0x100) * bVar29 - (0xff < uVar245);
      bVar54 = (uVar173 != 0) * (uVar173 < 0x100) * bVar54 - (0xff < uVar173);
      bVar29 = (uVar172 != 0) * (uVar172 < 0x100) * bVar58 - (0xff < uVar172);
      bVar26 = (uVar196 != 0) * (uVar196 < 0x100) * bVar47 - (0xff < uVar196);
      bVar19 = (uVar243 != 0) * (uVar243 < 0x100) * bVar41 - (0xff < uVar243);
      uVar193 = (ulong)CONCAT16((uStack_1dcc != 0) * (uStack_1dcc < 0x100) * (char)(uVar228 >> 0x20)
                                - (0xff < uStack_1dcc),
                                CONCAT15(bVar62,CONCAT14((uStack_1dd0 != 0) * (uStack_1dd0 < 0x100)
                                                         * (char)uVar228 - (0xff < uStack_1dd0),
                                                         CONCAT13(bVar60,CONCAT12((uStack_1dd4 != 0)
                                                                                  * (uStack_1dd4 <
                                                                                    0x100) *
                                                                                  (char)(uVar193 >>
                                                                                        0x20) -
                                                                                  (0xff < 
                                                  uStack_1dd4),
                                                  CONCAT11(bVar51,(local_1dd8 != 0) *
                                                                  (local_1dd8 < 0x100) *
                                                                  (char)uVar193 -
                                                                  (0xff < local_1dd8))))))) &
                0xff00ff00ff00ff;
      uVar228 = (ulong)CONCAT16((uStack_1ddc != 0) * (uStack_1ddc < 0x100) * (char)(uVar168 >> 0x20)
                                - (0xff < uStack_1ddc),
                                CONCAT15(bVar76,CONCAT14((uStack_1de0 != 0) * (uStack_1de0 < 0x100)
                                                         * (char)uVar168 - (0xff < uStack_1de0),
                                                         CONCAT13(bVar77,CONCAT12((uStack_1de4 != 0)
                                                                                  * (uStack_1de4 <
                                                                                    0x100) *
                                                                                  (char)(uVar156 >>
                                                                                        0x20) -
                                                                                  (0xff < 
                                                  uStack_1de4),
                                                  CONCAT11(bVar78,(local_1de8 != 0) *
                                                                  (local_1de8 < 0x100) *
                                                                  (char)uVar156 -
                                                                  (0xff < local_1de8))))))) &
                0xff00ff00ff00ff;
      uVar156 = (ulong)CONCAT16((uStack_1dec != 0) * (uStack_1dec < 0x100) * (char)(uVar229 >> 0x20)
                                - (0xff < uStack_1dec),
                                CONCAT15(bVar13,CONCAT14((uStack_1df0 != 0) * (uStack_1df0 < 0x100)
                                                         * (char)uVar229 - (0xff < uStack_1df0),
                                                         CONCAT13(bVar15,CONCAT12((uStack_1df4 != 0)
                                                                                  * (uStack_1df4 <
                                                                                    0x100) *
                                                                                  (char)(uVar194 >>
                                                                                        0x20) -
                                                                                  (0xff < 
                                                  uStack_1df4),
                                                  CONCAT11(bVar17,(local_1df8 != 0) *
                                                                  (local_1df8 < 0x100) *
                                                                  (char)uVar194 -
                                                                  (0xff < local_1df8))))))) &
                0xff00ff00ff00ff;
      uVar168 = (ulong)CONCAT16((uStack_1dfc != 0) * (uStack_1dfc < 0x100) * (char)(uVar169 >> 0x20)
                                - (0xff < uStack_1dfc),
                                CONCAT15(bVar7,CONCAT14((uStack_1e00 != 0) * (uStack_1e00 < 0x100) *
                                                        (char)uVar169 - (0xff < uStack_1e00),
                                                        CONCAT13(bVar5,CONCAT12((uStack_1e04 != 0) *
                                                                                (uStack_1e04 < 0x100
                                                                                ) * (char)(uVar157 
                                                  >> 0x20) - (0xff < uStack_1e04),
                                                  CONCAT11(bVar11,(local_1e08 != 0) *
                                                                  (local_1e08 < 0x100) *
                                                                  (char)uVar157 -
                                                                  (0xff < local_1e08))))))) &
                0xff00ff00ff00ff;
      local_1e98 = (ushort)uVar193;
      uStack_1e96 = (ushort)(uVar193 >> 0x10);
      uStack_1e94 = (ushort)(uVar193 >> 0x20);
      uStack_1e92 = (ushort)(uVar193 >> 0x30);
      uStack_1e90 = (ushort)uVar228;
      uStack_1e8e = (ushort)(uVar228 >> 0x10);
      uStack_1e8c = (ushort)(uVar228 >> 0x20);
      uStack_1e8a = (ushort)(uVar228 >> 0x30);
      local_1ea8 = (ushort)uVar156;
      uStack_1ea6 = (ushort)(uVar156 >> 0x10);
      uStack_1ea4 = (ushort)(uVar156 >> 0x20);
      uStack_1ea2 = (ushort)(uVar156 >> 0x30);
      uStack_1ea0 = (ushort)uVar168;
      uStack_1e9e = (ushort)(uVar168 >> 0x10);
      uStack_1e9c = (ushort)(uVar168 >> 0x20);
      uStack_1e9a = (ushort)(uVar168 >> 0x30);
      bVar80 = (uStack_1e96 != 0) * (uStack_1e96 < 0x100) * (char)(uVar193 >> 0x10) -
               (0xff < uStack_1e96);
      bVar41 = (uStack_1e92 != 0) * (uStack_1e92 < 0x100) * (char)(uVar193 >> 0x30) -
               (0xff < uStack_1e92);
      bVar68 = (uStack_1e8e != 0) * (uStack_1e8e < 0x100) * (char)(uVar228 >> 0x10) -
               (0xff < uStack_1e8e);
      bVar69 = (uStack_1e8a != 0) * (uStack_1e8a < 0x100) * (char)(uVar228 >> 0x30) -
               (0xff < uStack_1e8a);
      bVar71 = (uStack_1ea6 != 0) * (uStack_1ea6 < 0x100) * (char)(uVar156 >> 0x10) -
               (0xff < uStack_1ea6);
      bVar72 = (uStack_1ea2 != 0) * (uStack_1ea2 < 0x100) * (char)(uVar156 >> 0x30) -
               (0xff < uStack_1ea2);
      bVar58 = (uStack_1e9e != 0) * (uStack_1e9e < 0x100) * (char)(uVar168 >> 0x10) -
               (0xff < uStack_1e9e);
      bVar47 = (uStack_1e9a != 0) * (uStack_1e9a < 0x100) * (char)(uVar168 >> 0x30) -
               (0xff < uStack_1e9a);
      uVar194 = (ulong)CONCAT16((uStack_1e0c != 0) * (uStack_1e0c < 0x100) * (char)(uVar230 >> 0x20)
                                - (0xff < uStack_1e0c),
                                CONCAT15(bVar20,CONCAT14((uStack_1e10 != 0) * (uStack_1e10 < 0x100)
                                                         * (char)uVar230 - (0xff < uStack_1e10),
                                                         CONCAT13(bVar23,CONCAT12((uStack_1e14 != 0)
                                                                                  * (uStack_1e14 <
                                                                                    0x100) *
                                                                                  (char)(uVar195 >>
                                                                                        0x20) -
                                                                                  (0xff < 
                                                  uStack_1e14),
                                                  CONCAT11(bVar27,(local_1e18 != 0) *
                                                                  (local_1e18 < 0x100) *
                                                                  (char)uVar195 -
                                                                  (0xff < local_1e18))))))) &
                0xff00ff00ff00ff;
      uVar229 = (ulong)CONCAT16((uStack_1e1c != 0) * (uStack_1e1c < 0x100) * (char)(uVar170 >> 0x20)
                                - (0xff < uStack_1e1c),
                                CONCAT15(bVar35,CONCAT14((uStack_1e20 != 0) * (uStack_1e20 < 0x100)
                                                         * (char)uVar170 - (0xff < uStack_1e20),
                                                         CONCAT13(bVar31,CONCAT12((uStack_1e24 != 0)
                                                                                  * (uStack_1e24 <
                                                                                    0x100) *
                                                                                  (char)(uVar158 >>
                                                                                        0x20) -
                                                                                  (0xff < 
                                                  uStack_1e24),
                                                  CONCAT11(bVar24,(local_1e28 != 0) *
                                                                  (local_1e28 < 0x100) *
                                                                  (char)uVar158 -
                                                                  (0xff < local_1e28))))))) &
                0xff00ff00ff00ff;
      uVar157 = (ulong)CONCAT16((uVar237 != 0) * (uVar237 < 0x100) * bVar64 - (0xff < uVar237),
                                CONCAT15(bVar49,CONCAT14((bVar66 != 0) * (bVar66 < 0x100) * bVar66 -
                                                         (0xff < bVar66),
                                                         CONCAT13(bVar55,CONCAT12((uVar198 != 0) *
                                                                                  (uVar198 < 0x100)
                                                                                  * bVar67 -
                                                                                  (0xff < uVar198),
                                                                                  CONCAT11(bVar52,(
                                                  bVar73 != 0) * (bVar73 < 0x100) * bVar73 -
                                                  (0xff < bVar73))))))) & 0xff00ff00ff00ff;
      uVar169 = (ulong)CONCAT16((uVar171 != 0) * (uVar171 < 0x100) * bVar70 - (0xff < uVar171),
                                CONCAT15(bVar32,CONCAT14((bVar34 != 0) * (bVar34 < 0x100) * bVar34 -
                                                         (0xff < bVar34),
                                                         CONCAT13(bVar39,CONCAT12((uVar174 != 0) *
                                                                                  (uVar174 < 0x100)
                                                                                  * bVar30 -
                                                                                  (0xff < uVar174),
                                                                                  CONCAT11(bVar45,(
                                                  bVar1 != 0) * (bVar1 < 0x100) * bVar1 -
                                                  (0xff < bVar1))))))) & 0xff00ff00ff00ff;
      local_1eb8 = (ushort)uVar194;
      uStack_1eb6 = (ushort)(uVar194 >> 0x10);
      uStack_1eb4 = (ushort)(uVar194 >> 0x20);
      uStack_1eb2 = (ushort)(uVar194 >> 0x30);
      uStack_1eb0 = (ushort)uVar229;
      uStack_1eae = (ushort)(uVar229 >> 0x10);
      uStack_1eac = (ushort)(uVar229 >> 0x20);
      uStack_1eaa = (ushort)(uVar229 >> 0x30);
      local_1ec8 = (ushort)uVar157;
      uStack_1ec6 = (ushort)(uVar157 >> 0x10);
      uStack_1ec4 = (ushort)(uVar157 >> 0x20);
      uStack_1ec2 = (ushort)(uVar157 >> 0x30);
      uStack_1ec0 = (ushort)uVar169;
      uStack_1ebe = (ushort)(uVar169 >> 0x10);
      uStack_1ebc = (ushort)(uVar169 >> 0x20);
      uStack_1eba = (ushort)(uVar169 >> 0x30);
      bVar1 = (uStack_1eb6 != 0) * (uStack_1eb6 < 0x100) * (char)(uVar194 >> 0x10) -
              (0xff < uStack_1eb6);
      bVar30 = (uStack_1eb2 != 0) * (uStack_1eb2 < 0x100) * (char)(uVar194 >> 0x30) -
               (0xff < uStack_1eb2);
      bVar34 = (uStack_1eae != 0) * (uStack_1eae < 0x100) * (char)(uVar229 >> 0x10) -
               (0xff < uStack_1eae);
      bVar64 = (uStack_1eaa != 0) * (uStack_1eaa < 0x100) * (char)(uVar229 >> 0x30) -
               (0xff < uStack_1eaa);
      bVar66 = (uStack_1ec6 != 0) * (uStack_1ec6 < 0x100) * (char)(uVar157 >> 0x10) -
               (0xff < uStack_1ec6);
      bVar67 = (uStack_1ec2 != 0) * (uStack_1ec2 < 0x100) * (char)(uVar157 >> 0x30) -
               (0xff < uStack_1ec2);
      bVar73 = (uStack_1ebe != 0) * (uStack_1ebe < 0x100) * (char)(uVar169 >> 0x10) -
               (0xff < uStack_1ebe);
      bVar70 = (uStack_1eba != 0) * (uStack_1eba < 0x100) * (char)(uVar169 >> 0x30) -
               (0xff < uStack_1eba);
      uVar195 = (ulong)CONCAT16((uVar238 != 0) * (uVar238 < 0x100) * bVar38 - (0xff < uVar238),
                                CONCAT15(bVar36,CONCAT14((bVar44 != 0) * (bVar44 < 0x100) * bVar44 -
                                                         (0xff < bVar44),
                                                         CONCAT13(bVar46,CONCAT12((uVar199 != 0) *
                                                                                  (uVar199 < 0x100)
                                                                                  * bVar48 -
                                                                                  (0xff < uVar199),
                                                                                  CONCAT11(bVar50,(
                                                  bVar40 != 0) * (bVar40 < 0x100) * bVar40 -
                                                  (0xff < bVar40))))))) & 0xff00ff00ff00ff;
      uVar230 = (ulong)CONCAT16((uVar203 != 0) * (uVar203 < 0x100) * bVar10 - (0xff < uVar203),
                                CONCAT15(bVar8,CONCAT14((bVar12 != 0) * (bVar12 < 0x100) * bVar12 -
                                                        (0xff < bVar12),
                                                        CONCAT13(bVar61,CONCAT12((uVar208 != 0) *
                                                                                 (uVar208 < 0x100) *
                                                                                 bVar81 - (0xff < 
                                                  uVar208),CONCAT11(bVar59,(bVar2 != 0) *
                                                                           (bVar2 < 0x100) * bVar2 -
                                                                           (0xff < bVar2))))))) &
                0xff00ff00ff00ff;
      uVar158 = (ulong)CONCAT16((uVar239 != 0) * (uVar239 < 0x100) * bVar25 - (0xff < uVar239),
                                CONCAT15(bVar65,CONCAT14((bVar22 != 0) * (bVar22 < 0x100) * bVar22 -
                                                         (0xff < bVar22),
                                                         CONCAT13(bVar16,CONCAT12((uVar244 != 0) *
                                                                                  (uVar244 < 0x100)
                                                                                  * bVar18 -
                                                                                  (0xff < uVar244),
                                                                                  CONCAT11(bVar74,(
                                                  bVar14 != 0) * (bVar14 < 0x100) * bVar14 -
                                                  (0xff < bVar14))))))) & 0xff00ff00ff00ff;
      uVar170 = (ulong)CONCAT16((uVar231 != 0) * (uVar231 < 0x100) * bVar37 - (0xff < uVar231),
                                CONCAT15(bVar26,CONCAT14((bVar53 != 0) * (bVar53 < 0x100) * bVar53 -
                                                         (0xff < bVar53),
                                                         CONCAT13(bVar29,CONCAT12((uVar209 != 0) *
                                                                                  (uVar209 < 0x100)
                                                                                  * bVar56 -
                                                                                  (0xff < uVar209),
                                                                                  CONCAT11(bVar54,(
                                                  bVar33 != 0) * (bVar33 < 0x100) * bVar33 -
                                                  (0xff < bVar33))))))) & 0xff00ff00ff00ff;
      local_1ed8 = (ushort)uVar195;
      uStack_1ed6 = (ushort)(uVar195 >> 0x10);
      uStack_1ed4 = (ushort)(uVar195 >> 0x20);
      uStack_1ed2 = (ushort)(uVar195 >> 0x30);
      uStack_1ed0 = (ushort)uVar230;
      uStack_1ece = (ushort)(uVar230 >> 0x10);
      uStack_1ecc = (ushort)(uVar230 >> 0x20);
      uStack_1eca = (ushort)(uVar230 >> 0x30);
      local_1ee8 = (ushort)uVar158;
      uStack_1ee6 = (ushort)(uVar158 >> 0x10);
      uStack_1ee4 = (ushort)(uVar158 >> 0x20);
      uStack_1ee2 = (ushort)(uVar158 >> 0x30);
      uStack_1ee0 = (ushort)uVar170;
      uStack_1ede = (ushort)(uVar170 >> 0x10);
      uStack_1edc = (ushort)(uVar170 >> 0x20);
      uStack_1eda = (ushort)(uVar170 >> 0x30);
      bVar25 = (uStack_1ed6 != 0) * (uStack_1ed6 < 0x100) * (char)(uVar195 >> 0x10) -
               (0xff < uStack_1ed6);
      bVar22 = (uStack_1ed2 != 0) * (uStack_1ed2 < 0x100) * (char)(uVar195 >> 0x30) -
               (0xff < uStack_1ed2);
      bVar2 = (uStack_1ece != 0) * (uStack_1ece < 0x100) * (char)(uVar230 >> 0x10) -
              (0xff < uStack_1ece);
      bVar18 = (uStack_1eca != 0) * (uStack_1eca < 0x100) * (char)(uVar230 >> 0x30) -
               (0xff < uStack_1eca);
      bVar33 = (uStack_1ee6 != 0) * (uStack_1ee6 < 0x100) * (char)(uVar158 >> 0x10) -
               (0xff < uStack_1ee6);
      bVar14 = (uStack_1ee2 != 0) * (uStack_1ee2 < 0x100) * (char)(uVar158 >> 0x30) -
               (0xff < uStack_1ee2);
      bVar12 = (uStack_1ede != 0) * (uStack_1ede < 0x100) * (char)(uVar170 >> 0x10) -
               (0xff < uStack_1ede);
      bVar10 = (uStack_1eda != 0) * (uStack_1eda < 0x100) * (char)(uVar170 >> 0x30) -
               (0xff < uStack_1eda);
      uVar196 = (ushort)(((uint)bVar60 << 0x18) >> 0x18);
      uVar198 = (ushort)(((uint6)bVar62 << 0x28) >> 0x28);
      uVar203 = (ushort)(((ulong)bVar79 << 0x38) >> 0x38);
      uVar231 = (ushort)(((uint)bVar77 << 0x18) >> 0x18);
      uVar237 = (ushort)(((uint6)bVar76 << 0x28) >> 0x28);
      uVar243 = (ushort)(((ulong)bVar75 << 0x38) >> 0x38);
      uVar173 = (ushort)(((uint)bVar15 << 0x18) >> 0x18);
      uVar174 = (ushort)(((uint6)bVar13 << 0x28) >> 0x28);
      uVar208 = (ushort)(((ulong)bVar4 << 0x38) >> 0x38);
      uVar209 = (ushort)(((uint)bVar5 << 0x18) >> 0x18);
      uVar171 = (ushort)(((uint6)bVar7 << 0x28) >> 0x28);
      uVar172 = (ushort)(((ulong)bVar9 << 0x38) >> 0x38);
      bVar40 = (uVar196 != 0) * (uVar196 < 0x100) * bVar60 - (0xff < uVar196);
      bVar38 = (uVar203 != 0) * (uVar203 < 0x100) * bVar79 - (0xff < uVar203);
      bVar37 = (uVar231 != 0) * (uVar231 < 0x100) * bVar77 - (0xff < uVar231);
      bVar44 = (uVar243 != 0) * (uVar243 < 0x100) * bVar75 - (0xff < uVar243);
      bVar15 = (uVar173 != 0) * (uVar173 < 0x100) * bVar15 - (0xff < uVar173);
      bVar4 = (uVar208 != 0) * (uVar208 < 0x100) * bVar4 - (0xff < uVar208);
      bVar5 = (uVar209 != 0) * (uVar209 < 0x100) * bVar5 - (0xff < uVar209);
      bVar9 = (uVar172 != 0) * (uVar172 < 0x100) * bVar9 - (0xff < uVar172);
      uVar231 = (ushort)(((uint)bVar23 << 0x18) >> 0x18);
      uVar199 = (ushort)(((uint6)bVar20 << 0x28) >> 0x28);
      uVar243 = (ushort)(((ulong)bVar21 << 0x38) >> 0x38);
      uVar232 = (ushort)(((uint)bVar31 << 0x18) >> 0x18);
      uVar238 = (ushort)(((uint6)bVar35 << 0x28) >> 0x28);
      uVar244 = (ushort)(((ulong)bVar43 << 0x38) >> 0x38);
      uVar173 = (ushort)(((uint)bVar55 << 0x18) >> 0x18);
      uVar208 = (ushort)(((uint6)bVar49 << 0x28) >> 0x28);
      uVar209 = (ushort)(((ulong)bVar57 << 0x38) >> 0x38);
      uVar172 = (ushort)(((uint)bVar39 << 0x18) >> 0x18);
      uVar203 = (ushort)(((uint6)bVar32 << 0x28) >> 0x28);
      uVar196 = (ushort)(((ulong)bVar28 << 0x38) >> 0x38);
      bVar53 = (uVar231 != 0) * (uVar231 < 0x100) * bVar23 - (0xff < uVar231);
      bVar56 = (uVar243 != 0) * (uVar243 < 0x100) * bVar21 - (0xff < uVar243);
      bVar48 = (uVar232 != 0) * (uVar232 < 0x100) * bVar31 - (0xff < uVar232);
      bVar60 = (uVar244 != 0) * (uVar244 < 0x100) * bVar43 - (0xff < uVar244);
      bVar23 = (uVar173 != 0) * (uVar173 < 0x100) * bVar55 - (0xff < uVar173);
      bVar43 = (uVar209 != 0) * (uVar209 < 0x100) * bVar57 - (0xff < uVar209);
      bVar31 = (uVar172 != 0) * (uVar172 < 0x100) * bVar39 - (0xff < uVar172);
      bVar21 = (uVar196 != 0) * (uVar196 < 0x100) * bVar28 - (0xff < uVar196);
      uVar232 = (ushort)(((uint)bVar46 << 0x18) >> 0x18);
      uVar244 = (ushort)(((uint6)bVar36 << 0x28) >> 0x28);
      uVar204 = (ushort)(((ulong)bVar42 << 0x38) >> 0x38);
      uVar233 = (ushort)(((uint)bVar61 << 0x18) >> 0x18);
      uVar239 = (ushort)(((uint6)bVar8 << 0x28) >> 0x28);
      uVar245 = (ushort)(((ulong)bVar6 << 0x38) >> 0x38);
      uVar173 = (ushort)(((uint)bVar16 << 0x18) >> 0x18);
      uVar209 = (ushort)(((uint6)bVar65 << 0x28) >> 0x28);
      uVar172 = (ushort)(((ulong)bVar63 << 0x38) >> 0x38);
      uVar196 = (ushort)(((uint)bVar29 << 0x18) >> 0x18);
      uVar231 = (ushort)(((uint6)bVar26 << 0x28) >> 0x28);
      uVar243 = (ushort)(((ulong)bVar19 << 0x38) >> 0x38);
      bVar55 = (uVar232 != 0) * (uVar232 < 0x100) * bVar46 - (0xff < uVar232);
      bVar57 = (uVar204 != 0) * (uVar204 < 0x100) * bVar42 - (0xff < uVar204);
      bVar46 = (uVar233 != 0) * (uVar233 < 0x100) * bVar61 - (0xff < uVar233);
      bVar39 = (uVar245 != 0) * (uVar245 < 0x100) * bVar6 - (0xff < uVar245);
      bVar6 = (uVar173 != 0) * (uVar173 < 0x100) * bVar16 - (0xff < uVar173);
      bVar42 = (uVar172 != 0) * (uVar172 < 0x100) * bVar63 - (0xff < uVar172);
      bVar28 = (uVar196 != 0) * (uVar196 < 0x100) * bVar29 - (0xff < uVar196);
      bVar16 = (uVar243 != 0) * (uVar243 < 0x100) * bVar19 - (0xff < uVar243);
      uVar193 = (ulong)CONCAT16((uStack_1e8c != 0) * (uStack_1e8c < 0x100) * (char)(uVar228 >> 0x20)
                                - (0xff < uStack_1e8c),
                                CONCAT15(bVar68,CONCAT14((uStack_1e90 != 0) * (uStack_1e90 < 0x100)
                                                         * (char)uVar228 - (0xff < uStack_1e90),
                                                         CONCAT13(bVar41,CONCAT12((uStack_1e94 != 0)
                                                                                  * (uStack_1e94 <
                                                                                    0x100) *
                                                                                  (char)(uVar193 >>
                                                                                        0x20) -
                                                                                  (0xff < 
                                                  uStack_1e94),
                                                  CONCAT11(bVar80,(local_1e98 != 0) *
                                                                  (local_1e98 < 0x100) *
                                                                  (char)uVar193 -
                                                                  (0xff < local_1e98))))))) &
                0xff00ff00ff00ff;
      uVar228 = (ulong)CONCAT16((uStack_1e9c != 0) * (uStack_1e9c < 0x100) * (char)(uVar168 >> 0x20)
                                - (0xff < uStack_1e9c),
                                CONCAT15(bVar58,CONCAT14((uStack_1ea0 != 0) * (uStack_1ea0 < 0x100)
                                                         * (char)uVar168 - (0xff < uStack_1ea0),
                                                         CONCAT13(bVar72,CONCAT12((uStack_1ea4 != 0)
                                                                                  * (uStack_1ea4 <
                                                                                    0x100) *
                                                                                  (char)(uVar156 >>
                                                                                        0x20) -
                                                                                  (0xff < 
                                                  uStack_1ea4),
                                                  CONCAT11(bVar71,(local_1ea8 != 0) *
                                                                  (local_1ea8 < 0x100) *
                                                                  (char)uVar156 -
                                                                  (0xff < local_1ea8))))))) &
                0xff00ff00ff00ff;
      uVar156 = (ulong)CONCAT16((uStack_1eac != 0) * (uStack_1eac < 0x100) * (char)(uVar229 >> 0x20)
                                - (0xff < uStack_1eac),
                                CONCAT15(bVar34,CONCAT14((uStack_1eb0 != 0) * (uStack_1eb0 < 0x100)
                                                         * (char)uVar229 - (0xff < uStack_1eb0),
                                                         CONCAT13(bVar30,CONCAT12((uStack_1eb4 != 0)
                                                                                  * (uStack_1eb4 <
                                                                                    0x100) *
                                                                                  (char)(uVar194 >>
                                                                                        0x20) -
                                                                                  (0xff < 
                                                  uStack_1eb4),
                                                  CONCAT11(bVar1,(local_1eb8 != 0) *
                                                                 (local_1eb8 < 0x100) *
                                                                 (char)uVar194 - (0xff < local_1eb8)
                                                          )))))) & 0xff00ff00ff00ff;
      uVar168 = (ulong)CONCAT16((uStack_1ebc != 0) * (uStack_1ebc < 0x100) * (char)(uVar169 >> 0x20)
                                - (0xff < uStack_1ebc),
                                CONCAT15(bVar73,CONCAT14((uStack_1ec0 != 0) * (uStack_1ec0 < 0x100)
                                                         * (char)uVar169 - (0xff < uStack_1ec0),
                                                         CONCAT13(bVar67,CONCAT12((uStack_1ec4 != 0)
                                                                                  * (uStack_1ec4 <
                                                                                    0x100) *
                                                                                  (char)(uVar157 >>
                                                                                        0x20) -
                                                                                  (0xff < 
                                                  uStack_1ec4),
                                                  CONCAT11(bVar66,(local_1ec8 != 0) *
                                                                  (local_1ec8 < 0x100) *
                                                                  (char)uVar157 -
                                                                  (0xff < local_1ec8))))))) &
                0xff00ff00ff00ff;
      local_1f58 = (ushort)uVar193;
      uStack_1f56 = (ushort)(uVar193 >> 0x10);
      uStack_1f54 = (ushort)(uVar193 >> 0x20);
      uStack_1f52 = (ushort)(uVar193 >> 0x30);
      uStack_1f50 = (ushort)uVar228;
      uStack_1f4e = (ushort)(uVar228 >> 0x10);
      uStack_1f4c = (ushort)(uVar228 >> 0x20);
      uStack_1f4a = (ushort)(uVar228 >> 0x30);
      local_1f68 = (ushort)uVar156;
      uStack_1f66 = (ushort)(uVar156 >> 0x10);
      uStack_1f64 = (ushort)(uVar156 >> 0x20);
      uStack_1f62 = (ushort)(uVar156 >> 0x30);
      uStack_1f60 = (ushort)uVar168;
      uStack_1f5e = (ushort)(uVar168 >> 0x10);
      uStack_1f5c = (ushort)(uVar168 >> 0x20);
      uStack_1f5a = (ushort)(uVar168 >> 0x30);
      uVar194 = (ulong)CONCAT16((uStack_1ecc != 0) * (uStack_1ecc < 0x100) * (char)(uVar230 >> 0x20)
                                - (0xff < uStack_1ecc),
                                CONCAT15(bVar2,CONCAT14((uStack_1ed0 != 0) * (uStack_1ed0 < 0x100) *
                                                        (char)uVar230 - (0xff < uStack_1ed0),
                                                        CONCAT13(bVar22,CONCAT12((uStack_1ed4 != 0)
                                                                                 * (uStack_1ed4 <
                                                                                   0x100) *
                                                                                 (char)(uVar195 >>
                                                                                       0x20) -
                                                                                 (0xff < uStack_1ed4
                                                                                 ),CONCAT11(bVar25,(
                                                  local_1ed8 != 0) * (local_1ed8 < 0x100) *
                                                  (char)uVar195 - (0xff < local_1ed8))))))) &
                0xff00ff00ff00ff;
      uVar229 = (ulong)CONCAT16((uStack_1edc != 0) * (uStack_1edc < 0x100) * (char)(uVar170 >> 0x20)
                                - (0xff < uStack_1edc),
                                CONCAT15(bVar12,CONCAT14((uStack_1ee0 != 0) * (uStack_1ee0 < 0x100)
                                                         * (char)uVar170 - (0xff < uStack_1ee0),
                                                         CONCAT13(bVar14,CONCAT12((uStack_1ee4 != 0)
                                                                                  * (uStack_1ee4 <
                                                                                    0x100) *
                                                                                  (char)(uVar158 >>
                                                                                        0x20) -
                                                                                  (0xff < 
                                                  uStack_1ee4),
                                                  CONCAT11(bVar33,(local_1ee8 != 0) *
                                                                  (local_1ee8 < 0x100) *
                                                                  (char)uVar158 -
                                                                  (0xff < local_1ee8))))))) &
                0xff00ff00ff00ff;
      uVar157 = (ulong)CONCAT16((uVar237 != 0) * (uVar237 < 0x100) * bVar76 - (0xff < uVar237),
                                CONCAT15(bVar37,CONCAT14((bVar78 != 0) * (bVar78 < 0x100) * bVar78 -
                                                         (0xff < bVar78),
                                                         CONCAT13(bVar38,CONCAT12((uVar198 != 0) *
                                                                                  (uVar198 < 0x100)
                                                                                  * bVar62 -
                                                                                  (0xff < uVar198),
                                                                                  CONCAT11(bVar40,(
                                                  bVar51 != 0) * (bVar51 < 0x100) * bVar51 -
                                                  (0xff < bVar51))))))) & 0xff00ff00ff00ff;
      uVar169 = (ulong)CONCAT16((uVar171 != 0) * (uVar171 < 0x100) * bVar7 - (0xff < uVar171),
                                CONCAT15(bVar5,CONCAT14((bVar11 != 0) * (bVar11 < 0x100) * bVar11 -
                                                        (0xff < bVar11),
                                                        CONCAT13(bVar4,CONCAT12((uVar174 != 0) *
                                                                                (uVar174 < 0x100) *
                                                                                bVar13 - (0xff < 
                                                  uVar174),CONCAT11(bVar15,(bVar17 != 0) *
                                                                           (bVar17 < 0x100) * bVar17
                                                                           - (0xff < bVar17))))))) &
                0xff00ff00ff00ff;
      local_1f78 = (ushort)uVar194;
      uStack_1f76 = (ushort)(uVar194 >> 0x10);
      uStack_1f74 = (ushort)(uVar194 >> 0x20);
      uStack_1f72 = (ushort)(uVar194 >> 0x30);
      uStack_1f70 = (ushort)uVar229;
      uStack_1f6e = (ushort)(uVar229 >> 0x10);
      uStack_1f6c = (ushort)(uVar229 >> 0x20);
      uStack_1f6a = (ushort)(uVar229 >> 0x30);
      local_1f88 = (ushort)uVar157;
      uStack_1f86 = (ushort)(uVar157 >> 0x10);
      uStack_1f84 = (ushort)(uVar157 >> 0x20);
      uStack_1f82 = (ushort)(uVar157 >> 0x30);
      uStack_1f80 = (ushort)uVar169;
      uStack_1f7e = (ushort)(uVar169 >> 0x10);
      uStack_1f7c = (ushort)(uVar169 >> 0x20);
      uStack_1f7a = (ushort)(uVar169 >> 0x30);
      uVar195 = (ulong)CONCAT16((uVar238 != 0) * (uVar238 < 0x100) * bVar35 - (0xff < uVar238),
                                CONCAT15(bVar48,CONCAT14((bVar24 != 0) * (bVar24 < 0x100) * bVar24 -
                                                         (0xff < bVar24),
                                                         CONCAT13(bVar56,CONCAT12((uVar199 != 0) *
                                                                                  (uVar199 < 0x100)
                                                                                  * bVar20 -
                                                                                  (0xff < uVar199),
                                                                                  CONCAT11(bVar53,(
                                                  bVar27 != 0) * (bVar27 < 0x100) * bVar27 -
                                                  (0xff < bVar27))))))) & 0xff00ff00ff00ff;
      uVar230 = (ulong)CONCAT16((uVar203 != 0) * (uVar203 < 0x100) * bVar32 - (0xff < uVar203),
                                CONCAT15(bVar31,CONCAT14((bVar45 != 0) * (bVar45 < 0x100) * bVar45 -
                                                         (0xff < bVar45),
                                                         CONCAT13(bVar43,CONCAT12((uVar208 != 0) *
                                                                                  (uVar208 < 0x100)
                                                                                  * bVar49 -
                                                                                  (0xff < uVar208),
                                                                                  CONCAT11(bVar23,(
                                                  bVar52 != 0) * (bVar52 < 0x100) * bVar52 -
                                                  (0xff < bVar52))))))) & 0xff00ff00ff00ff;
      uVar158 = (ulong)CONCAT16((uVar239 != 0) * (uVar239 < 0x100) * bVar8 - (0xff < uVar239),
                                CONCAT15(bVar46,CONCAT14((bVar59 != 0) * (bVar59 < 0x100) * bVar59 -
                                                         (0xff < bVar59),
                                                         CONCAT13(bVar57,CONCAT12((uVar244 != 0) *
                                                                                  (uVar244 < 0x100)
                                                                                  * bVar36 -
                                                                                  (0xff < uVar244),
                                                                                  CONCAT11(bVar55,(
                                                  bVar50 != 0) * (bVar50 < 0x100) * bVar50 -
                                                  (0xff < bVar50))))))) & 0xff00ff00ff00ff;
      uVar170 = (ulong)CONCAT16((uVar231 != 0) * (uVar231 < 0x100) * bVar26 - (0xff < uVar231),
                                CONCAT15(bVar28,CONCAT14((bVar54 != 0) * (bVar54 < 0x100) * bVar54 -
                                                         (0xff < bVar54),
                                                         CONCAT13(bVar42,CONCAT12((uVar209 != 0) *
                                                                                  (uVar209 < 0x100)
                                                                                  * bVar65 -
                                                                                  (0xff < uVar209),
                                                                                  CONCAT11(bVar6,(
                                                  bVar74 != 0) * (bVar74 < 0x100) * bVar74 -
                                                  (0xff < bVar74))))))) & 0xff00ff00ff00ff;
      local_1f98 = (ushort)uVar195;
      uStack_1f96 = (ushort)(uVar195 >> 0x10);
      uStack_1f94 = (ushort)(uVar195 >> 0x20);
      uStack_1f92 = (ushort)(uVar195 >> 0x30);
      uStack_1f90 = (ushort)uVar230;
      uStack_1f8e = (ushort)(uVar230 >> 0x10);
      uStack_1f8c = (ushort)(uVar230 >> 0x20);
      uStack_1f8a = (ushort)(uVar230 >> 0x30);
      local_1fa8 = (ushort)uVar158;
      uStack_1fa6 = (ushort)(uVar158 >> 0x10);
      uStack_1fa4 = (ushort)(uVar158 >> 0x20);
      uStack_1fa2 = (ushort)(uVar158 >> 0x30);
      uStack_1fa0 = (ushort)uVar170;
      uStack_1f9e = (ushort)(uVar170 >> 0x10);
      uStack_1f9c = (ushort)(uVar170 >> 0x20);
      uStack_1f9a = (ushort)(uVar170 >> 0x30);
      uVar239 = (ushort)(((uint)bVar41 << 0x18) >> 0x18);
      uVar200 = (ushort)(((uint6)bVar68 << 0x28) >> 0x28);
      uVar205 = (ushort)(((ulong)bVar69 << 0x38) >> 0x38);
      uVar234 = (ushort)(((uint)bVar72 << 0x18) >> 0x18);
      uVar240 = (ushort)(((uint6)bVar58 << 0x28) >> 0x28);
      uVar246 = (ushort)(((ulong)bVar47 << 0x38) >> 0x38);
      uVar173 = (ushort)(((uint)bVar30 << 0x18) >> 0x18);
      uVar209 = (ushort)(((uint6)bVar34 << 0x28) >> 0x28);
      uVar171 = (ushort)(((ulong)bVar64 << 0x38) >> 0x38);
      uVar243 = (ushort)(((uint)bVar67 << 0x18) >> 0x18);
      uVar199 = (ushort)(((uint6)bVar73 << 0x28) >> 0x28);
      uVar233 = (ushort)(((ulong)bVar70 << 0x38) >> 0x38);
      uVar245 = (ushort)(((uint)bVar22 << 0x18) >> 0x18);
      uVar201 = (ushort)(((uint6)bVar2 << 0x28) >> 0x28);
      uVar206 = (ushort)(((ulong)bVar18 << 0x38) >> 0x38);
      uVar235 = (ushort)(((uint)bVar14 << 0x18) >> 0x18);
      uVar241 = (ushort)(((uint6)bVar12 << 0x28) >> 0x28);
      uVar247 = (ushort)(((ulong)bVar10 << 0x38) >> 0x38);
      uVar174 = (ushort)(((uint)bVar38 << 0x18) >> 0x18);
      uVar172 = (ushort)(((uint6)bVar37 << 0x28) >> 0x28);
      uVar203 = (ushort)(((ulong)bVar44 << 0x38) >> 0x38);
      uVar232 = (ushort)(((uint)bVar4 << 0x18) >> 0x18);
      uVar244 = (ushort)(((uint6)bVar5 << 0x28) >> 0x28);
      uVar237 = (ushort)(((ulong)bVar9 << 0x38) >> 0x38);
      uVar197 = (ushort)(((uint)bVar56 << 0x18) >> 0x18);
      uVar202 = (ushort)(((uint6)bVar48 << 0x28) >> 0x28);
      uVar207 = (ushort)(((ulong)bVar60 << 0x38) >> 0x38);
      uVar236 = (ushort)(((uint)bVar43 << 0x18) >> 0x18);
      uVar242 = (ushort)(((uint6)bVar31 << 0x28) >> 0x28);
      uVar248 = (ushort)(((ulong)bVar21 << 0x38) >> 0x38);
      uVar208 = (ushort)(((uint)bVar57 << 0x18) >> 0x18);
      uVar196 = (ushort)(((uint6)bVar46 << 0x28) >> 0x28);
      uVar231 = (ushort)(((ulong)bVar39 << 0x38) >> 0x38);
      uVar198 = (ushort)(((uint)bVar42 << 0x18) >> 0x18);
      uVar204 = (ushort)(((uint6)bVar28 << 0x28) >> 0x28);
      uVar238 = (ushort)(((ulong)bVar16 << 0x38) >> 0x38);
      *(ulong *)local_30c0 =
           CONCAT17((uStack_1f4a != 0) * (uStack_1f4a < 0x100) * (char)(uVar228 >> 0x30) -
                    (0xff < uStack_1f4a),
                    CONCAT16((uStack_1f4c != 0) * (uStack_1f4c < 0x100) * (char)(uVar228 >> 0x20) -
                             (0xff < uStack_1f4c),
                             CONCAT15((uStack_1f4e != 0) * (uStack_1f4e < 0x100) *
                                      (char)(uVar228 >> 0x10) - (0xff < uStack_1f4e),
                                      CONCAT14((uStack_1f50 != 0) * (uStack_1f50 < 0x100) *
                                               (char)uVar228 - (0xff < uStack_1f50),
                                               CONCAT13((uStack_1f52 != 0) * (uStack_1f52 < 0x100) *
                                                        (char)(uVar193 >> 0x30) -
                                                        (0xff < uStack_1f52),
                                                        CONCAT12((uStack_1f54 != 0) *
                                                                 (uStack_1f54 < 0x100) *
                                                                 (char)(uVar193 >> 0x20) -
                                                                 (0xff < uStack_1f54),
                                                                 CONCAT11((uStack_1f56 != 0) *
                                                                          (uStack_1f56 < 0x100) *
                                                                          (char)(uVar193 >> 0x10) -
                                                                          (0xff < uStack_1f56),
                                                                          (local_1f58 != 0) *
                                                                          (local_1f58 < 0x100) *
                                                                          (char)uVar193 -
                                                                          (0xff < local_1f58))))))))
      ;
      *(ulong *)(local_30c0 + 8) =
           CONCAT17((uStack_1f5a != 0) * (uStack_1f5a < 0x100) * (char)(uVar168 >> 0x30) -
                    (0xff < uStack_1f5a),
                    CONCAT16((uStack_1f5c != 0) * (uStack_1f5c < 0x100) * (char)(uVar168 >> 0x20) -
                             (0xff < uStack_1f5c),
                             CONCAT15((uStack_1f5e != 0) * (uStack_1f5e < 0x100) *
                                      (char)(uVar168 >> 0x10) - (0xff < uStack_1f5e),
                                      CONCAT14((uStack_1f60 != 0) * (uStack_1f60 < 0x100) *
                                               (char)uVar168 - (0xff < uStack_1f60),
                                               CONCAT13((uStack_1f62 != 0) * (uStack_1f62 < 0x100) *
                                                        (char)(uVar156 >> 0x30) -
                                                        (0xff < uStack_1f62),
                                                        CONCAT12((uStack_1f64 != 0) *
                                                                 (uStack_1f64 < 0x100) *
                                                                 (char)(uVar156 >> 0x20) -
                                                                 (0xff < uStack_1f64),
                                                                 CONCAT11((uStack_1f66 != 0) *
                                                                          (uStack_1f66 < 0x100) *
                                                                          (char)(uVar156 >> 0x10) -
                                                                          (0xff < uStack_1f66),
                                                                          (local_1f68 != 0) *
                                                                          (local_1f68 < 0x100) *
                                                                          (char)uVar156 -
                                                                          (0xff < local_1f68))))))))
      ;
      *(ulong *)(local_30c0 + 0x10) =
           CONCAT17((uStack_1f6a != 0) * (uStack_1f6a < 0x100) * (char)(uVar229 >> 0x30) -
                    (0xff < uStack_1f6a),
                    CONCAT16((uStack_1f6c != 0) * (uStack_1f6c < 0x100) * (char)(uVar229 >> 0x20) -
                             (0xff < uStack_1f6c),
                             CONCAT15((uStack_1f6e != 0) * (uStack_1f6e < 0x100) *
                                      (char)(uVar229 >> 0x10) - (0xff < uStack_1f6e),
                                      CONCAT14((uStack_1f70 != 0) * (uStack_1f70 < 0x100) *
                                               (char)uVar229 - (0xff < uStack_1f70),
                                               CONCAT13((uStack_1f72 != 0) * (uStack_1f72 < 0x100) *
                                                        (char)(uVar194 >> 0x30) -
                                                        (0xff < uStack_1f72),
                                                        CONCAT12((uStack_1f74 != 0) *
                                                                 (uStack_1f74 < 0x100) *
                                                                 (char)(uVar194 >> 0x20) -
                                                                 (0xff < uStack_1f74),
                                                                 CONCAT11((uStack_1f76 != 0) *
                                                                          (uStack_1f76 < 0x100) *
                                                                          (char)(uVar194 >> 0x10) -
                                                                          (0xff < uStack_1f76),
                                                                          (local_1f78 != 0) *
                                                                          (local_1f78 < 0x100) *
                                                                          (char)uVar194 -
                                                                          (0xff < local_1f78))))))))
      ;
      *(ulong *)(local_30c0 + 0x18) =
           CONCAT17((uStack_1f7a != 0) * (uStack_1f7a < 0x100) * (char)(uVar169 >> 0x30) -
                    (0xff < uStack_1f7a),
                    CONCAT16((uStack_1f7c != 0) * (uStack_1f7c < 0x100) * (char)(uVar169 >> 0x20) -
                             (0xff < uStack_1f7c),
                             CONCAT15((uStack_1f7e != 0) * (uStack_1f7e < 0x100) *
                                      (char)(uVar169 >> 0x10) - (0xff < uStack_1f7e),
                                      CONCAT14((uStack_1f80 != 0) * (uStack_1f80 < 0x100) *
                                               (char)uVar169 - (0xff < uStack_1f80),
                                               CONCAT13((uStack_1f82 != 0) * (uStack_1f82 < 0x100) *
                                                        (char)(uVar157 >> 0x30) -
                                                        (0xff < uStack_1f82),
                                                        CONCAT12((uStack_1f84 != 0) *
                                                                 (uStack_1f84 < 0x100) *
                                                                 (char)(uVar157 >> 0x20) -
                                                                 (0xff < uStack_1f84),
                                                                 CONCAT11((uStack_1f86 != 0) *
                                                                          (uStack_1f86 < 0x100) *
                                                                          (char)(uVar157 >> 0x10) -
                                                                          (0xff < uStack_1f86),
                                                                          (local_1f88 != 0) *
                                                                          (local_1f88 < 0x100) *
                                                                          (char)uVar157 -
                                                                          (0xff < local_1f88))))))))
      ;
      *(ulong *)(local_30c0 + 0x20) =
           CONCAT17((uStack_1f8a != 0) * (uStack_1f8a < 0x100) * (char)(uVar230 >> 0x30) -
                    (0xff < uStack_1f8a),
                    CONCAT16((uStack_1f8c != 0) * (uStack_1f8c < 0x100) * (char)(uVar230 >> 0x20) -
                             (0xff < uStack_1f8c),
                             CONCAT15((uStack_1f8e != 0) * (uStack_1f8e < 0x100) *
                                      (char)(uVar230 >> 0x10) - (0xff < uStack_1f8e),
                                      CONCAT14((uStack_1f90 != 0) * (uStack_1f90 < 0x100) *
                                               (char)uVar230 - (0xff < uStack_1f90),
                                               CONCAT13((uStack_1f92 != 0) * (uStack_1f92 < 0x100) *
                                                        (char)(uVar195 >> 0x30) -
                                                        (0xff < uStack_1f92),
                                                        CONCAT12((uStack_1f94 != 0) *
                                                                 (uStack_1f94 < 0x100) *
                                                                 (char)(uVar195 >> 0x20) -
                                                                 (0xff < uStack_1f94),
                                                                 CONCAT11((uStack_1f96 != 0) *
                                                                          (uStack_1f96 < 0x100) *
                                                                          (char)(uVar195 >> 0x10) -
                                                                          (0xff < uStack_1f96),
                                                                          (local_1f98 != 0) *
                                                                          (local_1f98 < 0x100) *
                                                                          (char)uVar195 -
                                                                          (0xff < local_1f98))))))))
      ;
      *(ulong *)(local_30c0 + 0x28) =
           CONCAT17((uStack_1f9a != 0) * (uStack_1f9a < 0x100) * (char)(uVar170 >> 0x30) -
                    (0xff < uStack_1f9a),
                    CONCAT16((uStack_1f9c != 0) * (uStack_1f9c < 0x100) * (char)(uVar170 >> 0x20) -
                             (0xff < uStack_1f9c),
                             CONCAT15((uStack_1f9e != 0) * (uStack_1f9e < 0x100) *
                                      (char)(uVar170 >> 0x10) - (0xff < uStack_1f9e),
                                      CONCAT14((uStack_1fa0 != 0) * (uStack_1fa0 < 0x100) *
                                               (char)uVar170 - (0xff < uStack_1fa0),
                                               CONCAT13((uStack_1fa2 != 0) * (uStack_1fa2 < 0x100) *
                                                        (char)(uVar158 >> 0x30) -
                                                        (0xff < uStack_1fa2),
                                                        CONCAT12((uStack_1fa4 != 0) *
                                                                 (uStack_1fa4 < 0x100) *
                                                                 (char)(uVar158 >> 0x20) -
                                                                 (0xff < uStack_1fa4),
                                                                 CONCAT11((uStack_1fa6 != 0) *
                                                                          (uStack_1fa6 < 0x100) *
                                                                          (char)(uVar158 >> 0x10) -
                                                                          (0xff < uStack_1fa6),
                                                                          (local_1fa8 != 0) *
                                                                          (local_1fa8 < 0x100) *
                                                                          (char)uVar158 -
                                                                          (0xff < local_1fa8))))))))
      ;
      *(ulong *)(local_30c0 + 0x30) =
           CONCAT17((uVar246 != 0) * (uVar246 < 0x100) * bVar47 - (0xff < uVar246),
                    CONCAT16((uVar240 != 0) * (uVar240 < 0x100) * bVar58 - (0xff < uVar240),
                             CONCAT15((uVar234 != 0) * (uVar234 < 0x100) * bVar72 - (0xff < uVar234)
                                      ,CONCAT14((bVar71 != 0) * (bVar71 < 0x100) * bVar71 -
                                                (0xff < bVar71),
                                                CONCAT13((uVar205 != 0) * (uVar205 < 0x100) * bVar69
                                                         - (0xff < uVar205),
                                                         CONCAT12((uVar200 != 0) * (uVar200 < 0x100)
                                                                  * bVar68 - (0xff < uVar200),
                                                                  CONCAT11((uVar239 != 0) *
                                                                           (uVar239 < 0x100) *
                                                                           bVar41 - (0xff < uVar239)
                                                                           ,(bVar80 != 0) *
                                                                            (bVar80 < 0x100) *
                                                                            bVar80 - (0xff < bVar80)
                                                                          )))))));
      *(ulong *)(local_30c0 + 0x38) =
           CONCAT17((uVar233 != 0) * (uVar233 < 0x100) * bVar70 - (0xff < uVar233),
                    CONCAT16((uVar199 != 0) * (uVar199 < 0x100) * bVar73 - (0xff < uVar199),
                             CONCAT15((uVar243 != 0) * (uVar243 < 0x100) * bVar67 - (0xff < uVar243)
                                      ,CONCAT14((bVar66 != 0) * (bVar66 < 0x100) * bVar66 -
                                                (0xff < bVar66),
                                                CONCAT13((uVar171 != 0) * (uVar171 < 0x100) * bVar64
                                                         - (0xff < uVar171),
                                                         CONCAT12((uVar209 != 0) * (uVar209 < 0x100)
                                                                  * bVar34 - (0xff < uVar209),
                                                                  CONCAT11((uVar173 != 0) *
                                                                           (uVar173 < 0x100) *
                                                                           bVar30 - (0xff < uVar173)
                                                                           ,(bVar1 != 0) *
                                                                            (bVar1 < 0x100) * bVar1
                                                                            - (0xff < bVar1))))))));
      *(ulong *)(local_30c0 + 0x40) =
           CONCAT17((uVar247 != 0) * (uVar247 < 0x100) * bVar10 - (0xff < uVar247),
                    CONCAT16((uVar241 != 0) * (uVar241 < 0x100) * bVar12 - (0xff < uVar241),
                             CONCAT15((uVar235 != 0) * (uVar235 < 0x100) * bVar14 - (0xff < uVar235)
                                      ,CONCAT14((bVar33 != 0) * (bVar33 < 0x100) * bVar33 -
                                                (0xff < bVar33),
                                                CONCAT13((uVar206 != 0) * (uVar206 < 0x100) * bVar18
                                                         - (0xff < uVar206),
                                                         CONCAT12((uVar201 != 0) * (uVar201 < 0x100)
                                                                  * bVar2 - (0xff < uVar201),
                                                                  CONCAT11((uVar245 != 0) *
                                                                           (uVar245 < 0x100) *
                                                                           bVar22 - (0xff < uVar245)
                                                                           ,(bVar25 != 0) *
                                                                            (bVar25 < 0x100) *
                                                                            bVar25 - (0xff < bVar25)
                                                                          )))))));
      *(ulong *)(local_30c0 + 0x48) =
           CONCAT17((uVar237 != 0) * (uVar237 < 0x100) * bVar9 - (0xff < uVar237),
                    CONCAT16((uVar244 != 0) * (uVar244 < 0x100) * bVar5 - (0xff < uVar244),
                             CONCAT15((uVar232 != 0) * (uVar232 < 0x100) * bVar4 - (0xff < uVar232),
                                      CONCAT14((bVar15 != 0) * (bVar15 < 0x100) * bVar15 -
                                               (0xff < bVar15),
                                               CONCAT13((uVar203 != 0) * (uVar203 < 0x100) * bVar44
                                                        - (0xff < uVar203),
                                                        CONCAT12((uVar172 != 0) * (uVar172 < 0x100)
                                                                 * bVar37 - (0xff < uVar172),
                                                                 CONCAT11((uVar174 != 0) *
                                                                          (uVar174 < 0x100) * bVar38
                                                                          - (0xff < uVar174),
                                                                          (bVar40 != 0) *
                                                                          (bVar40 < 0x100) * bVar40
                                                                          - (0xff < bVar40))))))));
      *(ulong *)(local_30c0 + 0x50) =
           CONCAT17((uVar248 != 0) * (uVar248 < 0x100) * bVar21 - (0xff < uVar248),
                    CONCAT16((uVar242 != 0) * (uVar242 < 0x100) * bVar31 - (0xff < uVar242),
                             CONCAT15((uVar236 != 0) * (uVar236 < 0x100) * bVar43 - (0xff < uVar236)
                                      ,CONCAT14((bVar23 != 0) * (bVar23 < 0x100) * bVar23 -
                                                (0xff < bVar23),
                                                CONCAT13((uVar207 != 0) * (uVar207 < 0x100) * bVar60
                                                         - (0xff < uVar207),
                                                         CONCAT12((uVar202 != 0) * (uVar202 < 0x100)
                                                                  * bVar48 - (0xff < uVar202),
                                                                  CONCAT11((uVar197 != 0) *
                                                                           (uVar197 < 0x100) *
                                                                           bVar56 - (0xff < uVar197)
                                                                           ,(bVar53 != 0) *
                                                                            (bVar53 < 0x100) *
                                                                            bVar53 - (0xff < bVar53)
                                                                          )))))));
      *(ulong *)(local_30c0 + 0x58) =
           CONCAT17((uVar238 != 0) * (uVar238 < 0x100) * bVar16 - (0xff < uVar238),
                    CONCAT16((uVar204 != 0) * (uVar204 < 0x100) * bVar28 - (0xff < uVar204),
                             CONCAT15((uVar198 != 0) * (uVar198 < 0x100) * bVar42 - (0xff < uVar198)
                                      ,CONCAT14((bVar6 != 0) * (bVar6 < 0x100) * bVar6 -
                                                (0xff < bVar6),
                                                CONCAT13((uVar231 != 0) * (uVar231 < 0x100) * bVar39
                                                         - (0xff < uVar231),
                                                         CONCAT12((uVar196 != 0) * (uVar196 < 0x100)
                                                                  * bVar46 - (0xff < uVar196),
                                                                  CONCAT11((uVar208 != 0) *
                                                                           (uVar208 < 0x100) *
                                                                           bVar57 - (0xff < uVar208)
                                                                           ,(bVar55 != 0) *
                                                                            (bVar55 < 0x100) *
                                                                            bVar55 - (0xff < bVar55)
                                                                          )))))));
      y_ptr2 = y_ptr2 + 0x20;
      u_ptr = u_ptr + 0x20;
      v_ptr = v_ptr + 0x10;
      rgb_ptr1 = rgb_ptr1 + 0x10;
      rgb_ptr2 = rgb_ptr2 + 0x60;
      local_30c0 = local_30c0 + 0x60;
    }
  }
  return;
}

Assistant:

void yuv420_rgb24_sseu(
	uint32_t width, uint32_t height, 
	const uint8_t *Y, const uint8_t *U, const uint8_t *V, uint32_t Y_stride, uint32_t UV_stride, 
	uint8_t *RGB, uint32_t RGB_stride, 
	YCbCrType yuv_type)
{
	#define LOAD_SI128 _mm_loadu_si128
	#define SAVE_SI128 _mm_storeu_si128
	const YUV2RGBParam *const param = &(YUV2RGB[yuv_type]);
	
	uint32_t x, y;
	for(y=0; y<(height-1); y+=2)
	{
		const uint8_t *y_ptr1=Y+y*Y_stride,
			*y_ptr2=Y+(y+1)*Y_stride,
			*u_ptr=U+(y/2)*UV_stride,
			*v_ptr=V+(y/2)*UV_stride;
		
		uint8_t *rgb_ptr1=RGB+y*RGB_stride,
			*rgb_ptr2=RGB+(y+1)*RGB_stride;
		
		for(x=0; x<(width-31); x+=32)
		{
			YUV2RGB_32_PLANAR
			
			y_ptr1+=32;
			y_ptr2+=32;
			u_ptr+=16; 
			v_ptr+=16;
			rgb_ptr1+=96;
			rgb_ptr2+=96;
		}
	}
	#undef LOAD_SI128
	#undef SAVE_SI128
}